

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

void embree::avx512::InstanceArrayIntersectorKMB<8>::intersect
               (vbool<8>_conflict *valid_i,Precalculations *pre,RayHitK<8> *ray,
               RayQueryContext *context,Primitive_conflict4 *prim)

{
  long *plVar1;
  BBox1f BVar2;
  int iVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [12];
  byte bVar145;
  undefined4 in_EAX;
  ulong uVar147;
  uint uVar148;
  long lVar149;
  byte bVar150;
  ulong uVar151;
  uint uVar152;
  undefined1 auVar153 [16];
  uint uVar233;
  uint uVar235;
  float fVar236;
  uint uVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  uint uVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar161 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar193 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  uint uVar234;
  uint uVar247;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar248;
  float fVar249;
  float fVar257;
  float fVar258;
  undefined1 auVar250 [16];
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar259;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined4 uVar263;
  undefined1 auVar264 [16];
  undefined1 auVar272 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar273 [32];
  undefined1 auVar274 [16];
  undefined1 auVar277 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [64];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [64];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar308 [32];
  undefined1 auVar307 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 in_ZMM6 [64];
  float fVar311;
  float fVar312;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar317;
  float fVar319;
  float fVar321;
  float fVar323;
  float fVar325;
  float fVar327;
  float fVar328;
  undefined1 auVar315 [32];
  float fVar316;
  float fVar318;
  float fVar320;
  float fVar322;
  float fVar324;
  float fVar326;
  undefined1 in_ZMM7 [64];
  undefined1 auVar329 [16];
  undefined1 auVar330 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar335 [16];
  undefined1 auVar339 [32];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  float fVar343;
  undefined1 auVar342 [32];
  undefined1 in_ZMM10 [64];
  float fVar344;
  undefined1 auVar345 [16];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  float fVar355;
  undefined1 auVar349 [32];
  undefined1 auVar346 [16];
  undefined1 auVar350 [32];
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 in_ZMM11 [64];
  undefined1 auVar360 [16];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar369 [64];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 in_ZMM15 [64];
  undefined1 auVar372 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar373 [16];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 in_ZMM26 [64];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 in_ZMM28 [64];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 in_ZMM29 [64];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 in_ZMM30 [64];
  undefined1 auVar386 [16];
  undefined1 in_ZMM31 [64];
  undefined1 auVar387 [64];
  vint<8> itime_k;
  RayQueryContext newcontext;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  uint uStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  uint uStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  uint uStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  uint uStack_64;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  uint uStack_44;
  _func_int *local_40;
  RTCRayQueryContext *local_38;
  RTCIntersectArguments *local_30;
  uint uVar146;
  undefined1 auVar213 [32];
  undefined1 auVar162 [32];
  undefined1 auVar192 [32];
  undefined1 auVar194 [32];
  undefined1 auVar203 [32];
  
  auVar187 = in_ZMM10._0_32_;
  auVar160 = in_ZMM22._0_32_;
  auVar180 = in_ZMM21._0_32_;
  auVar182 = in_ZMM23._0_32_;
  auVar179 = in_ZMM20._0_32_;
  auVar159 = in_ZMM6._0_32_;
  auVar181 = in_ZMM26._0_32_;
  auVar183 = in_ZMM27._0_32_;
  auVar178 = in_ZMM16._0_32_;
  auVar177 = in_ZMM15._0_32_;
  auVar176 = in_ZMM13._0_32_;
  uVar152 = prim->primID_;
  pGVar4 = (context->scene->geometries).items[prim->instID_].ptr;
  local_40 = *(_func_int **)&pGVar4->field_0x58;
  if ((local_40 != (_func_int *)0x0) ||
     ((uVar147 = (ulong)*(uint *)(*(long *)&pGVar4[1].time_range.upper +
                                 (long)pGVar4[1].intersectionFilterN * (ulong)uVar152),
      uVar147 != 0xffffffff &&
      (local_40 = pGVar4[1].super_RefCount._vptr_RefCount[uVar147], local_40 != (_func_int *)0x0))))
  {
    uVar146 = pGVar4->mask;
    auVar184._4_4_ = uVar146;
    auVar184._0_4_ = uVar146;
    auVar184._8_4_ = uVar146;
    auVar184._12_4_ = uVar146;
    auVar184._16_4_ = uVar146;
    auVar184._20_4_ = uVar146;
    auVar184._24_4_ = uVar146;
    auVar184._28_4_ = uVar146;
    uVar17 = vptestmd_avx512vl(auVar184,*(undefined1 (*) [32])(ray + 0x120));
    bVar145 = valid_i->v & (byte)uVar17;
    uVar146 = CONCAT31((int3)((uint)in_EAX >> 8),bVar145);
    if ((bVar145 != 0) && (pRVar5 = context->user, pRVar5->instID[0] == 0xffffffff)) {
      pRVar5->instID[0] = prim->instID_;
      pRVar5->instPrimID[0] = uVar152;
      uVar147 = (ulong)prim->primID_;
      if ((pGVar4->field_8).field_0x1 == '\x01') {
        BVar2 = pGVar4->time_range;
        auVar158._8_8_ = 0;
        auVar158._0_4_ = BVar2.lower;
        auVar158._4_4_ = BVar2.upper;
        fVar249 = BVar2.lower;
        auVar176._4_4_ = fVar249;
        auVar176._0_4_ = fVar249;
        auVar176._8_4_ = fVar249;
        auVar176._12_4_ = fVar249;
        auVar176._16_4_ = fVar249;
        auVar176._20_4_ = fVar249;
        auVar176._24_4_ = fVar249;
        auVar176._28_4_ = fVar249;
        fVar249 = pGVar4->fnumTimeSegments;
        auVar176 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar176);
        auVar153 = vmovshdup_avx(auVar158);
        auVar153 = vsubps_avx(auVar153,auVar158);
        auVar178._0_4_ = auVar153._0_4_;
        auVar178._4_4_ = auVar178._0_4_;
        auVar178._8_4_ = auVar178._0_4_;
        auVar178._12_4_ = auVar178._0_4_;
        auVar178._16_4_ = auVar178._0_4_;
        auVar178._20_4_ = auVar178._0_4_;
        auVar178._24_4_ = auVar178._0_4_;
        auVar178._28_4_ = auVar178._0_4_;
        auVar176 = vdivps_avx(auVar176,auVar178);
        auVar177._4_4_ = fVar249 * auVar176._4_4_;
        auVar177._0_4_ = fVar249 * auVar176._0_4_;
        auVar177._8_4_ = fVar249 * auVar176._8_4_;
        auVar177._12_4_ = fVar249 * auVar176._12_4_;
        auVar177._16_4_ = fVar249 * auVar176._16_4_;
        auVar177._20_4_ = fVar249 * auVar176._20_4_;
        auVar177._24_4_ = fVar249 * auVar176._24_4_;
        auVar177._28_4_ = auVar176._28_4_;
        auVar176 = vroundps_avx(auVar177,1);
        fVar249 = fVar249 + -1.0;
        auVar181._4_4_ = fVar249;
        auVar181._0_4_ = fVar249;
        auVar181._8_4_ = fVar249;
        auVar181._12_4_ = fVar249;
        auVar181._16_4_ = fVar249;
        auVar181._20_4_ = fVar249;
        auVar181._24_4_ = fVar249;
        auVar181._28_4_ = fVar249;
        auVar176 = vminps_avx(auVar176,auVar181);
        auVar282 = ZEXT1264(ZEXT412(0)) << 0x20;
        auVar176 = vmaxps_avx(auVar176,ZEXT1232(ZEXT412(0)) << 0x20);
        auVar177 = vsubps_avx(auVar177,auVar176);
        local_100 = vcvtps2dq_avx(auVar176);
        uVar152 = 0;
        for (uVar233 = (uint)bVar145; (uVar233 & 1) == 0; uVar233 = uVar233 >> 1 | 0x80000000) {
          uVar152 = uVar152 + 1;
        }
        auVar176 = vpbroadcastd_avx512vl();
        auVar289 = ZEXT3264(auVar176);
        uVar17 = vpcmpeqd_avx512vl(local_100,auVar176);
        fVar249 = auVar177._0_4_;
        fVar257 = auVar177._4_4_;
        fVar258 = auVar177._8_4_;
        fVar259 = auVar177._12_4_;
        fVar260 = auVar177._16_4_;
        fVar261 = auVar177._20_4_;
        fVar262 = auVar177._24_4_;
        if ((byte)(~bVar145 | (byte)uVar17) == 0xff) {
          plVar1 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments +
                           (long)*(int *)(local_100 + (ulong)uVar152 * 4) * 0x38);
          iVar3 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 +
                          (long)*(int *)(local_100 + (ulong)uVar152 * 4) * 0x38);
          if (iVar3 == 0x9134) {
            lVar6 = *plVar1;
            lVar149 = plVar1[2] * uVar147;
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x10 + lVar149)),0x1c);
            auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar149)),0x28);
            auVar176 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x14 + lVar149)),0x1c);
            auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),0x28);
            local_100 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),0x1c);
            auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar149)),0x28);
            auVar159 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x1c + lVar149)),0x1c);
            auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar149)),0x28);
            auVar187 = ZEXT1632(auVar153);
          }
          else if (iVar3 == 0x9234) {
            lVar6 = *plVar1;
            lVar149 = plVar1[2] * uVar147;
            auVar274._8_8_ = 0;
            auVar274._0_8_ = *(ulong *)(lVar6 + 4 + lVar149);
            auVar301._8_8_ = 0;
            auVar301._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
            auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar149)),_DAT_01fefe80,auVar274
                                         );
            auVar176 = ZEXT1632(auVar153);
            auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),_DAT_01fefe80,
                                          auVar301);
            local_100 = ZEXT1632(auVar153);
            auVar275._8_8_ = 0;
            auVar275._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
            auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),_DAT_01fefe80,
                                          auVar275);
            auVar159 = ZEXT1632(auVar153);
            auVar276._8_8_ = 0;
            auVar276._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar149);
            auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),_DAT_01fefe80,
                                          auVar276);
            auVar187 = ZEXT1632(auVar153);
          }
          else if (iVar3 == 0xb001) {
            lVar6 = *plVar1;
            lVar149 = plVar1[2] * uVar147;
            auVar266._8_8_ = 0;
            auVar266._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
            auVar153 = vinsertps_avx(auVar266,ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),0x20);
            auVar267._8_8_ = 0;
            auVar267._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar149);
            auVar154 = vpermt2ps_avx512vl(auVar267,_DAT_01fefe90,ZEXT416(*(uint *)(lVar6 + lVar149))
                                         );
            auVar306._8_8_ = 0;
            auVar306._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
            fVar344 = *(float *)(lVar6 + 0x24 + lVar149);
            fVar351 = *(float *)(lVar6 + 0x28 + lVar149);
            fVar353 = *(float *)(lVar6 + 0x2c + lVar149);
            auVar155 = vpermt2ps_avx512vl(auVar306,_DAT_01fefe90,
                                          ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)));
            fVar355 = *(float *)(lVar6 + 0x30 + lVar149);
            auVar158 = vfmadd231ss_fma(ZEXT416((uint)(fVar351 * fVar351)),ZEXT416((uint)fVar344),
                                       ZEXT416((uint)fVar344));
            auVar158 = vfmadd231ss_fma(auVar158,ZEXT416((uint)fVar353),ZEXT416((uint)fVar353));
            auVar158 = vfmadd231ss_fma(auVar158,ZEXT416((uint)fVar355),ZEXT416((uint)fVar355));
            auVar156 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar158._0_4_));
            fVar357 = auVar156._0_4_;
            fVar357 = fVar357 * 1.5 + fVar357 * fVar357 * fVar357 * auVar158._0_4_ * -0.5;
            auVar158 = vinsertps_avx(auVar155,ZEXT416((uint)(fVar344 * fVar357)),0x30);
            auVar187 = ZEXT1632(auVar158);
            auVar158 = vinsertps_avx(auVar154,ZEXT416((uint)(fVar351 * fVar357)),0x30);
            auVar176 = ZEXT1632(auVar158);
            auVar153 = vinsertps_avx(auVar153,ZEXT416((uint)(fVar355 * fVar357)),0x30);
            auVar159 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),0x10);
            auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar149)),0x20);
            auVar153 = vinsertps_avx(auVar153,ZEXT416((uint)(fVar353 * fVar357)),0x30);
            local_100 = ZEXT1632(auVar153);
          }
          else if (iVar3 == 0x9244) {
            lVar6 = *plVar1;
            lVar149 = plVar1[2] * uVar147;
            auVar176 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + lVar149));
            local_100 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar149));
            auVar159 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar149));
            auVar187 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar149));
          }
          local_220._4_4_ = auVar176._0_4_;
          auVar364._8_4_ = 1;
          auVar364._0_8_ = 0x100000001;
          auVar364._12_4_ = 1;
          auVar364._16_4_ = 1;
          auVar364._20_4_ = 1;
          auVar364._24_4_ = 1;
          auVar364._28_4_ = 1;
          auVar178 = vpermps_avx2(auVar364,auVar176);
          auVar368._8_4_ = 2;
          auVar368._0_8_ = 0x200000002;
          auVar368._12_4_ = 2;
          auVar368._16_4_ = 2;
          auVar368._20_4_ = 2;
          auVar368._24_4_ = 2;
          auVar368._28_4_ = 2;
          auVar181 = vpermps_avx2(auVar368,auVar176);
          auVar188 = vbroadcastss_avx512vl(ZEXT416(3));
          auVar189 = vpermps_avx512vl(auVar188,auVar176);
          local_260._4_4_ = local_100._0_4_;
          auVar176 = vpermps_avx2(auVar364,local_100);
          auVar183 = vpermps_avx2(auVar368,local_100);
          auVar190 = vpermps_avx512vl(auVar188,local_100);
          local_200._4_4_ = auVar159._0_4_;
          auVar184 = vpermps_avx2(auVar364,auVar159);
          auVar185 = vpermps_avx2(auVar368,auVar159);
          auVar201 = vpermps_avx512vl(auVar188,auVar159);
          local_240._4_4_ = auVar187._0_4_;
          auVar159 = vpermps_avx2(auVar364,auVar187);
          auVar186 = vpermps_avx2(auVar368,auVar187);
          auVar187 = vpermps_avx512vl(auVar188,auVar187);
          iVar3 = (int)plVar1[0xb];
          local_220._0_4_ = local_220._4_4_;
          local_220._8_4_ = local_220._4_4_;
          local_220._12_4_ = local_220._4_4_;
          local_220._16_4_ = local_220._4_4_;
          local_220._20_4_ = local_220._4_4_;
          local_220._24_4_ = local_220._4_4_;
          local_220._28_4_ = local_220._4_4_;
          local_240._0_4_ = local_240._4_4_;
          uStack_238._0_4_ = local_240._4_4_;
          uStack_238._4_4_ = local_240._4_4_;
          uStack_230._0_4_ = local_240._4_4_;
          uStack_230._4_4_ = local_240._4_4_;
          uStack_228._0_4_ = local_240._4_4_;
          uStack_228._4_4_ = local_240._4_4_;
          local_260._0_4_ = local_260._4_4_;
          local_260._8_4_ = local_260._4_4_;
          local_260._12_4_ = local_260._4_4_;
          local_260._16_4_ = local_260._4_4_;
          local_260._20_4_ = local_260._4_4_;
          local_260._24_4_ = local_260._4_4_;
          local_260._28_4_ = local_260._4_4_;
          local_200._0_4_ = local_200._4_4_;
          uStack_1f8._0_4_ = local_200._4_4_;
          uStack_1f8._4_4_ = local_200._4_4_;
          uStack_1f0._0_4_ = local_200._4_4_;
          uStack_1f0._4_4_ = local_200._4_4_;
          uStack_1e8._0_4_ = local_200._4_4_;
          uStack_1e8._4_4_ = local_200._4_4_;
          if (iVar3 == 0x9134) {
            lVar6 = plVar1[7];
            lVar149 = uVar147 * plVar1[9];
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x10 + lVar149)),0x1c);
            auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar149)),0x28);
            auVar179 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x14 + lVar149)),0x1c);
            auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),0x28);
            auVar182 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),0x1c);
            auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar149)),0x28);
            auVar180 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x1c + lVar149)),0x1c);
            auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar149)),0x28);
            auVar160 = ZEXT1632(auVar153);
          }
          else {
            auVar203._16_16_ = auVar187._16_16_;
            if (iVar3 == 0x9234) {
              lVar6 = plVar1[7];
              lVar149 = uVar147 * plVar1[9];
              auVar335._8_8_ = 0;
              auVar335._0_8_ = *(ulong *)(lVar6 + 4 + lVar149);
              auVar360._8_8_ = 0;
              auVar360._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar149)),_DAT_01fefe80,
                                            auVar335);
              auVar179 = ZEXT1632(auVar153);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),_DAT_01fefe80,
                                            auVar360);
              auVar182 = ZEXT1632(auVar153);
              auVar336._8_8_ = 0;
              auVar336._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),_DAT_01fefe80
                                            ,auVar336);
              auVar180 = ZEXT1632(auVar153);
              auVar337._8_8_ = 0;
              auVar337._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar149);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),_DAT_01fefe80
                                            ,auVar337);
              auVar160 = ZEXT1632(auVar153);
            }
            else if (iVar3 == 0xb001) {
              lVar6 = plVar1[7];
              lVar149 = uVar147 * plVar1[9];
              auVar338._8_8_ = 0;
              auVar338._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
              auVar153 = vinsertps_avx(auVar338,ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),0x20);
              auVar345._8_8_ = 0;
              auVar345._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar149);
              auVar154 = vpermt2ps_avx512vl(auVar345,_DAT_01fefe90,
                                            ZEXT416(*(uint *)(lVar6 + lVar149)));
              uVar152 = *(uint *)(lVar6 + 0x24 + lVar149);
              uVar233 = *(uint *)(lVar6 + 0x28 + lVar149);
              uVar148 = *(uint *)(lVar6 + 0x2c + lVar149);
              auVar373._8_8_ = 0;
              auVar373._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
              auVar155 = vpermt2ps_avx512vl(auVar373,_DAT_01fefe90,
                                            ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)));
              fVar344 = *(float *)(lVar6 + 0x30 + lVar149);
              auVar158 = vmulss_avx512f(ZEXT416(uVar233),ZEXT416(uVar233));
              auVar158 = vfmadd231ss_avx512f(auVar158,ZEXT416(uVar152),ZEXT416(uVar152));
              auVar158 = vfmadd231ss_avx512f(auVar158,ZEXT416(uVar148),ZEXT416(uVar148));
              auVar158 = vfmadd231ss_fma(auVar158,ZEXT416((uint)fVar344),ZEXT416((uint)fVar344));
              auVar203._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
              auVar202._4_28_ = auVar203._4_28_;
              auVar202._0_4_ = auVar158._0_4_;
              auVar156 = vrsqrt14ss_avx512f(auVar203._0_16_,auVar202._0_16_);
              auVar157 = vmulss_avx512f(auVar156,ZEXT416(0x3fc00000));
              auVar158 = vmulss_avx512f(auVar156,ZEXT416((uint)(auVar158._0_4_ * -0.5)));
              auVar156 = vmulss_avx512f(auVar156,auVar156);
              auVar158 = vmulss_avx512f(auVar156,auVar158);
              auVar156 = vaddss_avx512f(auVar157,auVar158);
              auVar158 = vmulss_avx512f(ZEXT416(uVar152),auVar156);
              auVar158 = vinsertps_avx512f(auVar155,auVar158,0x30);
              auVar160 = ZEXT1632(auVar158);
              auVar158 = vmulss_avx512f(ZEXT416(uVar233),auVar156);
              auVar158 = vinsertps_avx512f(auVar154,auVar158,0x30);
              auVar179 = ZEXT1632(auVar158);
              auVar158 = vmulss_avx512f(ZEXT416(uVar148),auVar156);
              auVar153 = vinsertps_avx512f(auVar153,ZEXT416((uint)(fVar344 * auVar156._0_4_)),0x30);
              auVar180 = ZEXT1632(auVar153);
              auVar153 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                           ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),0x10);
              auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar149)),0x20);
              auVar153 = vinsertps_avx512f(auVar153,auVar158,0x30);
              auVar182 = ZEXT1632(auVar153);
            }
            else if (iVar3 == 0x9244) {
              lVar6 = plVar1[7];
              lVar149 = uVar147 * plVar1[9];
              auVar179 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + lVar149));
              auVar182 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar149));
              auVar180 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar149));
              auVar160 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar149));
            }
          }
          auVar204 = vpermps_avx512vl(auVar188,auVar179);
          auVar205 = vpermps_avx512vl(auVar188,auVar182);
          auVar206 = vpermps_avx512vl(auVar188,auVar180);
          auVar207 = vpermps_avx512vl(auVar188,auVar160);
          auVar208 = vmulps_avx512vl(auVar187,auVar207);
          auVar209 = vmulps_avx512vl(auVar189,auVar204);
          auVar210 = vmulps_avx512vl(auVar190,auVar205);
          auVar211 = vmulps_avx512vl(auVar201,auVar206);
          fVar344 = auVar211._0_4_;
          auVar348._0_4_ = fVar344 + auVar210._0_4_ + auVar209._0_4_ + auVar208._0_4_;
          fVar351 = auVar211._4_4_;
          auVar348._4_4_ = fVar351 + auVar210._4_4_ + auVar209._4_4_ + auVar208._4_4_;
          fVar353 = auVar211._8_4_;
          auVar348._8_4_ = fVar353 + auVar210._8_4_ + auVar209._8_4_ + auVar208._8_4_;
          fVar355 = auVar211._12_4_;
          auVar348._12_4_ = fVar355 + auVar210._12_4_ + auVar209._12_4_ + auVar208._12_4_;
          fVar357 = auVar211._16_4_;
          auVar348._16_4_ = fVar357 + auVar210._16_4_ + auVar209._16_4_ + auVar208._16_4_;
          fVar358 = auVar211._20_4_;
          auVar348._20_4_ = fVar358 + auVar210._20_4_ + auVar209._20_4_ + auVar208._20_4_;
          fVar359 = auVar211._24_4_;
          auVar348._24_4_ = fVar359 + auVar210._24_4_ + auVar209._24_4_ + auVar208._24_4_;
          auVar348._28_4_ = auVar211._28_4_ + auVar210._28_4_ + auVar209._28_4_ + auVar208._28_4_;
          auVar19._8_4_ = 0x7fffffff;
          auVar19._0_8_ = 0x7fffffff7fffffff;
          auVar19._12_4_ = 0x7fffffff;
          auVar19._16_4_ = 0x7fffffff;
          auVar19._20_4_ = 0x7fffffff;
          auVar19._24_4_ = 0x7fffffff;
          auVar19._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar348,auVar19);
          auVar210 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar20._8_4_ = 0xbb8d3753;
          auVar20._0_8_ = 0xbb8d3753bb8d3753;
          auVar20._12_4_ = 0xbb8d3753;
          auVar20._16_4_ = 0xbb8d3753;
          auVar20._20_4_ = 0xbb8d3753;
          auVar20._24_4_ = 0xbb8d3753;
          auVar20._28_4_ = 0xbb8d3753;
          auVar208 = vmulps_avx512vl(auVar211,auVar20);
          auVar21._8_4_ = 0x3c9df1b8;
          auVar21._0_8_ = 0x3c9df1b83c9df1b8;
          auVar21._12_4_ = 0x3c9df1b8;
          auVar21._16_4_ = 0x3c9df1b8;
          auVar21._20_4_ = 0x3c9df1b8;
          auVar21._24_4_ = 0x3c9df1b8;
          auVar21._28_4_ = 0x3c9df1b8;
          auVar208 = vaddps_avx512vl(auVar208,auVar21);
          auVar61._4_4_ = fVar351 * auVar208._4_4_;
          auVar61._0_4_ = fVar344 * auVar208._0_4_;
          auVar61._8_4_ = fVar353 * auVar208._8_4_;
          auVar61._12_4_ = fVar355 * auVar208._12_4_;
          auVar61._16_4_ = fVar357 * auVar208._16_4_;
          auVar61._20_4_ = fVar358 * auVar208._20_4_;
          auVar61._24_4_ = fVar359 * auVar208._24_4_;
          auVar61._28_4_ = auVar208._28_4_;
          auVar22._8_4_ = 0xbd37e81c;
          auVar22._0_8_ = 0xbd37e81cbd37e81c;
          auVar22._12_4_ = 0xbd37e81c;
          auVar22._16_4_ = 0xbd37e81c;
          auVar22._20_4_ = 0xbd37e81c;
          auVar22._24_4_ = 0xbd37e81c;
          auVar22._28_4_ = 0xbd37e81c;
          auVar208 = vaddps_avx512vl(auVar61,auVar22);
          auVar62._4_4_ = fVar351 * auVar208._4_4_;
          auVar62._0_4_ = fVar344 * auVar208._0_4_;
          auVar62._8_4_ = fVar353 * auVar208._8_4_;
          auVar62._12_4_ = fVar355 * auVar208._12_4_;
          auVar62._16_4_ = fVar357 * auVar208._16_4_;
          auVar62._20_4_ = fVar358 * auVar208._20_4_;
          auVar62._24_4_ = fVar359 * auVar208._24_4_;
          auVar62._28_4_ = auVar208._28_4_;
          auVar23._8_4_ = 0x3db3edac;
          auVar23._0_8_ = 0x3db3edac3db3edac;
          auVar23._12_4_ = 0x3db3edac;
          auVar23._16_4_ = 0x3db3edac;
          auVar23._20_4_ = 0x3db3edac;
          auVar23._24_4_ = 0x3db3edac;
          auVar23._28_4_ = 0x3db3edac;
          auVar208 = vaddps_avx512vl(auVar62,auVar23);
          auVar63._4_4_ = fVar351 * auVar208._4_4_;
          auVar63._0_4_ = fVar344 * auVar208._0_4_;
          auVar63._8_4_ = fVar353 * auVar208._8_4_;
          auVar63._12_4_ = fVar355 * auVar208._12_4_;
          auVar63._16_4_ = fVar357 * auVar208._16_4_;
          auVar63._20_4_ = fVar358 * auVar208._20_4_;
          auVar63._24_4_ = fVar359 * auVar208._24_4_;
          auVar63._28_4_ = auVar208._28_4_;
          auVar24._8_4_ = 0xbe5ba881;
          auVar24._0_8_ = 0xbe5ba881be5ba881;
          auVar24._12_4_ = 0xbe5ba881;
          auVar24._16_4_ = 0xbe5ba881;
          auVar24._20_4_ = 0xbe5ba881;
          auVar24._24_4_ = 0xbe5ba881;
          auVar24._28_4_ = 0xbe5ba881;
          auVar208 = vaddps_avx512vl(auVar63,auVar24);
          auVar64._4_4_ = fVar351 * auVar208._4_4_;
          auVar64._0_4_ = fVar344 * auVar208._0_4_;
          auVar64._8_4_ = fVar353 * auVar208._8_4_;
          auVar64._12_4_ = fVar355 * auVar208._12_4_;
          auVar64._16_4_ = fVar357 * auVar208._16_4_;
          auVar64._20_4_ = fVar358 * auVar208._20_4_;
          auVar64._24_4_ = fVar359 * auVar208._24_4_;
          auVar64._28_4_ = auVar208._28_4_;
          auVar25._8_4_ = 0x3fc90fd1;
          auVar25._0_8_ = 0x3fc90fd13fc90fd1;
          auVar25._12_4_ = 0x3fc90fd1;
          auVar25._16_4_ = 0x3fc90fd1;
          auVar25._20_4_ = 0x3fc90fd1;
          auVar25._24_4_ = 0x3fc90fd1;
          auVar25._28_4_ = 0x3fc90fd1;
          auVar209 = vaddps_avx512vl(auVar64,auVar25);
          uVar147 = vcmpps_avx512vl(auVar211,auVar210,6);
          auVar208 = vsubps_avx512vl(auVar210,auVar211);
          auVar208 = vsqrtps_avx(auVar208);
          auVar65._4_4_ = auVar208._4_4_ * auVar209._4_4_;
          auVar65._0_4_ = auVar208._0_4_ * auVar209._0_4_;
          auVar65._8_4_ = auVar208._8_4_ * auVar209._8_4_;
          auVar65._12_4_ = auVar208._12_4_ * auVar209._12_4_;
          auVar65._16_4_ = auVar208._16_4_ * auVar209._16_4_;
          auVar65._20_4_ = auVar208._20_4_ * auVar209._20_4_;
          auVar65._24_4_ = auVar208._24_4_ * auVar209._24_4_;
          auVar65._28_4_ = auVar209._28_4_;
          auVar340._8_4_ = 0x80000000;
          auVar340._0_8_ = 0x8000000080000000;
          auVar340._12_4_ = 0x80000000;
          auVar340._16_4_ = 0x80000000;
          auVar340._20_4_ = 0x80000000;
          auVar340._24_4_ = 0x80000000;
          auVar340._28_4_ = 0x80000000;
          auVar209 = vxorps_avx512vl(auVar348,auVar340);
          auVar307 = ZEXT816(0) << 0x40;
          auVar211 = vmaxps_avx512vl(auVar209,auVar348);
          uVar15 = vcmpps_avx512vl(auVar211,ZEXT1632(auVar307),1);
          auVar278._8_4_ = 0x3fc90fdb;
          auVar278._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar278._12_4_ = 0x3fc90fdb;
          auVar278._16_4_ = 0x3fc90fdb;
          auVar278._20_4_ = 0x3fc90fdb;
          auVar278._24_4_ = 0x3fc90fdb;
          auVar278._28_4_ = 0x3fc90fdb;
          auVar208 = vsubps_avx(auVar278,auVar65);
          auVar208 = vmaxps_avx(ZEXT1632(auVar307),auVar208);
          auVar212 = vxorps_avx512vl(auVar208,auVar340);
          bVar7 = (bool)((byte)uVar15 & 1);
          auVar213._0_4_ = (uint)bVar7 * auVar212._0_4_ | (uint)!bVar7 * auVar208._0_4_;
          bVar7 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar213._4_4_ = (uint)bVar7 * auVar212._4_4_ | (uint)!bVar7 * auVar208._4_4_;
          bVar7 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar213._8_4_ = (uint)bVar7 * auVar212._8_4_ | (uint)!bVar7 * auVar208._8_4_;
          bVar7 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar213._12_4_ = (uint)bVar7 * auVar212._12_4_ | (uint)!bVar7 * auVar208._12_4_;
          bVar7 = (bool)((byte)(uVar15 >> 4) & 1);
          auVar213._16_4_ = (uint)bVar7 * auVar212._16_4_ | (uint)!bVar7 * auVar208._16_4_;
          bVar7 = (bool)((byte)(uVar15 >> 5) & 1);
          auVar213._20_4_ = (uint)bVar7 * auVar212._20_4_ | (uint)!bVar7 * auVar208._20_4_;
          bVar7 = (bool)((byte)(uVar15 >> 6) & 1);
          auVar213._24_4_ = (uint)bVar7 * auVar212._24_4_ | (uint)!bVar7 * auVar208._24_4_;
          bVar7 = SUB81(uVar15 >> 7,0);
          auVar213._28_4_ = (uint)bVar7 * auVar212._28_4_ | (uint)!bVar7 * auVar208._28_4_;
          auVar208 = vsubps_avx(auVar278,auVar213);
          auVar212 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
          bVar7 = (bool)((byte)uVar147 & 1);
          bVar8 = (bool)((byte)(uVar147 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar147 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar147 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar147 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar147 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar147 >> 6) & 1);
          uVar147 = vcmpps_avx512vl(auVar348,auVar209,1);
          auVar66._4_4_ =
               (float)((uint)bVar8 * auVar212._4_4_ | (uint)!bVar8 * auVar208._4_4_) * fVar257;
          auVar66._0_4_ =
               (float)((uint)bVar7 * auVar212._0_4_ | (uint)!bVar7 * auVar208._0_4_) * fVar249;
          auVar66._8_4_ =
               (float)((uint)bVar9 * auVar212._8_4_ | (uint)!bVar9 * auVar208._8_4_) * fVar258;
          auVar66._12_4_ =
               (float)((uint)bVar10 * auVar212._12_4_ | (uint)!bVar10 * auVar208._12_4_) * fVar259;
          auVar66._16_4_ =
               (float)((uint)bVar11 * auVar212._16_4_ | (uint)!bVar11 * auVar208._16_4_) * fVar260;
          auVar66._20_4_ =
               (float)((uint)bVar12 * auVar212._20_4_ | (uint)!bVar12 * auVar208._20_4_) * fVar261;
          auVar66._24_4_ =
               (float)((uint)bVar13 * auVar212._24_4_ | (uint)!bVar13 * auVar208._24_4_) * fVar262;
          auVar66._28_4_ = auVar348._28_4_;
          auVar26._8_4_ = 0x3f22f983;
          auVar26._0_8_ = 0x3f22f9833f22f983;
          auVar26._12_4_ = 0x3f22f983;
          auVar26._16_4_ = 0x3f22f983;
          auVar26._20_4_ = 0x3f22f983;
          auVar26._24_4_ = 0x3f22f983;
          auVar26._28_4_ = 0x3f22f983;
          auVar212 = vmulps_avx512vl(auVar66,auVar26);
          auVar208 = vroundps_avx(auVar212,1);
          auVar67._4_4_ = auVar208._4_4_ * 1.5707964;
          auVar67._0_4_ = auVar208._0_4_ * 1.5707964;
          auVar67._8_4_ = auVar208._8_4_ * 1.5707964;
          auVar67._12_4_ = auVar208._12_4_ * 1.5707964;
          auVar67._16_4_ = auVar208._16_4_ * 1.5707964;
          auVar67._20_4_ = auVar208._20_4_ * 1.5707964;
          auVar67._24_4_ = auVar208._24_4_ * 1.5707964;
          auVar67._28_4_ = 0x3fc90fdb;
          auVar209 = vsubps_avx(auVar66,auVar67);
          auVar208 = vcvtps2dq_avx(auVar208);
          vandps_avx512vl(auVar208,auVar188);
          uVar18 = vptestnmd_avx512vl(auVar208,auVar364);
          auVar188 = vpslld_avx2(auVar208,0x1f);
          uVar151 = vpmovd2m_avx512vl(auVar188);
          uVar15 = vpcmpgtd_avx512vl(auVar212,auVar364);
          auVar188 = vpcmpeqd_avx2(auVar188,auVar188);
          auVar188 = vpaddd_avx2(auVar212,auVar188);
          uVar16 = vpcmpud_avx512vl(auVar188,auVar368,1);
          fVar344 = auVar209._0_4_ * auVar209._0_4_;
          fVar351 = auVar209._4_4_ * auVar209._4_4_;
          auVar68._4_4_ = fVar351;
          auVar68._0_4_ = fVar344;
          fVar353 = auVar209._8_4_ * auVar209._8_4_;
          auVar68._8_4_ = fVar353;
          fVar355 = auVar209._12_4_ * auVar209._12_4_;
          auVar68._12_4_ = fVar355;
          fVar357 = auVar209._16_4_ * auVar209._16_4_;
          auVar68._16_4_ = fVar357;
          fVar358 = auVar209._20_4_ * auVar209._20_4_;
          auVar68._20_4_ = fVar358;
          fVar359 = auVar209._24_4_ * auVar209._24_4_;
          auVar68._24_4_ = fVar359;
          auVar68._28_4_ = auVar188._28_4_;
          auVar27._8_4_ = 0xb2d70013;
          auVar27._0_8_ = 0xb2d70013b2d70013;
          auVar27._12_4_ = 0xb2d70013;
          auVar27._16_4_ = 0xb2d70013;
          auVar27._20_4_ = 0xb2d70013;
          auVar27._24_4_ = 0xb2d70013;
          auVar27._28_4_ = 0xb2d70013;
          auVar188 = vmulps_avx512vl(auVar68,auVar27);
          auVar28._8_4_ = 0x363938a8;
          auVar28._0_8_ = 0x363938a8363938a8;
          auVar28._12_4_ = 0x363938a8;
          auVar28._16_4_ = 0x363938a8;
          auVar28._20_4_ = 0x363938a8;
          auVar28._24_4_ = 0x363938a8;
          auVar28._28_4_ = 0x363938a8;
          auVar188 = vaddps_avx512vl(auVar188,auVar28);
          auVar29._8_4_ = 0xb48b634d;
          auVar29._0_8_ = 0xb48b634db48b634d;
          auVar29._12_4_ = 0xb48b634d;
          auVar29._16_4_ = 0xb48b634d;
          auVar29._20_4_ = 0xb48b634d;
          auVar29._24_4_ = 0xb48b634d;
          auVar29._28_4_ = 0xb48b634d;
          auVar208 = vmulps_avx512vl(auVar68,auVar29);
          auVar30._8_4_ = 0x37cfab9c;
          auVar30._0_8_ = 0x37cfab9c37cfab9c;
          auVar30._12_4_ = 0x37cfab9c;
          auVar30._16_4_ = 0x37cfab9c;
          auVar30._20_4_ = 0x37cfab9c;
          auVar30._24_4_ = 0x37cfab9c;
          auVar30._28_4_ = 0x37cfab9c;
          auVar208 = vaddps_avx512vl(auVar208,auVar30);
          auVar69._4_4_ = fVar351 * auVar188._4_4_;
          auVar69._0_4_ = fVar344 * auVar188._0_4_;
          auVar69._8_4_ = fVar353 * auVar188._8_4_;
          auVar69._12_4_ = fVar355 * auVar188._12_4_;
          auVar69._16_4_ = fVar357 * auVar188._16_4_;
          auVar69._20_4_ = fVar358 * auVar188._20_4_;
          auVar69._24_4_ = fVar359 * auVar188._24_4_;
          auVar69._28_4_ = auVar188._28_4_;
          auVar31._8_4_ = 0xb9501096;
          auVar31._0_8_ = 0xb9501096b9501096;
          auVar31._12_4_ = 0xb9501096;
          auVar31._16_4_ = 0xb9501096;
          auVar31._20_4_ = 0xb9501096;
          auVar31._24_4_ = 0xb9501096;
          auVar31._28_4_ = 0xb9501096;
          auVar188 = vaddps_avx512vl(auVar69,auVar31);
          auVar208 = vmulps_avx512vl(auVar68,auVar208);
          auVar32._8_4_ = 0xbab60981;
          auVar32._0_8_ = 0xbab60981bab60981;
          auVar32._12_4_ = 0xbab60981;
          auVar32._16_4_ = 0xbab60981;
          auVar32._20_4_ = 0xbab60981;
          auVar32._24_4_ = 0xbab60981;
          auVar32._28_4_ = 0xbab60981;
          auVar208 = vaddps_avx512vl(auVar208,auVar32);
          auVar70._4_4_ = fVar351 * auVar188._4_4_;
          auVar70._0_4_ = fVar344 * auVar188._0_4_;
          auVar70._8_4_ = fVar353 * auVar188._8_4_;
          auVar70._12_4_ = fVar355 * auVar188._12_4_;
          auVar70._16_4_ = fVar357 * auVar188._16_4_;
          auVar70._20_4_ = fVar358 * auVar188._20_4_;
          auVar70._24_4_ = fVar359 * auVar188._24_4_;
          auVar70._28_4_ = auVar188._28_4_;
          auVar33._8_4_ = 0x3c088898;
          auVar33._0_8_ = 0x3c0888983c088898;
          auVar33._12_4_ = 0x3c088898;
          auVar33._16_4_ = 0x3c088898;
          auVar33._20_4_ = 0x3c088898;
          auVar33._24_4_ = 0x3c088898;
          auVar33._28_4_ = 0x3c088898;
          auVar188 = vaddps_avx512vl(auVar70,auVar33);
          auVar208 = vmulps_avx512vl(auVar68,auVar208);
          auVar34._8_4_ = 0x3d2aaaa4;
          auVar34._0_8_ = 0x3d2aaaa43d2aaaa4;
          auVar34._12_4_ = 0x3d2aaaa4;
          auVar34._16_4_ = 0x3d2aaaa4;
          auVar34._20_4_ = 0x3d2aaaa4;
          auVar34._24_4_ = 0x3d2aaaa4;
          auVar34._28_4_ = 0x3d2aaaa4;
          auVar208 = vaddps_avx512vl(auVar208,auVar34);
          auVar71._4_4_ = fVar351 * auVar188._4_4_;
          auVar71._0_4_ = fVar344 * auVar188._0_4_;
          auVar71._8_4_ = fVar353 * auVar188._8_4_;
          auVar71._12_4_ = fVar355 * auVar188._12_4_;
          auVar71._16_4_ = fVar357 * auVar188._16_4_;
          auVar71._20_4_ = fVar358 * auVar188._20_4_;
          auVar71._24_4_ = fVar359 * auVar188._24_4_;
          auVar71._28_4_ = auVar188._28_4_;
          auVar35._8_4_ = 0xbe2aaaab;
          auVar35._0_8_ = 0xbe2aaaabbe2aaaab;
          auVar35._12_4_ = 0xbe2aaaab;
          auVar35._16_4_ = 0xbe2aaaab;
          auVar35._20_4_ = 0xbe2aaaab;
          auVar35._24_4_ = 0xbe2aaaab;
          auVar35._28_4_ = 0xbe2aaaab;
          auVar188 = vaddps_avx512vl(auVar71,auVar35);
          auVar208 = vmulps_avx512vl(auVar68,auVar208);
          auVar361._8_4_ = 0xbf000000;
          auVar361._0_8_ = 0xbf000000bf000000;
          auVar361._12_4_ = 0xbf000000;
          auVar361._16_4_ = 0xbf000000;
          auVar361._20_4_ = 0xbf000000;
          auVar361._24_4_ = 0xbf000000;
          auVar361._28_4_ = 0xbf000000;
          auVar208 = vaddps_avx512vl(auVar208,auVar361);
          auVar188 = vmulps_avx512vl(auVar68,auVar188);
          auVar208 = vmulps_avx512vl(auVar68,auVar208);
          auVar188 = vaddps_avx512vl(auVar188,auVar210);
          auVar209 = vmulps_avx512vl(auVar209,auVar188);
          auVar208 = vaddps_avx512vl(auVar208,auVar210);
          auVar212 = vblendmps_avx512vl(auVar209,auVar208);
          bVar7 = (bool)((byte)uVar151 & 1);
          auVar214._0_4_ = (uint)bVar7 * auVar212._0_4_ | (uint)!bVar7 * auVar188._0_4_;
          bVar7 = (bool)((byte)(uVar151 >> 1) & 1);
          auVar214._4_4_ = (uint)bVar7 * auVar212._4_4_ | (uint)!bVar7 * auVar188._4_4_;
          bVar7 = (bool)((byte)(uVar151 >> 2) & 1);
          auVar214._8_4_ = (uint)bVar7 * auVar212._8_4_ | (uint)!bVar7 * auVar188._8_4_;
          bVar7 = (bool)((byte)(uVar151 >> 3) & 1);
          auVar214._12_4_ = (uint)bVar7 * auVar212._12_4_ | (uint)!bVar7 * auVar188._12_4_;
          bVar7 = (bool)((byte)(uVar151 >> 4) & 1);
          auVar214._16_4_ = (uint)bVar7 * auVar212._16_4_ | (uint)!bVar7 * auVar188._16_4_;
          bVar7 = (bool)((byte)(uVar151 >> 5) & 1);
          auVar214._20_4_ = (uint)bVar7 * auVar212._20_4_ | (uint)!bVar7 * auVar188._20_4_;
          bVar7 = (bool)((byte)(uVar151 >> 6) & 1);
          auVar214._24_4_ = (uint)bVar7 * auVar212._24_4_ | (uint)!bVar7 * auVar188._24_4_;
          bVar7 = (bool)((byte)(uVar151 >> 7) & 1);
          auVar214._28_4_ = (uint)bVar7 * auVar212._28_4_ | (uint)!bVar7 * auVar188._28_4_;
          bVar7 = (bool)((byte)uVar18 & 1);
          auVar215._0_4_ = (uint)bVar7 * auVar208._0_4_ | (uint)!bVar7 * auVar209._0_4_;
          bVar7 = (bool)((byte)(uVar18 >> 1) & 1);
          auVar215._4_4_ = (uint)bVar7 * auVar208._4_4_ | (uint)!bVar7 * auVar209._4_4_;
          bVar7 = (bool)((byte)(uVar18 >> 2) & 1);
          auVar215._8_4_ = (uint)bVar7 * auVar208._8_4_ | (uint)!bVar7 * auVar209._8_4_;
          bVar7 = (bool)((byte)(uVar18 >> 3) & 1);
          auVar215._12_4_ = (uint)bVar7 * auVar208._12_4_ | (uint)!bVar7 * auVar209._12_4_;
          bVar7 = (bool)((byte)(uVar18 >> 4) & 1);
          auVar215._16_4_ = (uint)bVar7 * auVar208._16_4_ | (uint)!bVar7 * auVar209._16_4_;
          bVar7 = (bool)((byte)(uVar18 >> 5) & 1);
          auVar215._20_4_ = (uint)bVar7 * auVar208._20_4_ | (uint)!bVar7 * auVar209._20_4_;
          bVar7 = (bool)((byte)(uVar18 >> 6) & 1);
          auVar215._24_4_ = (uint)bVar7 * auVar208._24_4_ | (uint)!bVar7 * auVar209._24_4_;
          bVar7 = SUB81(uVar18 >> 7,0);
          auVar215._28_4_ = (uint)bVar7 * auVar208._28_4_ | (uint)!bVar7 * auVar209._28_4_;
          auVar188 = vxorps_avx512vl(auVar207,auVar340);
          bVar145 = (byte)uVar147;
          auVar216._0_4_ =
               (uint)(bVar145 & 1) * auVar188._0_4_ | (uint)!(bool)(bVar145 & 1) * auVar207._0_4_;
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar216._4_4_ = (uint)bVar7 * auVar188._4_4_ | (uint)!bVar7 * auVar207._4_4_;
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar216._8_4_ = (uint)bVar7 * auVar188._8_4_ | (uint)!bVar7 * auVar207._8_4_;
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar216._12_4_ = (uint)bVar7 * auVar188._12_4_ | (uint)!bVar7 * auVar207._12_4_;
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          auVar216._16_4_ = (uint)bVar7 * auVar188._16_4_ | (uint)!bVar7 * auVar207._16_4_;
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          auVar216._20_4_ = (uint)bVar7 * auVar188._20_4_ | (uint)!bVar7 * auVar207._20_4_;
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          auVar216._24_4_ = (uint)bVar7 * auVar188._24_4_ | (uint)!bVar7 * auVar207._24_4_;
          bVar7 = SUB81(uVar147 >> 7,0);
          auVar216._28_4_ = (uint)bVar7 * auVar188._28_4_ | (uint)!bVar7 * auVar207._28_4_;
          auVar188 = vxorps_avx512vl(auVar204,auVar340);
          auVar217._0_4_ =
               (uint)(bVar145 & 1) * auVar188._0_4_ | (uint)!(bool)(bVar145 & 1) * auVar204._0_4_;
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar217._4_4_ = (uint)bVar7 * auVar188._4_4_ | (uint)!bVar7 * auVar204._4_4_;
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar217._8_4_ = (uint)bVar7 * auVar188._8_4_ | (uint)!bVar7 * auVar204._8_4_;
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar217._12_4_ = (uint)bVar7 * auVar188._12_4_ | (uint)!bVar7 * auVar204._12_4_;
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          auVar217._16_4_ = (uint)bVar7 * auVar188._16_4_ | (uint)!bVar7 * auVar204._16_4_;
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          auVar217._20_4_ = (uint)bVar7 * auVar188._20_4_ | (uint)!bVar7 * auVar204._20_4_;
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          auVar217._24_4_ = (uint)bVar7 * auVar188._24_4_ | (uint)!bVar7 * auVar204._24_4_;
          bVar7 = SUB81(uVar147 >> 7,0);
          auVar217._28_4_ = (uint)bVar7 * auVar188._28_4_ | (uint)!bVar7 * auVar204._28_4_;
          auVar188 = vfmsub213ps_avx512vl(auVar187,auVar211,auVar216);
          auVar208 = vfmsub213ps_avx512vl(auVar189,auVar211,auVar217);
          fVar344 = auVar188._0_4_;
          fVar357 = auVar188._4_4_;
          fVar311 = auVar188._8_4_;
          fVar317 = auVar188._12_4_;
          fVar320 = auVar188._16_4_;
          fVar323 = auVar188._20_4_;
          fVar326 = auVar188._24_4_;
          auVar188 = vmulps_avx512vl(auVar208,auVar208);
          auVar209 = vxorps_avx512vl(auVar205,auVar340);
          auVar218._0_4_ =
               (uint)(bVar145 & 1) * auVar209._0_4_ | (uint)!(bool)(bVar145 & 1) * auVar205._0_4_;
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar218._4_4_ = (uint)bVar7 * auVar209._4_4_ | (uint)!bVar7 * auVar205._4_4_;
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar218._8_4_ = (uint)bVar7 * auVar209._8_4_ | (uint)!bVar7 * auVar205._8_4_;
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar218._12_4_ = (uint)bVar7 * auVar209._12_4_ | (uint)!bVar7 * auVar205._12_4_;
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          auVar218._16_4_ = (uint)bVar7 * auVar209._16_4_ | (uint)!bVar7 * auVar205._16_4_;
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          auVar218._20_4_ = (uint)bVar7 * auVar209._20_4_ | (uint)!bVar7 * auVar205._20_4_;
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          auVar218._24_4_ = (uint)bVar7 * auVar209._24_4_ | (uint)!bVar7 * auVar205._24_4_;
          bVar7 = SUB81(uVar147 >> 7,0);
          auVar218._28_4_ = (uint)bVar7 * auVar209._28_4_ | (uint)!bVar7 * auVar205._28_4_;
          auVar209 = vfmsub213ps_avx512vl(auVar190,auVar211,auVar218);
          fVar351 = auVar209._0_4_;
          fVar358 = auVar209._4_4_;
          fVar312 = auVar209._8_4_;
          fVar318 = auVar209._12_4_;
          fVar321 = auVar209._16_4_;
          fVar324 = auVar209._20_4_;
          fVar327 = auVar209._24_4_;
          auVar209 = vxorps_avx512vl(auVar206,auVar340);
          auVar219._0_4_ =
               (uint)(bVar145 & 1) * auVar209._0_4_ | (uint)!(bool)(bVar145 & 1) * auVar206._0_4_;
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar219._4_4_ = (uint)bVar7 * auVar209._4_4_ | (uint)!bVar7 * auVar206._4_4_;
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar219._8_4_ = (uint)bVar7 * auVar209._8_4_ | (uint)!bVar7 * auVar206._8_4_;
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar219._12_4_ = (uint)bVar7 * auVar209._12_4_ | (uint)!bVar7 * auVar206._12_4_;
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          auVar219._16_4_ = (uint)bVar7 * auVar209._16_4_ | (uint)!bVar7 * auVar206._16_4_;
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          auVar219._20_4_ = (uint)bVar7 * auVar209._20_4_ | (uint)!bVar7 * auVar206._20_4_;
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          auVar219._24_4_ = (uint)bVar7 * auVar209._24_4_ | (uint)!bVar7 * auVar206._24_4_;
          bVar7 = SUB81(uVar147 >> 7,0);
          auVar219._28_4_ = (uint)bVar7 * auVar209._28_4_ | (uint)!bVar7 * auVar206._28_4_;
          auVar209 = vfmsub213ps_avx512vl(auVar201,auVar211,auVar219);
          fVar353 = auVar209._0_4_;
          fVar359 = auVar209._4_4_;
          fVar316 = auVar209._8_4_;
          fVar319 = auVar209._12_4_;
          fVar322 = auVar209._16_4_;
          fVar325 = auVar209._20_4_;
          fVar343 = auVar209._24_4_;
          auVar284._0_4_ =
               fVar353 * fVar353 + fVar351 * fVar351 + fVar344 * fVar344 + auVar188._0_4_;
          auVar284._4_4_ =
               fVar359 * fVar359 + fVar358 * fVar358 + fVar357 * fVar357 + auVar188._4_4_;
          auVar284._8_4_ =
               fVar316 * fVar316 + fVar312 * fVar312 + fVar311 * fVar311 + auVar188._8_4_;
          auVar284._12_4_ =
               fVar319 * fVar319 + fVar318 * fVar318 + fVar317 * fVar317 + auVar188._12_4_;
          auVar284._16_4_ =
               fVar322 * fVar322 + fVar321 * fVar321 + fVar320 * fVar320 + auVar188._16_4_;
          auVar284._20_4_ =
               fVar325 * fVar325 + fVar324 * fVar324 + fVar323 * fVar323 + auVar188._20_4_;
          auVar284._24_4_ =
               fVar343 * fVar343 + fVar327 * fVar327 + fVar326 * fVar326 + auVar188._24_4_;
          auVar284._28_4_ =
               auVar159._28_4_ + (float)local_200._4_4_ + (float)local_240._4_4_ + auVar188._28_4_;
          auVar188 = vrsqrt14ps_avx512vl(auVar284);
          fVar355 = auVar188._0_4_;
          fVar328 = auVar188._4_4_;
          fVar236 = auVar188._8_4_;
          fVar239 = auVar188._12_4_;
          fVar240 = auVar188._16_4_;
          fVar241 = auVar188._20_4_;
          fVar238 = auVar188._24_4_;
          auVar72._4_4_ = fVar328 * fVar328 * fVar328 * auVar284._4_4_ * -0.5;
          auVar72._0_4_ = fVar355 * fVar355 * fVar355 * auVar284._0_4_ * -0.5;
          auVar72._8_4_ = fVar236 * fVar236 * fVar236 * auVar284._8_4_ * -0.5;
          auVar72._12_4_ = fVar239 * fVar239 * fVar239 * auVar284._12_4_ * -0.5;
          auVar72._16_4_ = fVar240 * fVar240 * fVar240 * auVar284._16_4_ * -0.5;
          auVar72._20_4_ = fVar241 * fVar241 * fVar241 * auVar284._20_4_ * -0.5;
          auVar72._24_4_ = fVar238 * fVar238 * fVar238 * auVar284._24_4_ * -0.5;
          auVar72._28_4_ = auVar284._28_4_;
          auVar313._8_4_ = 0x3fc00000;
          auVar313._0_8_ = 0x3fc000003fc00000;
          auVar313._12_4_ = 0x3fc00000;
          auVar313._16_4_ = 0x3fc00000;
          auVar313._20_4_ = 0x3fc00000;
          auVar313._24_4_ = 0x3fc00000;
          auVar313._28_4_ = 0x3fc00000;
          auVar153 = vfmadd231ps_fma(auVar72,auVar313,auVar188);
          fVar355 = auVar153._0_4_;
          fVar328 = auVar153._4_4_;
          auVar73._4_4_ = fVar357 * fVar328;
          auVar73._0_4_ = fVar344 * fVar355;
          fVar344 = auVar153._8_4_;
          auVar73._8_4_ = fVar311 * fVar344;
          fVar357 = auVar153._12_4_;
          auVar73._12_4_ = fVar317 * fVar357;
          auVar73._16_4_ = fVar320 * 0.0;
          auVar73._20_4_ = fVar323 * 0.0;
          auVar73._24_4_ = fVar326 * 0.0;
          auVar73._28_4_ = auVar188._28_4_;
          auVar208 = vmulps_avx512vl(auVar208,ZEXT1632(auVar153));
          auVar209 = vxorps_avx512vl(auVar215,auVar340);
          bVar7 = (bool)((byte)uVar16 & 1);
          auVar220._0_4_ = (uint)bVar7 * auVar209._0_4_ | !bVar7 * auVar215._0_4_;
          bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar220._4_4_ = (uint)bVar7 * auVar209._4_4_ | !bVar7 * auVar215._4_4_;
          bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar220._8_4_ = (uint)bVar7 * auVar209._8_4_ | !bVar7 * auVar215._8_4_;
          bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar220._12_4_ = (uint)bVar7 * auVar209._12_4_ | !bVar7 * auVar215._12_4_;
          bVar7 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar220._16_4_ = (uint)bVar7 * auVar209._16_4_ | !bVar7 * auVar215._16_4_;
          bVar7 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar220._20_4_ = (uint)bVar7 * auVar209._20_4_ | !bVar7 * auVar215._20_4_;
          bVar7 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar220._24_4_ = (uint)bVar7 * auVar209._24_4_ | !bVar7 * auVar215._24_4_;
          bVar7 = SUB81(uVar16 >> 7,0);
          auVar220._28_4_ = (uint)bVar7 * auVar209._28_4_ | !bVar7 * auVar215._28_4_;
          auVar209 = vxorps_avx512vl(auVar214,auVar340);
          bVar7 = (bool)((byte)uVar15 & 1);
          auVar221._0_4_ = (float)(bVar7 * auVar214._0_4_ | (uint)!bVar7 * auVar209._0_4_);
          bVar7 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar221._4_4_ = (float)(bVar7 * auVar214._4_4_ | (uint)!bVar7 * auVar209._4_4_);
          bVar7 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar221._8_4_ = (float)(bVar7 * auVar214._8_4_ | (uint)!bVar7 * auVar209._8_4_);
          bVar7 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar221._12_4_ = (float)(bVar7 * auVar214._12_4_ | (uint)!bVar7 * auVar209._12_4_);
          bVar7 = (bool)((byte)(uVar15 >> 4) & 1);
          auVar221._16_4_ = (float)(bVar7 * auVar214._16_4_ | (uint)!bVar7 * auVar209._16_4_);
          bVar7 = (bool)((byte)(uVar15 >> 5) & 1);
          auVar221._20_4_ = (float)(bVar7 * auVar214._20_4_ | (uint)!bVar7 * auVar209._20_4_);
          bVar7 = (bool)((byte)(uVar15 >> 6) & 1);
          auVar221._24_4_ = (float)(bVar7 * auVar214._24_4_ | (uint)!bVar7 * auVar209._24_4_);
          bVar7 = SUB81(uVar15 >> 7,0);
          auVar221._28_4_ = bVar7 * auVar214._28_4_ | (uint)!bVar7 * auVar209._28_4_;
          auVar209 = vmulps_avx512vl(auVar73,auVar221);
          auVar204 = vmulps_avx512vl(auVar208,auVar221);
          auVar74._4_4_ = fVar358 * fVar328 * auVar221._4_4_;
          auVar74._0_4_ = fVar351 * fVar355 * auVar221._0_4_;
          auVar74._8_4_ = fVar312 * fVar344 * auVar221._8_4_;
          auVar74._12_4_ = fVar318 * fVar357 * auVar221._12_4_;
          auVar74._16_4_ = fVar321 * 0.0 * auVar221._16_4_;
          auVar74._20_4_ = fVar324 * 0.0 * auVar221._20_4_;
          auVar74._24_4_ = fVar327 * 0.0 * auVar221._24_4_;
          auVar74._28_4_ = 0x80000000;
          auVar75._4_4_ = fVar359 * fVar328 * auVar221._4_4_;
          auVar75._0_4_ = fVar353 * fVar355 * auVar221._0_4_;
          auVar75._8_4_ = fVar316 * fVar344 * auVar221._8_4_;
          auVar75._12_4_ = fVar319 * fVar357 * auVar221._12_4_;
          auVar75._16_4_ = fVar322 * 0.0 * auVar221._16_4_;
          auVar75._20_4_ = fVar325 * 0.0 * auVar221._20_4_;
          auVar75._24_4_ = fVar343 * 0.0 * auVar221._24_4_;
          auVar75._28_4_ = auVar208._28_4_;
          auVar208 = vfmadd231ps_avx512vl(auVar209,auVar220,auVar187);
          auVar209 = vfmadd231ps_avx512vl(auVar204,auVar220,auVar189);
          auVar204 = vfmadd231ps_avx512vl(auVar74,auVar220,auVar190);
          auVar205 = vfmadd231ps_avx512vl(auVar75,auVar201,auVar220);
          auVar206 = vsubps_avx512vl(auVar216,auVar187);
          auVar187 = vfmadd213ps_avx512vl(auVar206,auVar177,auVar187);
          auVar206 = vsubps_avx512vl(auVar217,auVar189);
          auVar189 = vfmadd213ps_avx512vl(auVar206,auVar177,auVar189);
          auVar206 = vsubps_avx512vl(auVar218,auVar190);
          auVar190 = vfmadd213ps_avx512vl(auVar206,auVar177,auVar190);
          auVar206 = vsubps_avx512vl(auVar219,auVar201);
          auVar206 = vfmadd213ps_avx512vl(auVar206,auVar177,auVar201);
          auVar76._4_4_ = auVar187._4_4_ * auVar187._4_4_;
          auVar76._0_4_ = auVar187._0_4_ * auVar187._0_4_;
          auVar76._8_4_ = auVar187._8_4_ * auVar187._8_4_;
          auVar76._12_4_ = auVar187._12_4_ * auVar187._12_4_;
          auVar76._16_4_ = auVar187._16_4_ * auVar187._16_4_;
          auVar76._20_4_ = auVar187._20_4_ * auVar187._20_4_;
          auVar76._24_4_ = auVar187._24_4_ * auVar187._24_4_;
          auVar76._28_4_ = auVar188._28_4_;
          auVar188 = vmulps_avx512vl(auVar189,auVar189);
          auVar188 = vaddps_avx512vl(auVar76,auVar188);
          auVar207 = vmulps_avx512vl(auVar190,auVar190);
          auVar188 = vaddps_avx512vl(auVar207,auVar188);
          auVar207 = vmulps_avx512vl(auVar206,auVar206);
          auVar188 = vaddps_avx512vl(auVar207,auVar188);
          auVar207 = vrsqrt14ps_avx512vl(auVar188);
          auVar77._4_4_ = auVar188._4_4_ * -0.5 * auVar207._4_4_;
          auVar77._0_4_ = auVar188._0_4_ * -0.5 * auVar207._0_4_;
          auVar77._8_4_ = auVar188._8_4_ * -0.5 * auVar207._8_4_;
          auVar77._12_4_ = auVar188._12_4_ * -0.5 * auVar207._12_4_;
          auVar77._16_4_ = auVar188._16_4_ * -0.5 * auVar207._16_4_;
          auVar77._20_4_ = auVar188._20_4_ * -0.5 * auVar207._20_4_;
          auVar77._24_4_ = auVar188._24_4_ * -0.5 * auVar207._24_4_;
          auVar77._28_4_ = 0xbf000000;
          auVar188 = vmulps_avx512vl(auVar207,auVar207);
          auVar188 = vmulps_avx512vl(auVar188,auVar77);
          auVar153 = vfmadd231ps_fma(auVar188,auVar207,auVar313);
          auVar36._8_4_ = 0x3f7fdf3b;
          auVar36._0_8_ = 0x3f7fdf3b3f7fdf3b;
          auVar36._12_4_ = 0x3f7fdf3b;
          auVar36._16_4_ = 0x3f7fdf3b;
          auVar36._20_4_ = 0x3f7fdf3b;
          auVar36._24_4_ = 0x3f7fdf3b;
          auVar36._28_4_ = 0x3f7fdf3b;
          uVar147 = vcmpps_avx512vl(auVar211,auVar36,6);
          auVar187 = vmulps_avx512vl(auVar187,ZEXT1632(auVar153));
          bVar145 = (byte)uVar147;
          auVar222._0_4_ =
               (uint)(bVar145 & 1) * auVar187._0_4_ | (uint)!(bool)(bVar145 & 1) * auVar208._0_4_;
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar222._4_4_ = (uint)bVar7 * auVar187._4_4_ | (uint)!bVar7 * auVar208._4_4_;
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar222._8_4_ = (uint)bVar7 * auVar187._8_4_ | (uint)!bVar7 * auVar208._8_4_;
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar222._12_4_ = (uint)bVar7 * auVar187._12_4_ | (uint)!bVar7 * auVar208._12_4_;
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          auVar222._16_4_ = (uint)bVar7 * auVar187._16_4_ | (uint)!bVar7 * auVar208._16_4_;
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          auVar222._20_4_ = (uint)bVar7 * auVar187._20_4_ | (uint)!bVar7 * auVar208._20_4_;
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          auVar222._24_4_ = (uint)bVar7 * auVar187._24_4_ | (uint)!bVar7 * auVar208._24_4_;
          bVar7 = SUB81(uVar147 >> 7,0);
          auVar222._28_4_ = (uint)bVar7 * auVar187._28_4_ | (uint)!bVar7 * auVar208._28_4_;
          auVar187 = vmulps_avx512vl(auVar189,ZEXT1632(auVar153));
          auVar223._0_4_ =
               (uint)(bVar145 & 1) * auVar187._0_4_ | (uint)!(bool)(bVar145 & 1) * auVar209._0_4_;
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar223._4_4_ = (uint)bVar7 * auVar187._4_4_ | (uint)!bVar7 * auVar209._4_4_;
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar223._8_4_ = (uint)bVar7 * auVar187._8_4_ | (uint)!bVar7 * auVar209._8_4_;
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar223._12_4_ = (uint)bVar7 * auVar187._12_4_ | (uint)!bVar7 * auVar209._12_4_;
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          auVar223._16_4_ = (uint)bVar7 * auVar187._16_4_ | (uint)!bVar7 * auVar209._16_4_;
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          auVar223._20_4_ = (uint)bVar7 * auVar187._20_4_ | (uint)!bVar7 * auVar209._20_4_;
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          auVar223._24_4_ = (uint)bVar7 * auVar187._24_4_ | (uint)!bVar7 * auVar209._24_4_;
          bVar7 = SUB81(uVar147 >> 7,0);
          auVar223._28_4_ = (uint)bVar7 * auVar187._28_4_ | (uint)!bVar7 * auVar209._28_4_;
          auVar187 = vbroadcastss_avx512vl(auVar179._0_16_);
          auVar188 = vmulps_avx512vl(auVar190,ZEXT1632(auVar153));
          auVar224._0_4_ =
               (float)((uint)(bVar145 & 1) * auVar188._0_4_ |
                      (uint)!(bool)(bVar145 & 1) * auVar204._0_4_);
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar224._4_4_ = (float)((uint)bVar7 * auVar188._4_4_ | (uint)!bVar7 * auVar204._4_4_);
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar224._8_4_ = (float)((uint)bVar7 * auVar188._8_4_ | (uint)!bVar7 * auVar204._8_4_);
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar224._12_4_ = (float)((uint)bVar7 * auVar188._12_4_ | (uint)!bVar7 * auVar204._12_4_);
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          auVar224._16_4_ = (float)((uint)bVar7 * auVar188._16_4_ | (uint)!bVar7 * auVar204._16_4_);
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          auVar224._20_4_ = (float)((uint)bVar7 * auVar188._20_4_ | (uint)!bVar7 * auVar204._20_4_);
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          auVar224._24_4_ = (float)((uint)bVar7 * auVar188._24_4_ | (uint)!bVar7 * auVar204._24_4_);
          bVar7 = SUB81(uVar147 >> 7,0);
          auVar224._28_4_ = (uint)bVar7 * auVar188._28_4_ | (uint)!bVar7 * auVar204._28_4_;
          auVar188 = vpermps_avx512vl(auVar364,auVar179);
          auVar179 = vpermps_avx512vl(auVar368,auVar179);
          auVar189 = vmulps_avx512vl(auVar206,ZEXT1632(auVar153));
          auVar225._0_4_ =
               (float)((uint)(bVar145 & 1) * auVar189._0_4_ |
                      (uint)!(bool)(bVar145 & 1) * auVar205._0_4_);
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar225._4_4_ = (float)((uint)bVar7 * auVar189._4_4_ | (uint)!bVar7 * auVar205._4_4_);
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar225._8_4_ = (float)((uint)bVar7 * auVar189._8_4_ | (uint)!bVar7 * auVar205._8_4_);
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar225._12_4_ = (float)((uint)bVar7 * auVar189._12_4_ | (uint)!bVar7 * auVar205._12_4_);
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          auVar225._16_4_ = (float)((uint)bVar7 * auVar189._16_4_ | (uint)!bVar7 * auVar205._16_4_);
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          auVar225._20_4_ = (float)((uint)bVar7 * auVar189._20_4_ | (uint)!bVar7 * auVar205._20_4_);
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          auVar225._24_4_ = (float)((uint)bVar7 * auVar189._24_4_ | (uint)!bVar7 * auVar205._24_4_);
          bVar7 = SUB81(uVar147 >> 7,0);
          auVar225._28_4_ = (uint)bVar7 * auVar189._28_4_ | (uint)!bVar7 * auVar205._28_4_;
          auVar189 = vbroadcastss_avx512vl(auVar182._0_16_);
          auVar190 = vpermps_avx512vl(auVar364,auVar182);
          auVar182 = vpermps_avx512vl(auVar368,auVar182);
          auVar208 = vsubps_avx512vl(auVar210,auVar177);
          auVar78._4_4_ = fVar257 * auVar187._4_4_;
          auVar78._0_4_ = fVar249 * auVar187._0_4_;
          auVar78._8_4_ = fVar258 * auVar187._8_4_;
          auVar78._12_4_ = fVar259 * auVar187._12_4_;
          auVar78._16_4_ = fVar260 * auVar187._16_4_;
          auVar78._20_4_ = fVar261 * auVar187._20_4_;
          auVar78._24_4_ = fVar262 * auVar187._24_4_;
          auVar78._28_4_ = auVar187._28_4_;
          auVar209 = vfmadd213ps_avx512vl(local_220,auVar208,auVar78);
          auVar187 = vbroadcastss_avx512vl(auVar180._0_16_);
          auVar79._4_4_ = fVar257 * auVar188._4_4_;
          auVar79._0_4_ = fVar249 * auVar188._0_4_;
          auVar79._8_4_ = fVar258 * auVar188._8_4_;
          auVar79._12_4_ = fVar259 * auVar188._12_4_;
          auVar79._16_4_ = fVar260 * auVar188._16_4_;
          auVar79._20_4_ = fVar261 * auVar188._20_4_;
          auVar79._24_4_ = fVar262 * auVar188._24_4_;
          auVar79._28_4_ = auVar188._28_4_;
          auVar178 = vfmadd213ps_avx512vl(auVar178,auVar208,auVar79);
          auVar188 = vpermps_avx512vl(auVar364,auVar180);
          auVar180 = vpermps_avx512vl(auVar368,auVar180);
          auVar204 = vpermps_avx512vl(auVar364,auVar160);
          auVar205 = vpermps_avx512vl(auVar368,auVar160);
          auVar160 = vbroadcastss_avx512vl(auVar160._0_16_);
          auVar80._4_4_ = fVar257 * auVar179._4_4_;
          auVar80._0_4_ = fVar249 * auVar179._0_4_;
          auVar80._8_4_ = fVar258 * auVar179._8_4_;
          auVar80._12_4_ = fVar259 * auVar179._12_4_;
          auVar80._16_4_ = fVar260 * auVar179._16_4_;
          auVar80._20_4_ = fVar261 * auVar179._20_4_;
          auVar80._24_4_ = fVar262 * auVar179._24_4_;
          auVar80._28_4_ = auVar179._28_4_;
          auVar181 = vfmadd213ps_avx512vl(auVar181,auVar208,auVar80);
          auVar81._4_4_ = fVar257 * auVar189._4_4_;
          auVar81._0_4_ = fVar249 * auVar189._0_4_;
          auVar81._8_4_ = fVar258 * auVar189._8_4_;
          auVar81._12_4_ = fVar259 * auVar189._12_4_;
          auVar81._16_4_ = fVar260 * auVar189._16_4_;
          auVar81._20_4_ = fVar261 * auVar189._20_4_;
          auVar81._24_4_ = fVar262 * auVar189._24_4_;
          auVar81._28_4_ = auVar179._28_4_;
          auVar82._4_4_ = fVar257 * auVar190._4_4_;
          auVar82._0_4_ = fVar249 * auVar190._0_4_;
          auVar82._8_4_ = fVar258 * auVar190._8_4_;
          auVar82._12_4_ = fVar259 * auVar190._12_4_;
          auVar82._16_4_ = fVar260 * auVar190._16_4_;
          auVar82._20_4_ = fVar261 * auVar190._20_4_;
          fVar344 = auVar189._28_4_;
          auVar82._24_4_ = fVar262 * auVar190._24_4_;
          auVar82._28_4_ = fVar344;
          auVar83._4_4_ = fVar257 * auVar182._4_4_;
          auVar83._0_4_ = fVar249 * auVar182._0_4_;
          auVar83._8_4_ = fVar258 * auVar182._8_4_;
          auVar83._12_4_ = fVar259 * auVar182._12_4_;
          auVar83._16_4_ = fVar260 * auVar182._16_4_;
          auVar83._20_4_ = fVar261 * auVar182._20_4_;
          auVar83._24_4_ = fVar262 * auVar182._24_4_;
          auVar83._28_4_ = auVar190._28_4_;
          auVar179 = vfmadd213ps_avx512vl(local_260,auVar208,auVar81);
          auVar153 = vfmadd213ps_fma(auVar176,auVar208,auVar82);
          auVar158 = vfmadd213ps_fma(auVar183,auVar208,auVar83);
          auVar84._4_4_ = fVar257 * auVar187._4_4_;
          auVar84._0_4_ = fVar249 * auVar187._0_4_;
          auVar84._8_4_ = fVar258 * auVar187._8_4_;
          auVar84._12_4_ = fVar259 * auVar187._12_4_;
          auVar84._16_4_ = fVar260 * auVar187._16_4_;
          auVar84._20_4_ = fVar261 * auVar187._20_4_;
          auVar84._24_4_ = fVar262 * auVar187._24_4_;
          auVar84._28_4_ = auVar187._28_4_;
          auVar85._4_4_ = fVar257 * auVar188._4_4_;
          auVar85._0_4_ = fVar249 * auVar188._0_4_;
          auVar85._8_4_ = fVar258 * auVar188._8_4_;
          auVar85._12_4_ = fVar259 * auVar188._12_4_;
          auVar85._16_4_ = fVar260 * auVar188._16_4_;
          auVar85._20_4_ = fVar261 * auVar188._20_4_;
          auVar85._24_4_ = fVar262 * auVar188._24_4_;
          auVar85._28_4_ = auVar188._28_4_;
          auVar176 = vmulps_avx512vl(auVar177,auVar180);
          auVar180 = vfmadd213ps_avx512vl(_local_200,auVar208,auVar84);
          auVar154 = vfmadd213ps_fma(auVar184,auVar208,auVar85);
          auVar182 = vfmadd213ps_avx512vl(auVar185,auVar208,auVar176);
          auVar187 = vmulps_avx512vl(auVar177,auVar160);
          auVar86._4_4_ = auVar204._4_4_ * fVar257;
          auVar86._0_4_ = auVar204._0_4_ * fVar249;
          auVar86._8_4_ = auVar204._8_4_ * fVar258;
          auVar86._12_4_ = auVar204._12_4_ * fVar259;
          auVar86._16_4_ = auVar204._16_4_ * fVar260;
          auVar86._20_4_ = auVar204._20_4_ * fVar261;
          auVar86._24_4_ = auVar204._24_4_ * fVar262;
          auVar86._28_4_ = auVar188._28_4_;
          auVar142._4_4_ = auVar205._4_4_ * fVar257;
          auVar142._0_4_ = auVar205._0_4_ * fVar249;
          auVar142._8_4_ = auVar205._8_4_ * fVar258;
          auVar142._12_4_ = auVar205._12_4_ * fVar259;
          auVar142._16_4_ = auVar205._16_4_ * fVar260;
          auVar142._20_4_ = auVar205._20_4_ * fVar261;
          auVar142._24_4_ = auVar205._24_4_ * fVar262;
          auVar142._28_4_ = auVar177._28_4_;
          auVar160 = vfmadd213ps_avx512vl(_local_240,auVar208,auVar187);
          auVar183 = vfmadd213ps_avx512vl(auVar159,auVar208,auVar86);
          auVar184 = vfmadd213ps_avx512vl(auVar186,auVar208,auVar142);
          auVar177 = vmulps_avx512vl(auVar222,auVar222);
          auVar185 = vmulps_avx512vl(auVar223,auVar223);
          auVar252._0_4_ = auVar177._0_4_ + auVar185._0_4_;
          auVar252._4_4_ = auVar177._4_4_ + auVar185._4_4_;
          auVar252._8_4_ = auVar177._8_4_ + auVar185._8_4_;
          auVar252._12_4_ = auVar177._12_4_ + auVar185._12_4_;
          auVar252._16_4_ = auVar177._16_4_ + auVar185._16_4_;
          auVar252._20_4_ = auVar177._20_4_ + auVar185._20_4_;
          auVar252._24_4_ = auVar177._24_4_ + auVar185._24_4_;
          auVar252._28_4_ = auVar177._28_4_ + auVar185._28_4_;
          auVar87._4_4_ = auVar224._4_4_ * auVar224._4_4_;
          auVar87._0_4_ = auVar224._0_4_ * auVar224._0_4_;
          auVar87._8_4_ = auVar224._8_4_ * auVar224._8_4_;
          auVar87._12_4_ = auVar224._12_4_ * auVar224._12_4_;
          auVar87._16_4_ = auVar224._16_4_ * auVar224._16_4_;
          auVar87._20_4_ = auVar224._20_4_ * auVar224._20_4_;
          auVar87._24_4_ = auVar224._24_4_ * auVar224._24_4_;
          auVar87._28_4_ = auVar176._28_4_;
          auVar159 = vsubps_avx(auVar252,auVar87);
          auVar88._4_4_ = auVar225._4_4_ * auVar225._4_4_;
          auVar88._0_4_ = auVar225._0_4_ * auVar225._0_4_;
          auVar88._8_4_ = auVar225._8_4_ * auVar225._8_4_;
          auVar88._12_4_ = auVar225._12_4_ * auVar225._12_4_;
          auVar88._16_4_ = auVar225._16_4_ * auVar225._16_4_;
          auVar88._20_4_ = auVar225._20_4_ * auVar225._20_4_;
          auVar88._24_4_ = auVar225._24_4_ * auVar225._24_4_;
          auVar88._28_4_ = fVar344;
          auVar159 = vsubps_avx(auVar159,auVar88);
          auVar187 = vmulps_avx512vl(auVar223,auVar224);
          auVar186 = vmulps_avx512vl(auVar222,auVar225);
          fVar249 = auVar187._0_4_ + auVar186._0_4_;
          fVar257 = auVar187._4_4_ + auVar186._4_4_;
          fVar258 = auVar187._8_4_ + auVar186._8_4_;
          fVar259 = auVar187._12_4_ + auVar186._12_4_;
          fVar260 = auVar187._16_4_ + auVar186._16_4_;
          fVar261 = auVar187._20_4_ + auVar186._20_4_;
          fVar262 = auVar187._24_4_ + auVar186._24_4_;
          fVar351 = auVar187._28_4_ + auVar186._28_4_;
          auVar253._0_4_ = fVar249 + fVar249;
          auVar253._4_4_ = fVar257 + fVar257;
          auVar253._8_4_ = fVar258 + fVar258;
          auVar253._12_4_ = fVar259 + fVar259;
          auVar253._16_4_ = fVar260 + fVar260;
          auVar253._20_4_ = fVar261 + fVar261;
          auVar253._24_4_ = fVar262 + fVar262;
          auVar253._28_4_ = fVar351 + fVar351;
          auVar188 = vmulps_avx512vl(auVar223,auVar225);
          auVar189 = vmulps_avx512vl(auVar222,auVar224);
          auVar190 = vsubps_avx512vl(auVar188,auVar189);
          auVar190 = vaddps_avx512vl(auVar190,auVar190);
          auVar187 = vsubps_avx(auVar187,auVar186);
          auVar308._0_4_ = auVar187._0_4_ + auVar187._0_4_;
          auVar308._4_4_ = auVar187._4_4_ + auVar187._4_4_;
          auVar308._8_4_ = auVar187._8_4_ + auVar187._8_4_;
          auVar308._12_4_ = auVar187._12_4_ + auVar187._12_4_;
          auVar308._16_4_ = auVar187._16_4_ + auVar187._16_4_;
          auVar308._20_4_ = auVar187._20_4_ + auVar187._20_4_;
          auVar308._24_4_ = auVar187._24_4_ + auVar187._24_4_;
          auVar308._28_4_ = auVar187._28_4_ + auVar187._28_4_;
          auVar187 = vsubps_avx(auVar177,auVar185);
          auVar285._0_4_ = auVar224._0_4_ * auVar224._0_4_ + auVar187._0_4_;
          auVar285._4_4_ = auVar224._4_4_ * auVar224._4_4_ + auVar187._4_4_;
          auVar285._8_4_ = auVar224._8_4_ * auVar224._8_4_ + auVar187._8_4_;
          auVar285._12_4_ = auVar224._12_4_ * auVar224._12_4_ + auVar187._12_4_;
          auVar285._16_4_ = auVar224._16_4_ * auVar224._16_4_ + auVar187._16_4_;
          auVar285._20_4_ = auVar224._20_4_ * auVar224._20_4_ + auVar187._20_4_;
          auVar285._24_4_ = auVar224._24_4_ * auVar224._24_4_ + auVar187._24_4_;
          auVar285._28_4_ = auVar176._28_4_ + auVar187._28_4_;
          auVar176 = vsubps_avx(auVar285,auVar88);
          auVar89._4_4_ = auVar224._4_4_ * auVar225._4_4_;
          auVar89._0_4_ = auVar224._0_4_ * auVar225._0_4_;
          auVar89._8_4_ = auVar224._8_4_ * auVar225._8_4_;
          auVar89._12_4_ = auVar224._12_4_ * auVar225._12_4_;
          auVar89._16_4_ = auVar224._16_4_ * auVar225._16_4_;
          auVar89._20_4_ = auVar224._20_4_ * auVar225._20_4_;
          auVar89._24_4_ = auVar224._24_4_ * auVar225._24_4_;
          auVar89._28_4_ = auVar285._28_4_;
          auVar177 = vmulps_avx512vl(auVar222,auVar223);
          fVar249 = auVar224._0_4_ * auVar225._0_4_ + auVar177._0_4_;
          fVar257 = auVar224._4_4_ * auVar225._4_4_ + auVar177._4_4_;
          fVar258 = auVar224._8_4_ * auVar225._8_4_ + auVar177._8_4_;
          fVar259 = auVar224._12_4_ * auVar225._12_4_ + auVar177._12_4_;
          fVar260 = auVar224._16_4_ * auVar225._16_4_ + auVar177._16_4_;
          fVar261 = auVar224._20_4_ * auVar225._20_4_ + auVar177._20_4_;
          fVar262 = auVar224._24_4_ * auVar225._24_4_ + auVar177._24_4_;
          fVar351 = auVar285._28_4_ + auVar177._28_4_;
          auVar341._0_4_ = fVar249 + fVar249;
          auVar341._4_4_ = fVar257 + fVar257;
          auVar341._8_4_ = fVar258 + fVar258;
          auVar341._12_4_ = fVar259 + fVar259;
          auVar341._16_4_ = fVar260 + fVar260;
          auVar341._20_4_ = fVar261 + fVar261;
          auVar341._24_4_ = fVar262 + fVar262;
          auVar341._28_4_ = fVar351 + fVar351;
          auVar185 = vaddps_avx512vl(auVar188,auVar189);
          auVar362._0_4_ = auVar185._0_4_ + auVar185._0_4_;
          auVar362._4_4_ = auVar185._4_4_ + auVar185._4_4_;
          auVar362._8_4_ = auVar185._8_4_ + auVar185._8_4_;
          auVar362._12_4_ = auVar185._12_4_ + auVar185._12_4_;
          auVar362._16_4_ = auVar185._16_4_ + auVar185._16_4_;
          auVar362._20_4_ = auVar185._20_4_ + auVar185._20_4_;
          auVar362._24_4_ = auVar185._24_4_ + auVar185._24_4_;
          auVar362._28_4_ = auVar185._28_4_ + auVar185._28_4_;
          auVar177 = vsubps_avx(auVar89,auVar177);
          auVar177 = vaddps_avx512vl(auVar177,auVar177);
          auVar187 = vsubps_avx(auVar187,auVar87);
          auVar279._0_4_ = auVar225._0_4_ * auVar225._0_4_ + auVar187._0_4_;
          auVar279._4_4_ = auVar225._4_4_ * auVar225._4_4_ + auVar187._4_4_;
          auVar279._8_4_ = auVar225._8_4_ * auVar225._8_4_ + auVar187._8_4_;
          auVar279._12_4_ = auVar225._12_4_ * auVar225._12_4_ + auVar187._12_4_;
          auVar279._16_4_ = auVar225._16_4_ * auVar225._16_4_ + auVar187._16_4_;
          auVar279._20_4_ = auVar225._20_4_ * auVar225._20_4_ + auVar187._20_4_;
          auVar279._24_4_ = auVar225._24_4_ * auVar225._24_4_ + auVar187._24_4_;
          auVar279._28_4_ = fVar344 + auVar187._28_4_;
          auVar186 = ZEXT1632(auVar307);
          auVar187 = vmulps_avx512vl(auVar190,auVar186);
          auVar155 = vxorps_avx512vl(auVar201._0_16_,auVar201._0_16_);
          auVar185 = vfmadd213ps_avx512vl(ZEXT1632(auVar155),auVar253,auVar187);
          auVar349._0_4_ = auVar253._0_4_ + auVar187._0_4_;
          auVar349._4_4_ = auVar253._4_4_ + auVar187._4_4_;
          auVar349._8_4_ = auVar253._8_4_ + auVar187._8_4_;
          auVar349._12_4_ = auVar253._12_4_ + auVar187._12_4_;
          auVar349._16_4_ = auVar253._16_4_ + auVar187._16_4_;
          auVar349._20_4_ = auVar253._20_4_ + auVar187._20_4_;
          auVar349._24_4_ = auVar253._24_4_ + auVar187._24_4_;
          fVar249 = auVar187._28_4_;
          auVar349._28_4_ = auVar253._28_4_ + fVar249;
          auVar187 = vfmadd213ps_avx512vl(auVar253,auVar186,auVar190);
          auVar157 = vfmadd231ps_fma(auVar349,auVar159,auVar186);
          auVar294 = vfmadd231ps_fma(auVar187,auVar186,auVar159);
          auVar190 = ZEXT1632(auVar307);
          auVar90._4_4_ = auVar341._4_4_ * 0.0;
          auVar90._0_4_ = auVar341._0_4_ * 0.0;
          auVar90._8_4_ = auVar341._8_4_ * 0.0;
          auVar90._12_4_ = auVar341._12_4_ * 0.0;
          auVar90._16_4_ = auVar341._16_4_ * 0.0;
          auVar90._20_4_ = auVar341._20_4_ * 0.0;
          auVar90._24_4_ = auVar341._24_4_ * 0.0;
          auVar90._28_4_ = fVar249;
          auVar155 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar176,auVar90);
          auVar187 = vaddps_avx512vl(auVar176,auVar90);
          auVar156 = vfmadd213ps_fma(auVar176,auVar190,auVar341);
          auVar176 = vaddps_avx512vl(auVar308,ZEXT1632(auVar155));
          auVar187 = vfmadd231ps_avx512vl(auVar187,auVar308,auVar190);
          auVar155 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar190,auVar308);
          auVar91._4_4_ = auVar279._4_4_ * 0.0;
          auVar91._0_4_ = auVar279._0_4_ * 0.0;
          auVar91._8_4_ = auVar279._8_4_ * 0.0;
          auVar91._12_4_ = auVar279._12_4_ * 0.0;
          auVar91._16_4_ = auVar279._16_4_ * 0.0;
          auVar91._20_4_ = auVar279._20_4_ * 0.0;
          auVar91._24_4_ = auVar279._24_4_ * 0.0;
          auVar91._28_4_ = fVar249;
          auVar186 = vfmadd213ps_avx512vl(ZEXT832(0) << 0x20,auVar177,auVar91);
          auVar188 = vaddps_avx512vl(auVar177,auVar91);
          auVar177 = vfmadd213ps_avx512vl(auVar177,auVar190,auVar279);
          auVar280._0_4_ = auVar362._0_4_ + auVar186._0_4_;
          auVar280._4_4_ = auVar362._4_4_ + auVar186._4_4_;
          auVar280._8_4_ = auVar362._8_4_ + auVar186._8_4_;
          auVar280._12_4_ = auVar362._12_4_ + auVar186._12_4_;
          auVar280._16_4_ = auVar362._16_4_ + auVar186._16_4_;
          auVar280._20_4_ = auVar362._20_4_ + auVar186._20_4_;
          auVar280._24_4_ = auVar362._24_4_ + auVar186._24_4_;
          auVar280._28_4_ = auVar362._28_4_ + auVar186._28_4_;
          auVar156 = vfmadd231ps_fma(auVar188,auVar362,auVar190);
          auVar177 = vfmadd231ps_avx512vl(auVar177,auVar190,auVar362);
          auVar178 = vaddps_avx512vl(auVar178,auVar190);
          auVar208 = ZEXT1632(auVar307);
          auVar186 = vaddps_avx512vl(auVar181,auVar208);
          auVar188 = vaddps_avx512vl(ZEXT1632(auVar158),auVar208);
          auVar181 = vmulps_avx512vl(auVar280,auVar208);
          auVar92._28_4_ = auVar362._28_4_;
          auVar92._0_28_ =
               ZEXT1628(CONCAT412(auVar156._12_4_ * 0.0,
                                  CONCAT48(auVar156._8_4_ * 0.0,
                                           CONCAT44(auVar156._4_4_ * 0.0,auVar156._0_4_ * 0.0))));
          auVar190 = vmulps_avx512vl(auVar177,auVar208);
          auVar201 = vfmadd213ps_avx512vl(ZEXT432(0) << 0x20,auVar176,auVar181);
          auVar158 = vxorps_avx512vl(auVar189._0_16_,auVar189._0_16_);
          auVar189 = vfmadd213ps_avx512vl(ZEXT1632(auVar158),auVar187,auVar92);
          auVar158 = vfmadd213ps_fma(auVar208,ZEXT1632(auVar155),auVar190);
          auVar181 = vfmadd231ps_avx512vl(auVar181,ZEXT1632(auVar153),auVar176);
          auVar208 = vfmadd231ps_avx512vl(auVar92,ZEXT1632(auVar153),auVar187);
          auVar153 = vfmadd213ps_fma(ZEXT1632(auVar153),ZEXT1632(auVar155),auVar190);
          auVar190 = vmulps_avx512vl(auVar182,auVar280);
          auVar204 = vmulps_avx512vl(auVar182,ZEXT1632(auVar156));
          auVar182 = vmulps_avx512vl(auVar182,auVar177);
          auVar190 = vfmadd231ps_avx512vl(auVar190,ZEXT1632(auVar154),auVar176);
          auVar204 = vfmadd231ps_avx512vl(auVar204,ZEXT1632(auVar154),auVar187);
          auVar154 = vfmadd231ps_fma(auVar182,ZEXT1632(auVar155),ZEXT1632(auVar154));
          auVar182 = vmulps_avx512vl(auVar184,auVar280);
          auVar205 = vmulps_avx512vl(auVar184,ZEXT1632(auVar156));
          auVar177 = vmulps_avx512vl(auVar184,auVar177);
          auVar176 = vfmadd231ps_avx512vl(auVar182,auVar183,auVar176);
          auVar187 = vfmadd231ps_avx512vl(auVar205,auVar183,auVar187);
          auVar177 = vfmadd231ps_avx512vl(auVar177,auVar183,ZEXT1632(auVar155));
          auVar159 = vaddps_avx512vl(auVar159,auVar185);
          auVar183 = vfmadd231ps_avx512vl(auVar201,auVar209,auVar159);
          auVar182 = vfmadd231ps_avx512vl(auVar189,auVar209,ZEXT1632(auVar157));
          auVar184 = vfmadd231ps_avx512vl(ZEXT1632(auVar158),ZEXT1632(auVar294),auVar209);
          auVar185 = vfmadd231ps_avx512vl(auVar181,auVar179,auVar159);
          auVar189 = vfmadd231ps_avx512vl(auVar208,auVar179,ZEXT1632(auVar157));
          auVar179 = vfmadd231ps_avx512vl(ZEXT1632(auVar153),ZEXT1632(auVar294),auVar179);
          auVar190 = vfmadd231ps_avx512vl(auVar190,auVar180,auVar159);
          auVar201 = vfmadd231ps_avx512vl(auVar204,auVar180,ZEXT1632(auVar157));
          auVar180 = vfmadd231ps_avx512vl(ZEXT1632(auVar154),ZEXT1632(auVar294),auVar180);
          auVar176 = vfmadd231ps_avx512vl(auVar176,auVar160,auVar159);
          auVar181 = vaddps_avx512vl(auVar178,auVar176);
          auVar187 = vfmadd231ps_avx512vl(auVar187,auVar160,ZEXT1632(auVar157));
          auVar186 = vaddps_avx512vl(auVar186,auVar187);
          auVar187 = vfmadd231ps_avx512vl(auVar177,auVar160,ZEXT1632(auVar294));
          auVar188 = vaddps_avx512vl(auVar188,auVar187);
          auVar254._0_4_ = auVar201._0_4_ * auVar179._0_4_;
          auVar254._4_4_ = auVar201._4_4_ * auVar179._4_4_;
          auVar254._8_4_ = auVar201._8_4_ * auVar179._8_4_;
          auVar254._12_4_ = auVar201._12_4_ * auVar179._12_4_;
          auVar254._16_4_ = auVar201._16_4_ * auVar179._16_4_;
          auVar254._20_4_ = auVar201._20_4_ * auVar179._20_4_;
          auVar254._24_4_ = auVar201._24_4_ * auVar179._24_4_;
          auVar254._28_4_ = 0;
          auVar158 = vfmsub231ps_fma(auVar254,auVar189,auVar180);
          auVar176 = vmulps_avx512vl(auVar180,auVar185);
          auVar154 = vfmsub231ps_fma(auVar176,auVar179,auVar190);
          auVar93._4_4_ = auVar189._4_4_ * auVar190._4_4_;
          auVar93._0_4_ = auVar189._0_4_ * auVar190._0_4_;
          auVar93._8_4_ = auVar189._8_4_ * auVar190._8_4_;
          auVar93._12_4_ = auVar189._12_4_ * auVar190._12_4_;
          auVar93._16_4_ = auVar189._16_4_ * auVar190._16_4_;
          auVar93._20_4_ = auVar189._20_4_ * auVar190._20_4_;
          auVar93._24_4_ = auVar189._24_4_ * auVar190._24_4_;
          auVar93._28_4_ = auVar187._28_4_;
          auVar160 = vfmsub231ps_avx512vl(auVar93,auVar185,auVar201);
          fVar249 = auVar184._0_4_;
          fVar257 = auVar184._4_4_;
          auVar94._4_4_ = fVar257 * auVar190._4_4_;
          auVar94._0_4_ = fVar249 * auVar190._0_4_;
          fVar258 = auVar184._8_4_;
          auVar94._8_4_ = fVar258 * auVar190._8_4_;
          fVar259 = auVar184._12_4_;
          auVar94._12_4_ = fVar259 * auVar190._12_4_;
          fVar260 = auVar184._16_4_;
          auVar94._16_4_ = fVar260 * auVar190._16_4_;
          fVar261 = auVar184._20_4_;
          auVar94._20_4_ = fVar261 * auVar190._20_4_;
          fVar262 = auVar184._24_4_;
          auVar94._24_4_ = fVar262 * auVar190._24_4_;
          auVar94._28_4_ = auVar159._28_4_;
          auVar155 = vfmsub231ps_fma(auVar94,auVar183,auVar180);
          auVar159 = vmulps_avx512vl(auVar182,auVar180);
          auVar156 = vfmsub231ps_fma(auVar159,auVar201,auVar184);
          auVar334._0_4_ = auVar183._0_4_ * auVar201._0_4_;
          auVar334._4_4_ = auVar183._4_4_ * auVar201._4_4_;
          auVar334._8_4_ = auVar183._8_4_ * auVar201._8_4_;
          auVar334._12_4_ = auVar183._12_4_ * auVar201._12_4_;
          auVar334._16_4_ = auVar183._16_4_ * auVar201._16_4_;
          auVar334._20_4_ = auVar183._20_4_ * auVar201._20_4_;
          auVar334._24_4_ = auVar183._24_4_ * auVar201._24_4_;
          auVar334._28_4_ = 0;
          auVar208 = vfmsub231ps_avx512vl(auVar334,auVar182,auVar190);
          auVar95._4_4_ = auVar189._4_4_ * fVar257;
          auVar95._0_4_ = auVar189._0_4_ * fVar249;
          auVar95._8_4_ = auVar189._8_4_ * fVar258;
          auVar95._12_4_ = auVar189._12_4_ * fVar259;
          auVar95._16_4_ = auVar189._16_4_ * fVar260;
          auVar95._20_4_ = auVar189._20_4_ * fVar261;
          auVar95._24_4_ = auVar189._24_4_ * fVar262;
          auVar95._28_4_ = auVar190._28_4_;
          auVar176 = vfmsub231ps_avx512vl(auVar95,auVar182,auVar179);
          auVar96._4_4_ = auVar183._4_4_ * auVar179._4_4_;
          auVar96._0_4_ = auVar183._0_4_ * auVar179._0_4_;
          auVar96._8_4_ = auVar183._8_4_ * auVar179._8_4_;
          auVar96._12_4_ = auVar183._12_4_ * auVar179._12_4_;
          auVar96._16_4_ = auVar183._16_4_ * auVar179._16_4_;
          auVar96._20_4_ = auVar183._20_4_ * auVar179._20_4_;
          auVar96._24_4_ = auVar183._24_4_ * auVar179._24_4_;
          auVar96._28_4_ = auVar201._28_4_;
          auVar179 = vfmsub231ps_avx512vl(auVar96,auVar184,auVar185);
          auVar159 = vmulps_avx512vl(auVar185,auVar182);
          auVar184 = vfmsub231ps_avx512vl(auVar159,auVar183,auVar189);
          auVar97._4_4_ = fVar257 * auVar160._4_4_;
          auVar97._0_4_ = fVar249 * auVar160._0_4_;
          auVar97._8_4_ = fVar258 * auVar160._8_4_;
          auVar97._12_4_ = fVar259 * auVar160._12_4_;
          auVar97._16_4_ = fVar260 * auVar160._16_4_;
          auVar97._20_4_ = fVar261 * auVar160._20_4_;
          auVar97._24_4_ = fVar262 * auVar160._24_4_;
          auVar97._28_4_ = auVar189._28_4_;
          auVar159 = vfmadd231ps_avx512vl(auVar97,ZEXT1632(auVar154),auVar182);
          auVar153 = vfmadd231ps_fma(auVar159,ZEXT1632(auVar158),auVar183);
          auVar159 = vdivps_avx(ZEXT1632(auVar158),ZEXT1632(auVar153));
          auVar187 = vdivps_avx(ZEXT1632(auVar156),ZEXT1632(auVar153));
          auVar180 = ZEXT1632(auVar153);
          auVar176 = vdivps_avx(auVar176,auVar180);
          auVar177 = vdivps_avx(ZEXT1632(auVar154),auVar180);
          auVar178 = vdivps_avx(ZEXT1632(auVar155),auVar180);
          auVar179 = vdivps_avx(auVar179,auVar180);
          auVar182 = ZEXT1632(auVar153);
          auVar180 = vdivps_avx(auVar160,auVar182);
          auVar160 = vdivps_avx(auVar208,auVar182);
          auVar182 = vdivps_avx512vl(auVar184,auVar182);
          fVar249 = auVar188._0_4_;
          fVar257 = auVar188._4_4_;
          auVar98._4_4_ = fVar257 * auVar180._4_4_;
          auVar98._0_4_ = fVar249 * auVar180._0_4_;
          fVar258 = auVar188._8_4_;
          auVar98._8_4_ = fVar258 * auVar180._8_4_;
          fVar259 = auVar188._12_4_;
          auVar98._12_4_ = fVar259 * auVar180._12_4_;
          fVar260 = auVar188._16_4_;
          auVar98._16_4_ = fVar260 * auVar180._16_4_;
          fVar261 = auVar188._20_4_;
          auVar98._20_4_ = fVar261 * auVar180._20_4_;
          fVar262 = auVar188._24_4_;
          auVar98._24_4_ = fVar262 * auVar180._24_4_;
          auVar98._28_4_ = auVar208._28_4_;
          auVar99._4_4_ = fVar257 * auVar160._4_4_;
          auVar99._0_4_ = fVar249 * auVar160._0_4_;
          auVar99._8_4_ = fVar258 * auVar160._8_4_;
          auVar99._12_4_ = fVar259 * auVar160._12_4_;
          auVar99._16_4_ = fVar260 * auVar160._16_4_;
          auVar99._20_4_ = fVar261 * auVar160._20_4_;
          auVar99._24_4_ = fVar262 * auVar160._24_4_;
          auVar99._28_4_ = auVar183._28_4_;
          auVar363._0_4_ = fVar249 * auVar182._0_4_;
          auVar363._4_4_ = fVar257 * auVar182._4_4_;
          auVar363._8_4_ = fVar258 * auVar182._8_4_;
          auVar363._12_4_ = fVar259 * auVar182._12_4_;
          auVar363._16_4_ = fVar260 * auVar182._16_4_;
          auVar363._20_4_ = fVar261 * auVar182._20_4_;
          auVar363._24_4_ = fVar262 * auVar182._24_4_;
          auVar363._28_4_ = 0;
          auVar153 = vfmadd231ps_fma(auVar98,auVar186,auVar177);
          auVar154 = vfmadd231ps_fma(auVar99,auVar186,auVar178);
          auVar158 = vfmadd231ps_fma(auVar363,auVar179,auVar186);
        }
        else {
          uVar152 = uVar146;
          do {
            uVar233 = 0;
            for (uVar148 = uVar152 & 0xff; (uVar148 & 1) == 0; uVar148 = uVar148 >> 1 | 0x80000000)
            {
              uVar233 = uVar233 + 1;
            }
            plVar1 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments +
                             (long)*(int *)(local_100 + (ulong)uVar233 * 4) * 0x38);
            iVar3 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 +
                            (long)*(int *)(local_100 + (ulong)uVar233 * 4) * 0x38);
            if (iVar3 == 0x9134) {
              lVar6 = *plVar1;
              lVar149 = plVar1[2] * uVar147;
              auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar149)),
                                       ZEXT416(*(uint *)(lVar6 + 0x10 + lVar149)),0x1c);
              auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar149)),0x28);
              in_ZMM6 = ZEXT1664(auVar153);
              auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),
                                       ZEXT416(*(uint *)(lVar6 + 0x14 + lVar149)),0x1c);
              auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),0x28);
              in_ZMM9 = ZEXT1664(auVar153);
              auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),
                                       ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),0x1c);
              auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar149)),0x28);
              in_ZMM4 = ZEXT1664(auVar153);
              auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                       ZEXT416(*(uint *)(lVar6 + 0x1c + lVar149)),0x1c);
              auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar149)),0x28);
              in_ZMM10 = ZEXT1664(auVar153);
            }
            else if (iVar3 == 0x9234) {
              lVar6 = *plVar1;
              lVar149 = plVar1[2] * uVar147;
              auVar153._8_8_ = 0;
              auVar153._0_8_ = *(ulong *)(lVar6 + 4 + lVar149);
              auVar154._8_8_ = 0;
              auVar154._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar149)),_DAT_01fefe80,
                                            auVar153);
              in_ZMM6 = ZEXT1664(auVar153);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),_DAT_01fefe80,
                                            auVar154);
              in_ZMM9 = ZEXT1664(auVar153);
              auVar155._8_8_ = 0;
              auVar155._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),_DAT_01fefe80
                                            ,auVar155);
              in_ZMM4 = ZEXT1664(auVar153);
              auVar156._8_8_ = 0;
              auVar156._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar149);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),_DAT_01fefe80
                                            ,auVar156);
              in_ZMM10 = ZEXT1664(auVar153);
            }
            else if (iVar3 == 0xb001) {
              lVar6 = *plVar1;
              lVar149 = plVar1[2] * uVar147;
              auVar157._8_8_ = 0;
              auVar157._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
              auVar158 = vinsertps_avx512f(auVar157,ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),0x20);
              in_ZMM16 = ZEXT1664(auVar158);
              auVar307._8_8_ = 0;
              auVar307._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar149);
              auVar154 = vpermt2ps_avx512vl(auVar307,_DAT_01fefe90,
                                            ZEXT416(*(uint *)(lVar6 + lVar149)));
              auVar332._8_8_ = 0;
              auVar332._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
              auVar155 = vpermt2ps_avx512vl(auVar332,_DAT_01fefe90,
                                            ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)));
              fVar344 = *(float *)(lVar6 + 0x24 + lVar149);
              fVar351 = *(float *)(lVar6 + 0x28 + lVar149);
              fVar353 = *(float *)(lVar6 + 0x2c + lVar149);
              fVar355 = *(float *)(lVar6 + 0x30 + lVar149);
              auVar153 = vfmadd231ss_fma(ZEXT416((uint)(fVar351 * fVar351)),ZEXT416((uint)fVar344),
                                         ZEXT416((uint)fVar344));
              auVar153 = vfmadd231ss_fma(auVar153,ZEXT416((uint)fVar353),ZEXT416((uint)fVar353));
              auVar153 = vfmadd231ss_fma(auVar153,ZEXT416((uint)fVar355),ZEXT416((uint)fVar355));
              auVar294._4_12_ = ZEXT812(0) << 0x20;
              auVar294._0_4_ = auVar153._0_4_;
              auVar156 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar294);
              fVar357 = auVar156._0_4_;
              fVar357 = fVar357 * 1.5 + auVar153._0_4_ * -0.5 * fVar357 * fVar357 * fVar357;
              auVar153 = vinsertps_avx(auVar155,ZEXT416((uint)(fVar344 * fVar357)),0x30);
              in_ZMM10 = ZEXT1664(auVar153);
              auVar153 = vinsertps_avx(auVar154,ZEXT416((uint)(fVar351 * fVar357)),0x30);
              in_ZMM6 = ZEXT1664(auVar153);
              auVar153 = vinsertps_avx512f(auVar158,ZEXT416((uint)(fVar355 * fVar357)),0x30);
              in_ZMM4 = ZEXT1664(auVar153);
              auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                       ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),0x10);
              auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar149)),0x20);
              auVar153 = vinsertps_avx(auVar153,ZEXT416((uint)(fVar353 * fVar357)),0x30);
              in_ZMM9 = ZEXT1664(auVar153);
            }
            else if (iVar3 == 0x9244) {
              lVar6 = *plVar1;
              lVar149 = plVar1[2] * uVar147;
              in_ZMM6 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + lVar149));
              in_ZMM9 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar149));
              in_ZMM4 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar149));
              in_ZMM10 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar149));
            }
            auVar159 = vpbroadcastd_avx512vl();
            uVar17 = vpcmpeqd_avx512vl(auVar159,local_100);
            iVar3 = (int)plVar1[0xb];
            if (iVar3 == 0x9134) {
              lVar6 = plVar1[7];
              lVar149 = plVar1[9] * uVar147;
              auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar149)),
                                       ZEXT416(*(uint *)(lVar6 + 0x10 + lVar149)),0x1c);
              auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar149)),0x28);
              in_ZMM5 = ZEXT1664(auVar153);
              auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),
                                       ZEXT416(*(uint *)(lVar6 + 0x14 + lVar149)),0x1c);
              auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),0x28);
              in_ZMM7 = ZEXT1664(auVar153);
              auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),
                                       ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),0x1c);
              auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar149)),0x28);
              in_ZMM8 = ZEXT1664(auVar153);
              auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                       ZEXT416(*(uint *)(lVar6 + 0x1c + lVar149)),0x1c);
              auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar149)),0x28);
              auVar289 = ZEXT1664(auVar153);
            }
            else if (iVar3 == 0x9234) {
              lVar6 = plVar1[7];
              lVar149 = plVar1[9] * uVar147;
              auVar268._8_8_ = 0;
              auVar268._0_8_ = *(ulong *)(lVar6 + 4 + lVar149);
              auVar329._8_8_ = 0;
              auVar329._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar149)),_DAT_01fefe80,
                                            auVar268);
              in_ZMM5 = ZEXT1664(auVar153);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),_DAT_01fefe80,
                                            auVar329);
              in_ZMM7 = ZEXT1664(auVar153);
              auVar269._8_8_ = 0;
              auVar269._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),_DAT_01fefe80
                                            ,auVar269);
              in_ZMM8 = ZEXT1664(auVar153);
              auVar346._8_8_ = 0;
              auVar346._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar149);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),_DAT_01fefe80
                                            ,auVar346);
              auVar289 = ZEXT1664(auVar153);
            }
            else if (iVar3 == 0xb001) {
              lVar6 = plVar1[7];
              lVar149 = plVar1[9] * uVar147;
              auVar270._8_8_ = 0;
              auVar270._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
              auVar153 = vinsertps_avx(auVar270,ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),0x20);
              auVar302._8_8_ = 0;
              auVar302._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar149);
              auVar154 = vpermt2ps_avx512vl(auVar302,_DAT_01fefe90,
                                            ZEXT416(*(uint *)(lVar6 + lVar149)));
              auVar271._8_8_ = 0;
              auVar271._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
              auVar155 = vpermt2ps_avx512vl(auVar271,_DAT_01fefe90,
                                            ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)));
              fVar344 = *(float *)(lVar6 + 0x24 + lVar149);
              fVar351 = *(float *)(lVar6 + 0x28 + lVar149);
              fVar353 = *(float *)(lVar6 + 0x2c + lVar149);
              fVar355 = *(float *)(lVar6 + 0x30 + lVar149);
              auVar158 = vfmadd231ss_fma(ZEXT416((uint)(fVar351 * fVar351)),ZEXT416((uint)fVar344),
                                         ZEXT416((uint)fVar344));
              auVar158 = vfmadd231ss_fma(auVar158,ZEXT416((uint)fVar353),ZEXT416((uint)fVar353));
              auVar158 = vfmadd231ss_fma(auVar158,ZEXT416((uint)fVar355),ZEXT416((uint)fVar355));
              auVar159._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
              auVar187._4_28_ = auVar159._4_28_;
              auVar187._0_4_ = auVar158._0_4_;
              auVar156 = vrsqrt14ss_avx512f(auVar159._0_16_,auVar187._0_16_);
              auVar157 = vmulss_avx512f(auVar156,ZEXT416(0x3fc00000));
              in_ZMM16 = ZEXT1664(auVar157);
              fVar357 = auVar156._0_4_;
              auVar158 = vaddss_avx512f(auVar157,ZEXT416((uint)(auVar158._0_4_ * -0.5 * fVar357 *
                                                               fVar357 * fVar357)));
              fVar357 = auVar158._0_4_;
              auVar158 = vinsertps_avx(auVar155,ZEXT416((uint)(fVar344 * fVar357)),0x30);
              auVar289 = ZEXT1664(auVar158);
              auVar158 = vinsertps_avx(auVar154,ZEXT416((uint)(fVar351 * fVar357)),0x30);
              in_ZMM5 = ZEXT1664(auVar158);
              auVar153 = vinsertps_avx(auVar153,ZEXT416((uint)(fVar355 * fVar357)),0x30);
              in_ZMM8 = ZEXT1664(auVar153);
              auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                       ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),0x10);
              auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar149)),0x20);
              auVar153 = vinsertps_avx(auVar153,ZEXT416((uint)(fVar353 * fVar357)),0x30);
              in_ZMM7 = ZEXT1664(auVar153);
            }
            else if (iVar3 == 0x9244) {
              lVar6 = plVar1[7];
              lVar149 = plVar1[9] * uVar147;
              in_ZMM5 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + lVar149));
              in_ZMM7 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar149));
              in_ZMM8 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar149));
              auVar289 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar149));
            }
            bVar150 = (byte)uVar152 & (byte)uVar17;
            bVar145 = ~bVar150 & (byte)uVar152;
            uVar152 = (uint)bVar145;
            auVar159 = vbroadcastss_avx512vl(in_ZMM6._0_16_);
            auVar179._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM18._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar179._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM18._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar179._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM18._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar179._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM18._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar179._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM18._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar179._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM18._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar179._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM18._24_4_;
            auVar179._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM18._28_4_;
            in_ZMM18 = ZEXT3264(auVar179);
            auVar207._8_4_ = 1;
            auVar207._0_8_ = 0x100000001;
            auVar207._12_4_ = 1;
            auVar207._16_4_ = 1;
            auVar207._20_4_ = 1;
            auVar207._24_4_ = 1;
            auVar207._28_4_ = 1;
            auVar187 = in_ZMM6._0_32_;
            auVar159 = vpermps_avx512vl(auVar207,auVar187);
            auVar180._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM17._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar180._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM17._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar180._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM17._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar180._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM17._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar180._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM17._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar180._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM17._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar180._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM17._24_4_;
            auVar180._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM17._28_4_;
            in_ZMM17 = ZEXT3264(auVar180);
            auVar210._8_4_ = 2;
            auVar210._0_8_ = 0x200000002;
            auVar210._12_4_ = 2;
            auVar210._16_4_ = 2;
            auVar210._20_4_ = 2;
            auVar210._24_4_ = 2;
            auVar210._28_4_ = 2;
            auVar159 = vpermps_avx512vl(auVar210,auVar187);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            local_120._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * local_120._4_4_;
            local_120._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * local_120._0_4_
            ;
            local_120._8_4_ = (uint)bVar8 * auVar159._8_4_ | (uint)!bVar8 * local_120._8_4_;
            local_120._12_4_ = (uint)bVar9 * auVar159._12_4_ | (uint)!bVar9 * local_120._12_4_;
            local_120._16_4_ = (uint)bVar10 * auVar159._16_4_ | (uint)!bVar10 * local_120._16_4_;
            local_120._20_4_ = (uint)bVar11 * auVar159._20_4_ | (uint)!bVar11 * local_120._20_4_;
            local_120._24_4_ = (uint)bVar12 * auVar159._24_4_ | (uint)!bVar12 * local_120._24_4_;
            local_120._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * local_120._28_4_;
            auVar211._8_4_ = 3;
            auVar211._0_8_ = 0x300000003;
            auVar211._12_4_ = 3;
            auVar211._16_4_ = 3;
            auVar211._20_4_ = 3;
            auVar211._24_4_ = 3;
            auVar211._28_4_ = 3;
            auVar159 = vpermps_avx512vl(auVar211,auVar187);
            auVar160._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM27._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar160._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM27._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar160._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM27._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar160._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM27._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar160._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM27._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar160._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM27._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar160._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM27._24_4_;
            auVar160._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM27._28_4_;
            in_ZMM27 = ZEXT3264(auVar160);
            auVar159 = vbroadcastss_avx512vl(in_ZMM9._0_16_);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            local_1c0._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * local_1c0._4_4_;
            local_1c0._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * local_1c0._0_4_
            ;
            local_1c0._8_4_ = (uint)bVar8 * auVar159._8_4_ | (uint)!bVar8 * local_1c0._8_4_;
            local_1c0._12_4_ = (uint)bVar9 * auVar159._12_4_ | (uint)!bVar9 * local_1c0._12_4_;
            local_1c0._16_4_ = (uint)bVar10 * auVar159._16_4_ | (uint)!bVar10 * local_1c0._16_4_;
            local_1c0._20_4_ = (uint)bVar11 * auVar159._20_4_ | (uint)!bVar11 * local_1c0._20_4_;
            local_1c0._24_4_ = (uint)bVar12 * auVar159._24_4_ | (uint)!bVar12 * local_1c0._24_4_;
            local_1c0._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * local_1c0._28_4_;
            auVar187 = in_ZMM9._0_32_;
            auVar159 = vpermps_avx512vl(auVar207,auVar187);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            local_220._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * local_220._4_4_;
            local_220._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * local_220._0_4_
            ;
            local_220._8_4_ = (uint)bVar8 * auVar159._8_4_ | (uint)!bVar8 * local_220._8_4_;
            local_220._12_4_ = (uint)bVar9 * auVar159._12_4_ | (uint)!bVar9 * local_220._12_4_;
            local_220._16_4_ = (uint)bVar10 * auVar159._16_4_ | (uint)!bVar10 * local_220._16_4_;
            local_220._20_4_ = (uint)bVar11 * auVar159._20_4_ | (uint)!bVar11 * local_220._20_4_;
            local_220._24_4_ = (uint)bVar12 * auVar159._24_4_ | (uint)!bVar12 * local_220._24_4_;
            local_220._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * local_220._28_4_;
            auVar159 = vpermps_avx512vl(auVar210,auVar187);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            local_1a0._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * local_1a0._4_4_;
            local_1a0._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * local_1a0._0_4_
            ;
            local_1a0._8_4_ = (uint)bVar8 * auVar159._8_4_ | (uint)!bVar8 * local_1a0._8_4_;
            local_1a0._12_4_ = (uint)bVar9 * auVar159._12_4_ | (uint)!bVar9 * local_1a0._12_4_;
            local_1a0._16_4_ = (uint)bVar10 * auVar159._16_4_ | (uint)!bVar10 * local_1a0._16_4_;
            local_1a0._20_4_ = (uint)bVar11 * auVar159._20_4_ | (uint)!bVar11 * local_1a0._20_4_;
            local_1a0._24_4_ = (uint)bVar12 * auVar159._24_4_ | (uint)!bVar12 * local_1a0._24_4_;
            local_1a0._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * local_1a0._28_4_;
            auVar159 = vpermps_avx512vl(auVar211,auVar187);
            auVar182._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM24._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar182._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM24._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar182._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM24._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar182._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM24._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar182._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM24._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar182._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM24._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar182._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM24._24_4_;
            auVar182._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM24._28_4_;
            in_ZMM24 = ZEXT3264(auVar182);
            auVar159 = vbroadcastss_avx512vl(in_ZMM4._0_16_);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            local_260._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * local_260._4_4_;
            local_260._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * local_260._0_4_
            ;
            local_260._8_4_ = (uint)bVar8 * auVar159._8_4_ | (uint)!bVar8 * local_260._8_4_;
            local_260._12_4_ = (uint)bVar9 * auVar159._12_4_ | (uint)!bVar9 * local_260._12_4_;
            local_260._16_4_ = (uint)bVar10 * auVar159._16_4_ | (uint)!bVar10 * local_260._16_4_;
            local_260._20_4_ = (uint)bVar11 * auVar159._20_4_ | (uint)!bVar11 * local_260._20_4_;
            local_260._24_4_ = (uint)bVar12 * auVar159._24_4_ | (uint)!bVar12 * local_260._24_4_;
            local_260._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * local_260._28_4_;
            auVar187 = in_ZMM4._0_32_;
            auVar159 = vpermps_avx512vl(auVar207,auVar187);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            local_1e0._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * local_1e0._4_4_;
            local_1e0._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * local_1e0._0_4_
            ;
            local_1e0._8_4_ = (uint)bVar8 * auVar159._8_4_ | (uint)!bVar8 * local_1e0._8_4_;
            local_1e0._12_4_ = (uint)bVar9 * auVar159._12_4_ | (uint)!bVar9 * local_1e0._12_4_;
            local_1e0._16_4_ = (uint)bVar10 * auVar159._16_4_ | (uint)!bVar10 * local_1e0._16_4_;
            local_1e0._20_4_ = (uint)bVar11 * auVar159._20_4_ | (uint)!bVar11 * local_1e0._20_4_;
            local_1e0._24_4_ = (uint)bVar12 * auVar159._24_4_ | (uint)!bVar12 * local_1e0._24_4_;
            local_1e0._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * local_1e0._28_4_;
            auVar159 = vpermps_avx512vl(auVar210,auVar187);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            local_180._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * local_180._4_4_;
            local_180._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * local_180._0_4_
            ;
            local_180._8_4_ = (uint)bVar8 * auVar159._8_4_ | (uint)!bVar8 * local_180._8_4_;
            local_180._12_4_ = (uint)bVar9 * auVar159._12_4_ | (uint)!bVar9 * local_180._12_4_;
            local_180._16_4_ = (uint)bVar10 * auVar159._16_4_ | (uint)!bVar10 * local_180._16_4_;
            local_180._20_4_ = (uint)bVar11 * auVar159._20_4_ | (uint)!bVar11 * local_180._20_4_;
            local_180._24_4_ = (uint)bVar12 * auVar159._24_4_ | (uint)!bVar12 * local_180._24_4_;
            local_180._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * local_180._28_4_;
            auVar159 = vpermps_avx512vl(auVar211,auVar187);
            auVar183._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM22._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar183._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM22._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar183._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM22._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar183._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM22._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar183._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM22._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar183._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM22._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar183._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM22._24_4_;
            auVar183._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM22._28_4_;
            in_ZMM22 = ZEXT3264(auVar183);
            auVar159 = vbroadcastss_avx512vl(in_ZMM10._0_16_);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            local_240._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * local_240._4_4_;
            local_240._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * local_240._0_4_
            ;
            uStack_238._0_4_ = (uint)bVar8 * auVar159._8_4_ | (uint)!bVar8 * (int)uStack_238;
            uStack_238._4_4_ = (uint)bVar9 * auVar159._12_4_ | (uint)!bVar9 * uStack_238._4_4_;
            uStack_230._0_4_ = (uint)bVar10 * auVar159._16_4_ | (uint)!bVar10 * (int)uStack_230;
            uStack_230._4_4_ = (uint)bVar11 * auVar159._20_4_ | (uint)!bVar11 * uStack_230._4_4_;
            uStack_228._0_4_ = (uint)bVar12 * auVar159._24_4_ | (uint)!bVar12 * (int)uStack_228;
            uStack_228._4_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * uStack_228._4_4_;
            auVar187 = in_ZMM10._0_32_;
            auVar159 = vpermps_avx512vl(auVar207,auVar187);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            local_200._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * local_200._4_4_;
            local_200._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * local_200._0_4_
            ;
            uStack_1f8._0_4_ = (uint)bVar8 * auVar159._8_4_ | (uint)!bVar8 * (int)uStack_1f8;
            uStack_1f8._4_4_ = (uint)bVar9 * auVar159._12_4_ | (uint)!bVar9 * uStack_1f8._4_4_;
            uStack_1f0._0_4_ = (uint)bVar10 * auVar159._16_4_ | (uint)!bVar10 * (int)uStack_1f0;
            uStack_1f0._4_4_ = (uint)bVar11 * auVar159._20_4_ | (uint)!bVar11 * uStack_1f0._4_4_;
            uStack_1e8._0_4_ = (uint)bVar12 * auVar159._24_4_ | (uint)!bVar12 * (int)uStack_1e8;
            uStack_1e8._4_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * uStack_1e8._4_4_;
            auVar159 = vpermps_avx512vl(auVar210,auVar187);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            local_280._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * local_280._4_4_;
            local_280._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * local_280._0_4_
            ;
            local_280._8_4_ = (uint)bVar8 * auVar159._8_4_ | (uint)!bVar8 * local_280._8_4_;
            local_280._12_4_ = (uint)bVar9 * auVar159._12_4_ | (uint)!bVar9 * local_280._12_4_;
            local_280._16_4_ = (uint)bVar10 * auVar159._16_4_ | (uint)!bVar10 * local_280._16_4_;
            local_280._20_4_ = (uint)bVar11 * auVar159._20_4_ | (uint)!bVar11 * local_280._20_4_;
            local_280._24_4_ = (uint)bVar12 * auVar159._24_4_ | (uint)!bVar12 * local_280._24_4_;
            local_280._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * local_280._28_4_;
            auVar159 = vpermps_avx512vl(auVar211,auVar187);
            auVar185._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM23._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar185._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM23._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar185._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM23._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar185._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM23._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar185._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM23._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar185._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM23._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar185._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM23._24_4_;
            auVar185._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM23._28_4_;
            in_ZMM23 = ZEXT3264(auVar185);
            auVar159 = vbroadcastss_avx512vl(in_ZMM5._0_16_);
            auVar186._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM29._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar186._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM29._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar186._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM29._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar186._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM29._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar186._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM29._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar186._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM29._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar186._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM29._24_4_;
            auVar186._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM29._28_4_;
            in_ZMM29 = ZEXT3264(auVar186);
            auVar187 = in_ZMM5._0_32_;
            auVar159 = vpermps_avx512vl(auVar207,auVar187);
            auVar188._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM26._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar188._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM26._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar188._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM26._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar188._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM26._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar188._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM26._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar188._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM26._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar188._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM26._24_4_;
            auVar188._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM26._28_4_;
            in_ZMM26 = ZEXT3264(auVar188);
            auVar159 = vpermps_avx512vl(auVar210,auVar187);
            auVar189._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM25._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar189._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM25._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar189._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM25._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar189._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM25._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar189._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM25._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar189._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM25._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar189._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM25._24_4_;
            auVar189._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM25._28_4_;
            in_ZMM25 = ZEXT3264(auVar189);
            auVar159 = vpermps_avx512vl(auVar211,auVar187);
            auVar190._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * auVar282._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar190._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * auVar282._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar190._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * auVar282._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar190._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * auVar282._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar190._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * auVar282._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar190._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * auVar282._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar190._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * auVar282._24_4_;
            auVar190._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * auVar282._28_4_;
            auVar282 = ZEXT3264(auVar190);
            auVar159 = vbroadcastss_avx512vl(in_ZMM7._0_16_);
            auVar201._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM21._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar201._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM21._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar201._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM21._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar201._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM21._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar201._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM21._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar201._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM21._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar201._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM21._24_4_;
            auVar201._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM21._28_4_;
            in_ZMM21 = ZEXT3264(auVar201);
            auVar187 = in_ZMM7._0_32_;
            auVar159 = vpermps_avx512vl(auVar207,auVar187);
            auVar208._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM20._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar208._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM20._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar208._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM20._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar208._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM20._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar208._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM20._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar208._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM20._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar208._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM20._24_4_;
            auVar208._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM20._28_4_;
            in_ZMM20 = ZEXT3264(auVar208);
            auVar159 = vpermps_avx512vl(auVar210,auVar187);
            auVar209._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM19._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar209._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM19._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar209._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM19._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar209._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM19._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar209._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM19._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar209._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM19._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar209._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM19._24_4_;
            auVar209._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM19._28_4_;
            in_ZMM19 = ZEXT3264(auVar209);
            auVar159 = vpermps_avx512vl(auVar211,auVar187);
            auVar204._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM31._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar204._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM31._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar204._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM31._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar204._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM31._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar204._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM31._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar204._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM31._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar204._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM31._24_4_;
            auVar204._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM31._28_4_;
            in_ZMM31 = ZEXT3264(auVar204);
            auVar159 = vbroadcastss_avx512vl(in_ZMM8._0_16_);
            local_e0 = (float)((uint)(bVar150 & 1) * auVar159._0_4_ |
                              (uint)!(bool)(bVar150 & 1) * (int)local_e0);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            fStack_dc = (float)((uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * (int)fStack_dc);
            bVar7 = (bool)(bVar150 >> 2 & 1);
            fStack_d8 = (float)((uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * (int)fStack_d8);
            bVar7 = (bool)(bVar150 >> 3 & 1);
            fStack_d4 = (float)((uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * (int)fStack_d4);
            bVar7 = (bool)(bVar150 >> 4 & 1);
            fStack_d0 = (float)((uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * (int)fStack_d0);
            bVar7 = (bool)(bVar150 >> 5 & 1);
            fStack_cc = (float)((uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * (int)fStack_cc);
            bVar7 = (bool)(bVar150 >> 6 & 1);
            fStack_c8 = (float)((uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * (int)fStack_c8);
            uStack_c4 = (uint)(bVar150 >> 7) * auVar159._28_4_ | !(bool)(bVar150 >> 7) * uStack_c4;
            auVar187 = in_ZMM8._0_32_;
            auVar159 = vpermps_avx512vl(auVar207,auVar187);
            local_c0 = (float)((uint)(bVar150 & 1) * auVar159._0_4_ |
                              (uint)!(bool)(bVar150 & 1) * (int)local_c0);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            fStack_bc = (float)((uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * (int)fStack_bc);
            bVar7 = (bool)(bVar150 >> 2 & 1);
            fStack_b8 = (float)((uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * (int)fStack_b8);
            bVar7 = (bool)(bVar150 >> 3 & 1);
            fStack_b4 = (float)((uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * (int)fStack_b4);
            bVar7 = (bool)(bVar150 >> 4 & 1);
            fStack_b0 = (float)((uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * (int)fStack_b0);
            bVar7 = (bool)(bVar150 >> 5 & 1);
            fStack_ac = (float)((uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * (int)fStack_ac);
            bVar7 = (bool)(bVar150 >> 6 & 1);
            fStack_a8 = (float)((uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * (int)fStack_a8);
            uStack_a4 = (uint)(bVar150 >> 7) * auVar159._28_4_ | !(bool)(bVar150 >> 7) * uStack_a4;
            auVar159 = vpermps_avx512vl(auVar210,auVar187);
            local_a0 = (float)((uint)(bVar150 & 1) * auVar159._0_4_ |
                              (uint)!(bool)(bVar150 & 1) * (int)local_a0);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            fStack_9c = (float)((uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * (int)fStack_9c);
            bVar7 = (bool)(bVar150 >> 2 & 1);
            fStack_98 = (float)((uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * (int)fStack_98);
            bVar7 = (bool)(bVar150 >> 3 & 1);
            fStack_94 = (float)((uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * (int)fStack_94);
            bVar7 = (bool)(bVar150 >> 4 & 1);
            fStack_90 = (float)((uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * (int)fStack_90);
            bVar7 = (bool)(bVar150 >> 5 & 1);
            fStack_8c = (float)((uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * (int)fStack_8c);
            bVar7 = (bool)(bVar150 >> 6 & 1);
            fStack_88 = (float)((uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * (int)fStack_88);
            uStack_84 = (uint)(bVar150 >> 7) * auVar159._28_4_ | !(bool)(bVar150 >> 7) * uStack_84;
            auVar159 = vpermps_avx512vl(auVar211,auVar187);
            auVar205._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM28._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar205._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM28._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar205._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM28._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar205._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM28._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar205._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM28._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar205._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM28._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar205._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM28._24_4_;
            auVar205._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM28._28_4_;
            in_ZMM28 = ZEXT3264(auVar205);
            auVar159 = vbroadcastss_avx512vl(auVar289._0_16_);
            local_80 = (float)((uint)(bVar150 & 1) * auVar159._0_4_ |
                              (uint)!(bool)(bVar150 & 1) * (int)local_80);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            fStack_7c = (float)((uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * (int)fStack_7c);
            bVar7 = (bool)(bVar150 >> 2 & 1);
            fStack_78 = (float)((uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * (int)fStack_78);
            bVar7 = (bool)(bVar150 >> 3 & 1);
            fStack_74 = (float)((uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * (int)fStack_74);
            bVar7 = (bool)(bVar150 >> 4 & 1);
            fStack_70 = (float)((uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * (int)fStack_70);
            bVar7 = (bool)(bVar150 >> 5 & 1);
            fStack_6c = (float)((uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * (int)fStack_6c);
            bVar7 = (bool)(bVar150 >> 6 & 1);
            fStack_68 = (float)((uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * (int)fStack_68);
            uStack_64 = (uint)(bVar150 >> 7) * auVar159._28_4_ | !(bool)(bVar150 >> 7) * uStack_64;
            auVar187 = auVar289._0_32_;
            auVar159 = vpermps_avx512vl(auVar207,auVar187);
            local_60 = (float)((uint)(bVar150 & 1) * auVar159._0_4_ |
                              (uint)!(bool)(bVar150 & 1) * (int)local_60);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            fStack_5c = (float)((uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * (int)fStack_5c);
            bVar7 = (bool)(bVar150 >> 2 & 1);
            fStack_58 = (float)((uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * (int)fStack_58);
            bVar7 = (bool)(bVar150 >> 3 & 1);
            fStack_54 = (float)((uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * (int)fStack_54);
            bVar7 = (bool)(bVar150 >> 4 & 1);
            fStack_50 = (float)((uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * (int)fStack_50);
            bVar7 = (bool)(bVar150 >> 5 & 1);
            fStack_4c = (float)((uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * (int)fStack_4c);
            bVar7 = (bool)(bVar150 >> 6 & 1);
            fStack_48 = (float)((uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * (int)fStack_48);
            uStack_44 = (uint)(bVar150 >> 7) * auVar159._28_4_ | !(bool)(bVar150 >> 7) * uStack_44;
            auVar159 = vpermps_avx512vl(auVar210,auVar187);
            local_140 = (float)((uint)(bVar150 & 1) * auVar159._0_4_ |
                               (uint)!(bool)(bVar150 & 1) * (int)local_140);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            fStack_13c = (float)((uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * (int)fStack_13c);
            bVar7 = (bool)(bVar150 >> 2 & 1);
            fStack_138 = (float)((uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * (int)fStack_138);
            bVar7 = (bool)(bVar150 >> 3 & 1);
            fStack_134 = (float)((uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * (int)fStack_134);
            bVar7 = (bool)(bVar150 >> 4 & 1);
            fStack_130 = (float)((uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * (int)fStack_130);
            bVar7 = (bool)(bVar150 >> 5 & 1);
            fStack_12c = (float)((uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * (int)fStack_12c);
            bVar7 = (bool)(bVar150 >> 6 & 1);
            fStack_128 = (float)((uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * (int)fStack_128);
            fStack_124 = (float)((uint)(bVar150 >> 7) * auVar159._28_4_ |
                                (uint)!(bool)(bVar150 >> 7) * (int)fStack_124);
            auVar159 = vpermps_avx512vl(auVar211,auVar187);
            auVar206._0_4_ =
                 (uint)(bVar150 & 1) * auVar159._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM30._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar206._4_4_ = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * in_ZMM30._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar206._8_4_ = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * in_ZMM30._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar206._12_4_ = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * in_ZMM30._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar206._16_4_ = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * in_ZMM30._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar206._20_4_ = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * in_ZMM30._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar206._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * in_ZMM30._24_4_;
            auVar206._28_4_ =
                 (uint)(bVar150 >> 7) * auVar159._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM30._28_4_;
            in_ZMM30 = ZEXT3264(auVar206);
          } while (bVar145 != 0);
          auVar159 = vmulps_avx512vl(auVar206,auVar185);
          auVar187 = vmulps_avx512vl(auVar190,auVar160);
          auVar176 = vmulps_avx512vl(auVar204,auVar182);
          auVar178 = vmulps_avx512vl(auVar205,auVar183);
          fVar344 = auVar178._0_4_;
          auVar273._0_4_ = fVar344 + auVar176._0_4_ + auVar187._0_4_ + auVar159._0_4_;
          fVar351 = auVar178._4_4_;
          auVar273._4_4_ = fVar351 + auVar176._4_4_ + auVar187._4_4_ + auVar159._4_4_;
          fVar353 = auVar178._8_4_;
          auVar273._8_4_ = fVar353 + auVar176._8_4_ + auVar187._8_4_ + auVar159._8_4_;
          fVar355 = auVar178._12_4_;
          auVar273._12_4_ = fVar355 + auVar176._12_4_ + auVar187._12_4_ + auVar159._12_4_;
          fVar357 = auVar178._16_4_;
          auVar273._16_4_ = fVar357 + auVar176._16_4_ + auVar187._16_4_ + auVar159._16_4_;
          fVar358 = auVar178._20_4_;
          auVar273._20_4_ = fVar358 + auVar176._20_4_ + auVar187._20_4_ + auVar159._20_4_;
          fVar359 = auVar178._24_4_;
          auVar273._24_4_ = fVar359 + auVar176._24_4_ + auVar187._24_4_ + auVar159._24_4_;
          auVar273._28_4_ = auVar178._28_4_ + auVar176._28_4_ + auVar187._28_4_ + auVar159._28_4_;
          auVar303._8_4_ = 0x80000000;
          auVar303._0_8_ = 0x8000000080000000;
          auVar303._12_4_ = 0x80000000;
          auVar303._16_4_ = 0x80000000;
          auVar303._20_4_ = 0x80000000;
          auVar303._24_4_ = 0x80000000;
          auVar303._28_4_ = 0x80000000;
          uVar147 = CONCAT44(auVar273._4_4_,auVar273._0_4_);
          auVar286._0_8_ = uVar147 ^ 0x8000000080000000;
          auVar286._8_4_ = -auVar273._8_4_;
          auVar286._12_4_ = -auVar273._12_4_;
          auVar286._16_4_ = -auVar273._16_4_;
          auVar286._20_4_ = -auVar273._20_4_;
          auVar286._24_4_ = -auVar273._24_4_;
          auVar286._28_4_ = -auVar273._28_4_;
          uVar147 = vcmpps_avx512vl(auVar273,auVar286,1);
          auVar212._8_4_ = 0x7fffffff;
          auVar212._0_8_ = 0x7fffffff7fffffff;
          auVar212._12_4_ = 0x7fffffff;
          auVar212._16_4_ = 0x7fffffff;
          auVar212._20_4_ = 0x7fffffff;
          auVar212._24_4_ = 0x7fffffff;
          auVar212._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar273,auVar212);
          auVar37._8_4_ = 0xbb8d3753;
          auVar37._0_8_ = 0xbb8d3753bb8d3753;
          auVar37._12_4_ = 0xbb8d3753;
          auVar37._16_4_ = 0xbb8d3753;
          auVar37._20_4_ = 0xbb8d3753;
          auVar37._24_4_ = 0xbb8d3753;
          auVar37._28_4_ = 0xbb8d3753;
          auVar159 = vmulps_avx512vl(auVar178,auVar37);
          auVar38._8_4_ = 0x3c9df1b8;
          auVar38._0_8_ = 0x3c9df1b83c9df1b8;
          auVar38._12_4_ = 0x3c9df1b8;
          auVar38._16_4_ = 0x3c9df1b8;
          auVar38._20_4_ = 0x3c9df1b8;
          auVar38._24_4_ = 0x3c9df1b8;
          auVar38._28_4_ = 0x3c9df1b8;
          auVar159 = vaddps_avx512vl(auVar159,auVar38);
          auVar100._4_4_ = fVar351 * auVar159._4_4_;
          auVar100._0_4_ = fVar344 * auVar159._0_4_;
          auVar100._8_4_ = fVar353 * auVar159._8_4_;
          auVar100._12_4_ = fVar355 * auVar159._12_4_;
          auVar100._16_4_ = fVar357 * auVar159._16_4_;
          auVar100._20_4_ = fVar358 * auVar159._20_4_;
          auVar100._24_4_ = fVar359 * auVar159._24_4_;
          auVar100._28_4_ = auVar159._28_4_;
          auVar39._8_4_ = 0xbd37e81c;
          auVar39._0_8_ = 0xbd37e81cbd37e81c;
          auVar39._12_4_ = 0xbd37e81c;
          auVar39._16_4_ = 0xbd37e81c;
          auVar39._20_4_ = 0xbd37e81c;
          auVar39._24_4_ = 0xbd37e81c;
          auVar39._28_4_ = 0xbd37e81c;
          auVar159 = vaddps_avx512vl(auVar100,auVar39);
          auVar101._4_4_ = fVar351 * auVar159._4_4_;
          auVar101._0_4_ = fVar344 * auVar159._0_4_;
          auVar101._8_4_ = fVar353 * auVar159._8_4_;
          auVar101._12_4_ = fVar355 * auVar159._12_4_;
          auVar101._16_4_ = fVar357 * auVar159._16_4_;
          auVar101._20_4_ = fVar358 * auVar159._20_4_;
          auVar101._24_4_ = fVar359 * auVar159._24_4_;
          auVar101._28_4_ = auVar159._28_4_;
          auVar40._8_4_ = 0x3db3edac;
          auVar40._0_8_ = 0x3db3edac3db3edac;
          auVar40._12_4_ = 0x3db3edac;
          auVar40._16_4_ = 0x3db3edac;
          auVar40._20_4_ = 0x3db3edac;
          auVar40._24_4_ = 0x3db3edac;
          auVar40._28_4_ = 0x3db3edac;
          auVar159 = vaddps_avx512vl(auVar101,auVar40);
          auVar187 = vmaxps_avx(auVar286,auVar273);
          auVar102._4_4_ = fVar351 * auVar159._4_4_;
          auVar102._0_4_ = fVar344 * auVar159._0_4_;
          auVar102._8_4_ = fVar353 * auVar159._8_4_;
          auVar102._12_4_ = fVar355 * auVar159._12_4_;
          auVar102._16_4_ = fVar357 * auVar159._16_4_;
          auVar102._20_4_ = fVar358 * auVar159._20_4_;
          auVar102._24_4_ = fVar359 * auVar159._24_4_;
          auVar102._28_4_ = auVar273._28_4_;
          auVar41._8_4_ = 0xbe5ba881;
          auVar41._0_8_ = 0xbe5ba881be5ba881;
          auVar41._12_4_ = 0xbe5ba881;
          auVar41._16_4_ = 0xbe5ba881;
          auVar41._20_4_ = 0xbe5ba881;
          auVar41._24_4_ = 0xbe5ba881;
          auVar41._28_4_ = 0xbe5ba881;
          auVar159 = vaddps_avx512vl(auVar102,auVar41);
          auVar287._8_4_ = 0x3f800000;
          auVar287._0_8_ = 0x3f8000003f800000;
          auVar287._12_4_ = 0x3f800000;
          auVar287._16_4_ = 0x3f800000;
          auVar287._20_4_ = 0x3f800000;
          auVar287._24_4_ = 0x3f800000;
          auVar287._28_4_ = 0x3f800000;
          uVar15 = vcmpps_avx512vl(auVar178,auVar287,6);
          auVar103._4_4_ = fVar351 * auVar159._4_4_;
          auVar103._0_4_ = fVar344 * auVar159._0_4_;
          auVar103._8_4_ = fVar353 * auVar159._8_4_;
          auVar103._12_4_ = fVar355 * auVar159._12_4_;
          auVar103._16_4_ = fVar357 * auVar159._16_4_;
          auVar103._20_4_ = fVar358 * auVar159._20_4_;
          auVar103._24_4_ = fVar359 * auVar159._24_4_;
          auVar103._28_4_ = auVar159._28_4_;
          auVar42._8_4_ = 0x3fc90fd1;
          auVar42._0_8_ = 0x3fc90fd13fc90fd1;
          auVar42._12_4_ = 0x3fc90fd1;
          auVar42._16_4_ = 0x3fc90fd1;
          auVar42._20_4_ = 0x3fc90fd1;
          auVar42._24_4_ = 0x3fc90fd1;
          auVar42._28_4_ = 0x3fc90fd1;
          auVar176 = vaddps_avx512vl(auVar103,auVar42);
          auVar159 = vsubps_avx(auVar287,auVar178);
          auVar159 = vsqrtps_avx(auVar159);
          auVar104._4_4_ = auVar159._4_4_ * auVar176._4_4_;
          auVar104._0_4_ = auVar159._0_4_ * auVar176._0_4_;
          auVar104._8_4_ = auVar159._8_4_ * auVar176._8_4_;
          auVar104._12_4_ = auVar159._12_4_ * auVar176._12_4_;
          auVar104._16_4_ = auVar159._16_4_ * auVar176._16_4_;
          auVar104._20_4_ = auVar159._20_4_ * auVar176._20_4_;
          auVar104._24_4_ = auVar159._24_4_ * auVar176._24_4_;
          auVar104._28_4_ = auVar159._28_4_;
          uVar16 = vcmpps_avx512vl(auVar187,ZEXT832(0) << 0x20,1);
          auVar314._8_4_ = 0x3fc90fdb;
          auVar314._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar314._12_4_ = 0x3fc90fdb;
          auVar314._16_4_ = 0x3fc90fdb;
          auVar314._20_4_ = 0x3fc90fdb;
          auVar314._24_4_ = 0x3fc90fdb;
          auVar314._28_4_ = 0x3fc90fdb;
          auVar159 = vsubps_avx(auVar314,auVar104);
          auVar159 = vmaxps_avx(ZEXT832(0) << 0x20,auVar159);
          auVar176 = vxorps_avx512vl(auVar159,auVar303);
          bVar7 = (bool)((byte)uVar16 & 1);
          auVar226._0_4_ = (uint)bVar7 * auVar176._0_4_ | (uint)!bVar7 * auVar159._0_4_;
          bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar226._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * auVar159._4_4_;
          bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar226._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * auVar159._8_4_;
          bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar226._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * auVar159._12_4_;
          bVar7 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar226._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * auVar159._16_4_;
          bVar7 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar226._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * auVar159._20_4_;
          bVar7 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar226._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * auVar159._24_4_;
          bVar7 = SUB81(uVar16 >> 7,0);
          auVar226._28_4_ = (uint)bVar7 * auVar176._28_4_ | (uint)!bVar7 * auVar159._28_4_;
          auVar159 = vsubps_avx(auVar314,auVar226);
          auVar176 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
          bVar7 = (bool)((byte)uVar15 & 1);
          bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar15 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar15 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar15 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
          bVar14 = SUB81(uVar15 >> 7,0);
          auVar105._4_4_ =
               fVar257 * (float)((uint)bVar8 * auVar176._4_4_ | (uint)!bVar8 * auVar159._4_4_);
          auVar105._0_4_ =
               fVar249 * (float)((uint)bVar7 * auVar176._0_4_ | (uint)!bVar7 * auVar159._0_4_);
          auVar105._8_4_ =
               fVar258 * (float)((uint)bVar9 * auVar176._8_4_ | (uint)!bVar9 * auVar159._8_4_);
          auVar105._12_4_ =
               fVar259 * (float)((uint)bVar10 * auVar176._12_4_ | (uint)!bVar10 * auVar159._12_4_);
          auVar105._16_4_ =
               fVar260 * (float)((uint)bVar11 * auVar176._16_4_ | (uint)!bVar11 * auVar159._16_4_);
          auVar105._20_4_ =
               fVar261 * (float)((uint)bVar12 * auVar176._20_4_ | (uint)!bVar12 * auVar159._20_4_);
          auVar105._24_4_ =
               fVar262 * (float)((uint)bVar13 * auVar176._24_4_ | (uint)!bVar13 * auVar159._24_4_);
          auVar105._28_4_ = (uint)bVar14 * auVar176._28_4_ | (uint)!bVar14 * auVar159._28_4_;
          auVar43._8_4_ = 0x3f22f983;
          auVar43._0_8_ = 0x3f22f9833f22f983;
          auVar43._12_4_ = 0x3f22f983;
          auVar43._16_4_ = 0x3f22f983;
          auVar43._20_4_ = 0x3f22f983;
          auVar43._24_4_ = 0x3f22f983;
          auVar43._28_4_ = 0x3f22f983;
          auVar159 = vmulps_avx512vl(auVar105,auVar43);
          auVar159 = vroundps_avx(auVar159,1);
          auVar106._4_4_ = auVar159._4_4_ * 1.5707964;
          auVar106._0_4_ = auVar159._0_4_ * 1.5707964;
          auVar106._8_4_ = auVar159._8_4_ * 1.5707964;
          auVar106._12_4_ = auVar159._12_4_ * 1.5707964;
          auVar106._16_4_ = auVar159._16_4_ * 1.5707964;
          auVar106._20_4_ = auVar159._20_4_ * 1.5707964;
          auVar106._24_4_ = auVar159._24_4_ * 1.5707964;
          auVar106._28_4_ = 0x3fc90fdb;
          auVar176 = vsubps_avx(auVar105,auVar106);
          auVar159 = vcvtps2dq_avx(auVar159);
          auVar178 = vpslld_avx2(auVar159,0x1f);
          uVar151 = vpmovd2m_avx512vl(auVar178);
          auVar330._8_4_ = 1;
          auVar330._0_8_ = 0x100000001;
          auVar330._12_4_ = 1;
          auVar330._16_4_ = 1;
          auVar330._20_4_ = 1;
          auVar330._24_4_ = 1;
          auVar330._28_4_ = 1;
          uVar18 = vptestnmd_avx512vl(auVar159,auVar330);
          auVar44._8_4_ = 3;
          auVar44._0_8_ = 0x300000003;
          auVar44._12_4_ = 3;
          auVar44._16_4_ = 3;
          auVar44._20_4_ = 3;
          auVar44._24_4_ = 3;
          auVar44._28_4_ = 3;
          auVar178 = vpandd_avx512vl(auVar159,auVar44);
          uVar15 = vpcmpgtd_avx512vl(auVar178,auVar330);
          auVar159 = vpcmpeqd_avx2(auVar330,auVar330);
          auVar159 = vpaddd_avx2(auVar159,auVar178);
          auVar45._8_4_ = 2;
          auVar45._0_8_ = 0x200000002;
          auVar45._12_4_ = 2;
          auVar45._16_4_ = 2;
          auVar45._20_4_ = 2;
          auVar45._24_4_ = 2;
          auVar45._28_4_ = 2;
          uVar16 = vpcmpud_avx512vl(auVar159,auVar45,1);
          fVar344 = auVar176._0_4_;
          fVar311 = fVar344 * fVar344;
          fVar351 = auVar176._4_4_;
          fVar316 = fVar351 * fVar351;
          auVar107._4_4_ = fVar316;
          auVar107._0_4_ = fVar311;
          fVar353 = auVar176._8_4_;
          fVar318 = fVar353 * fVar353;
          auVar107._8_4_ = fVar318;
          fVar355 = auVar176._12_4_;
          fVar320 = fVar355 * fVar355;
          auVar107._12_4_ = fVar320;
          fVar357 = auVar176._16_4_;
          fVar322 = fVar357 * fVar357;
          auVar107._16_4_ = fVar322;
          fVar358 = auVar176._20_4_;
          fVar324 = fVar358 * fVar358;
          auVar107._20_4_ = fVar324;
          fVar359 = auVar176._24_4_;
          fVar328 = auVar159._28_4_;
          fVar326 = fVar359 * fVar359;
          auVar107._24_4_ = fVar326;
          auVar107._28_4_ = fVar328;
          auVar46._8_4_ = 0xb2d70013;
          auVar46._0_8_ = 0xb2d70013b2d70013;
          auVar46._12_4_ = 0xb2d70013;
          auVar46._16_4_ = 0xb2d70013;
          auVar46._20_4_ = 0xb2d70013;
          auVar46._24_4_ = 0xb2d70013;
          auVar46._28_4_ = 0xb2d70013;
          auVar159 = vmulps_avx512vl(auVar107,auVar46);
          auVar47._8_4_ = 0x363938a8;
          auVar47._0_8_ = 0x363938a8363938a8;
          auVar47._12_4_ = 0x363938a8;
          auVar47._16_4_ = 0x363938a8;
          auVar47._20_4_ = 0x363938a8;
          auVar47._24_4_ = 0x363938a8;
          auVar47._28_4_ = 0x363938a8;
          auVar159 = vaddps_avx512vl(auVar159,auVar47);
          auVar48._8_4_ = 0xb48b634d;
          auVar48._0_8_ = 0xb48b634db48b634d;
          auVar48._12_4_ = 0xb48b634d;
          auVar48._16_4_ = 0xb48b634d;
          auVar48._20_4_ = 0xb48b634d;
          auVar48._24_4_ = 0xb48b634d;
          auVar48._28_4_ = 0xb48b634d;
          auVar176 = vmulps_avx512vl(auVar107,auVar48);
          auVar49._8_4_ = 0x37cfab9c;
          auVar49._0_8_ = 0x37cfab9c37cfab9c;
          auVar49._12_4_ = 0x37cfab9c;
          auVar49._16_4_ = 0x37cfab9c;
          auVar49._20_4_ = 0x37cfab9c;
          auVar49._24_4_ = 0x37cfab9c;
          auVar49._28_4_ = 0x37cfab9c;
          auVar176 = vaddps_avx512vl(auVar176,auVar49);
          auVar108._4_4_ = auVar159._4_4_ * fVar316;
          auVar108._0_4_ = auVar159._0_4_ * fVar311;
          auVar108._8_4_ = auVar159._8_4_ * fVar318;
          auVar108._12_4_ = auVar159._12_4_ * fVar320;
          auVar108._16_4_ = auVar159._16_4_ * fVar322;
          auVar108._20_4_ = auVar159._20_4_ * fVar324;
          auVar108._24_4_ = auVar159._24_4_ * fVar326;
          auVar108._28_4_ = auVar159._28_4_;
          auVar50._8_4_ = 0xb9501096;
          auVar50._0_8_ = 0xb9501096b9501096;
          auVar50._12_4_ = 0xb9501096;
          auVar50._16_4_ = 0xb9501096;
          auVar50._20_4_ = 0xb9501096;
          auVar50._24_4_ = 0xb9501096;
          auVar50._28_4_ = 0xb9501096;
          auVar159 = vaddps_avx512vl(auVar108,auVar50);
          auVar109._4_4_ = auVar176._4_4_ * fVar316;
          auVar109._0_4_ = auVar176._0_4_ * fVar311;
          auVar109._8_4_ = auVar176._8_4_ * fVar318;
          auVar109._12_4_ = auVar176._12_4_ * fVar320;
          auVar109._16_4_ = auVar176._16_4_ * fVar322;
          auVar109._20_4_ = auVar176._20_4_ * fVar324;
          auVar109._24_4_ = auVar176._24_4_ * fVar326;
          auVar109._28_4_ = auVar176._28_4_;
          auVar51._8_4_ = 0xbab60981;
          auVar51._0_8_ = 0xbab60981bab60981;
          auVar51._12_4_ = 0xbab60981;
          auVar51._16_4_ = 0xbab60981;
          auVar51._20_4_ = 0xbab60981;
          auVar51._24_4_ = 0xbab60981;
          auVar51._28_4_ = 0xbab60981;
          auVar176 = vaddps_avx512vl(auVar109,auVar51);
          auVar110._4_4_ = auVar159._4_4_ * fVar316;
          auVar110._0_4_ = auVar159._0_4_ * fVar311;
          auVar110._8_4_ = auVar159._8_4_ * fVar318;
          auVar110._12_4_ = auVar159._12_4_ * fVar320;
          auVar110._16_4_ = auVar159._16_4_ * fVar322;
          auVar110._20_4_ = auVar159._20_4_ * fVar324;
          auVar110._24_4_ = auVar159._24_4_ * fVar326;
          auVar110._28_4_ = auVar159._28_4_;
          auVar52._8_4_ = 0x3c088898;
          auVar52._0_8_ = 0x3c0888983c088898;
          auVar52._12_4_ = 0x3c088898;
          auVar52._16_4_ = 0x3c088898;
          auVar52._20_4_ = 0x3c088898;
          auVar52._24_4_ = 0x3c088898;
          auVar52._28_4_ = 0x3c088898;
          auVar159 = vaddps_avx512vl(auVar110,auVar52);
          auVar111._4_4_ = auVar176._4_4_ * fVar316;
          auVar111._0_4_ = auVar176._0_4_ * fVar311;
          auVar111._8_4_ = auVar176._8_4_ * fVar318;
          auVar111._12_4_ = auVar176._12_4_ * fVar320;
          auVar111._16_4_ = auVar176._16_4_ * fVar322;
          auVar111._20_4_ = auVar176._20_4_ * fVar324;
          auVar111._24_4_ = auVar176._24_4_ * fVar326;
          auVar111._28_4_ = auVar176._28_4_;
          auVar53._8_4_ = 0x3d2aaaa4;
          auVar53._0_8_ = 0x3d2aaaa43d2aaaa4;
          auVar53._12_4_ = 0x3d2aaaa4;
          auVar53._16_4_ = 0x3d2aaaa4;
          auVar53._20_4_ = 0x3d2aaaa4;
          auVar53._24_4_ = 0x3d2aaaa4;
          auVar53._28_4_ = 0x3d2aaaa4;
          auVar176 = vaddps_avx512vl(auVar111,auVar53);
          auVar112._4_4_ = auVar159._4_4_ * fVar316;
          auVar112._0_4_ = auVar159._0_4_ * fVar311;
          auVar112._8_4_ = auVar159._8_4_ * fVar318;
          auVar112._12_4_ = auVar159._12_4_ * fVar320;
          auVar112._16_4_ = auVar159._16_4_ * fVar322;
          auVar112._20_4_ = auVar159._20_4_ * fVar324;
          auVar112._24_4_ = auVar159._24_4_ * fVar326;
          auVar112._28_4_ = auVar159._28_4_;
          auVar54._8_4_ = 0xbe2aaaab;
          auVar54._0_8_ = 0xbe2aaaabbe2aaaab;
          auVar54._12_4_ = 0xbe2aaaab;
          auVar54._16_4_ = 0xbe2aaaab;
          auVar54._20_4_ = 0xbe2aaaab;
          auVar54._24_4_ = 0xbe2aaaab;
          auVar54._28_4_ = 0xbe2aaaab;
          auVar159 = vaddps_avx512vl(auVar112,auVar54);
          fVar343 = in_ZMM10._28_4_ + -0.5;
          fVar312 = (auVar176._0_4_ * fVar311 + -0.5) * fVar311;
          fVar317 = (auVar176._4_4_ * fVar316 + -0.5) * fVar316;
          fVar319 = (auVar176._8_4_ * fVar318 + -0.5) * fVar318;
          fVar321 = (auVar176._12_4_ * fVar320 + -0.5) * fVar320;
          fVar323 = (auVar176._16_4_ * fVar322 + -0.5) * fVar322;
          fVar325 = (auVar176._20_4_ * fVar324 + -0.5) * fVar324;
          fVar327 = (auVar176._24_4_ * fVar326 + -0.5) * fVar326;
          fVar344 = (auVar159._0_4_ * fVar311 + 1.0) * fVar344;
          fVar351 = (auVar159._4_4_ * fVar316 + 1.0) * fVar351;
          auVar113._4_4_ = fVar351;
          auVar113._0_4_ = fVar344;
          fVar353 = (auVar159._8_4_ * fVar318 + 1.0) * fVar353;
          auVar113._8_4_ = fVar353;
          fVar355 = (auVar159._12_4_ * fVar320 + 1.0) * fVar355;
          auVar113._12_4_ = fVar355;
          fVar357 = (auVar159._16_4_ * fVar322 + 1.0) * fVar357;
          auVar113._16_4_ = fVar357;
          fVar358 = (auVar159._20_4_ * fVar324 + 1.0) * fVar358;
          auVar113._20_4_ = fVar358;
          fVar359 = (auVar159._24_4_ * fVar326 + 1.0) * fVar359;
          auVar113._24_4_ = fVar359;
          auVar113._28_4_ = fVar343;
          auVar309._0_4_ = fVar312 + 1.0;
          auVar309._4_4_ = fVar317 + 1.0;
          auVar309._8_4_ = fVar319 + 1.0;
          auVar309._12_4_ = fVar321 + 1.0;
          auVar309._16_4_ = fVar323 + 1.0;
          auVar309._20_4_ = fVar325 + 1.0;
          auVar309._24_4_ = fVar327 + 1.0;
          auVar309._28_4_ = fVar328 + 1.0;
          auVar159 = vblendmps_avx512vl(auVar113,auVar309);
          bVar7 = (bool)((byte)uVar151 & 1);
          uVar152 = (uint)bVar7 * auVar159._0_4_ | (uint)!bVar7 * (int)fVar312;
          bVar7 = (bool)((byte)(uVar151 >> 1) & 1);
          uVar233 = (uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * (int)fVar317;
          bVar7 = (bool)((byte)(uVar151 >> 2) & 1);
          uVar148 = (uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * (int)fVar319;
          bVar7 = (bool)((byte)(uVar151 >> 3) & 1);
          uVar234 = (uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * (int)fVar321;
          bVar7 = (bool)((byte)(uVar151 >> 4) & 1);
          uVar235 = (uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * (int)fVar323;
          bVar7 = (bool)((byte)(uVar151 >> 5) & 1);
          uVar237 = (uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * (int)fVar325;
          bVar7 = (bool)((byte)(uVar151 >> 6) & 1);
          uVar242 = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * (int)fVar327;
          bVar7 = (bool)((byte)(uVar151 >> 7) & 1);
          uVar247 = (uint)bVar7 * auVar159._28_4_ | (uint)!bVar7 * (int)fVar328;
          bVar7 = (bool)((byte)uVar18 & 1);
          auVar227._0_4_ = (uint)bVar7 * (int)auVar309._0_4_ | (uint)!bVar7 * (int)fVar344;
          bVar7 = (bool)((byte)(uVar18 >> 1) & 1);
          auVar227._4_4_ = (uint)bVar7 * (int)auVar309._4_4_ | (uint)!bVar7 * (int)fVar351;
          bVar7 = (bool)((byte)(uVar18 >> 2) & 1);
          auVar227._8_4_ = (uint)bVar7 * (int)auVar309._8_4_ | (uint)!bVar7 * (int)fVar353;
          bVar7 = (bool)((byte)(uVar18 >> 3) & 1);
          auVar227._12_4_ = (uint)bVar7 * (int)auVar309._12_4_ | (uint)!bVar7 * (int)fVar355;
          bVar7 = (bool)((byte)(uVar18 >> 4) & 1);
          auVar227._16_4_ = (uint)bVar7 * (int)auVar309._16_4_ | (uint)!bVar7 * (int)fVar357;
          bVar7 = (bool)((byte)(uVar18 >> 5) & 1);
          auVar227._20_4_ = (uint)bVar7 * (int)auVar309._20_4_ | (uint)!bVar7 * (int)fVar358;
          bVar7 = (bool)((byte)(uVar18 >> 6) & 1);
          auVar227._24_4_ = (uint)bVar7 * (int)auVar309._24_4_ | (uint)!bVar7 * (int)fVar359;
          bVar7 = SUB81(uVar18 >> 7,0);
          auVar227._28_4_ = (uint)bVar7 * (int)auVar309._28_4_ | (uint)!bVar7 * (int)fVar343;
          auVar159 = vxorps_avx512vl(auVar206,auVar303);
          bVar145 = (byte)uVar147;
          auVar228._0_4_ =
               (uint)(bVar145 & 1) * auVar159._0_4_ | !(bool)(bVar145 & 1) * auVar206._0_4_;
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar228._4_4_ = (uint)bVar7 * auVar159._4_4_ | !bVar7 * auVar206._4_4_;
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar228._8_4_ = (uint)bVar7 * auVar159._8_4_ | !bVar7 * auVar206._8_4_;
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar228._12_4_ = (uint)bVar7 * auVar159._12_4_ | !bVar7 * auVar206._12_4_;
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          auVar228._16_4_ = (uint)bVar7 * auVar159._16_4_ | !bVar7 * auVar206._16_4_;
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          auVar228._20_4_ = (uint)bVar7 * auVar159._20_4_ | !bVar7 * auVar206._20_4_;
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          auVar228._24_4_ = (uint)bVar7 * auVar159._24_4_ | !bVar7 * auVar206._24_4_;
          bVar7 = SUB81(uVar147 >> 7,0);
          auVar228._28_4_ = (uint)bVar7 * auVar159._28_4_ | !bVar7 * auVar206._28_4_;
          auVar159 = vxorps_avx512vl(auVar190,auVar303);
          auVar229._0_4_ =
               (uint)(bVar145 & 1) * auVar159._0_4_ | !(bool)(bVar145 & 1) * auVar190._0_4_;
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar229._4_4_ = (uint)bVar7 * auVar159._4_4_ | !bVar7 * auVar190._4_4_;
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar229._8_4_ = (uint)bVar7 * auVar159._8_4_ | !bVar7 * auVar190._8_4_;
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar229._12_4_ = (uint)bVar7 * auVar159._12_4_ | !bVar7 * auVar190._12_4_;
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          auVar229._16_4_ = (uint)bVar7 * auVar159._16_4_ | !bVar7 * auVar190._16_4_;
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          auVar229._20_4_ = (uint)bVar7 * auVar159._20_4_ | !bVar7 * auVar190._20_4_;
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          auVar229._24_4_ = (uint)bVar7 * auVar159._24_4_ | !bVar7 * auVar190._24_4_;
          bVar7 = SUB81(uVar147 >> 7,0);
          auVar229._28_4_ = (uint)bVar7 * auVar159._28_4_ | !bVar7 * auVar190._28_4_;
          auVar159 = vfmsub213ps_avx512vl(auVar185,auVar187,auVar228);
          auVar153 = vfmsub213ps_fma(auVar160,auVar187,auVar229);
          fVar344 = auVar159._0_4_;
          fVar358 = auVar159._4_4_;
          fVar316 = auVar159._8_4_;
          fVar321 = auVar159._12_4_;
          fVar326 = auVar159._16_4_;
          fVar239 = auVar159._20_4_;
          fVar244 = auVar159._24_4_;
          fVar351 = auVar153._0_4_;
          fVar359 = auVar153._4_4_;
          fVar317 = auVar153._8_4_;
          fVar322 = auVar153._12_4_;
          auVar176 = vxorps_avx512vl(auVar204,auVar303);
          auVar230._0_4_ =
               (uint)(bVar145 & 1) * auVar176._0_4_ | !(bool)(bVar145 & 1) * auVar204._0_4_;
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar230._4_4_ = (uint)bVar7 * auVar176._4_4_ | !bVar7 * auVar204._4_4_;
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar230._8_4_ = (uint)bVar7 * auVar176._8_4_ | !bVar7 * auVar204._8_4_;
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar230._12_4_ = (uint)bVar7 * auVar176._12_4_ | !bVar7 * auVar204._12_4_;
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          auVar230._16_4_ = (uint)bVar7 * auVar176._16_4_ | !bVar7 * auVar204._16_4_;
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          auVar230._20_4_ = (uint)bVar7 * auVar176._20_4_ | !bVar7 * auVar204._20_4_;
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          auVar230._24_4_ = (uint)bVar7 * auVar176._24_4_ | !bVar7 * auVar204._24_4_;
          bVar7 = SUB81(uVar147 >> 7,0);
          auVar230._28_4_ = (uint)bVar7 * auVar176._28_4_ | !bVar7 * auVar204._28_4_;
          auVar176 = vfmsub213ps_avx512vl(auVar182,auVar187,auVar230);
          fVar353 = auVar176._0_4_;
          fVar328 = auVar176._4_4_;
          fVar318 = auVar176._8_4_;
          fVar323 = auVar176._12_4_;
          fVar327 = auVar176._16_4_;
          fVar240 = auVar176._20_4_;
          fVar245 = auVar176._24_4_;
          auVar176 = vxorps_avx512vl(auVar205,auVar303);
          auVar231._0_4_ =
               (uint)(bVar145 & 1) * auVar176._0_4_ | !(bool)(bVar145 & 1) * auVar205._0_4_;
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          auVar231._4_4_ = (uint)bVar7 * auVar176._4_4_ | !bVar7 * auVar205._4_4_;
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          auVar231._8_4_ = (uint)bVar7 * auVar176._8_4_ | !bVar7 * auVar205._8_4_;
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          auVar231._12_4_ = (uint)bVar7 * auVar176._12_4_ | !bVar7 * auVar205._12_4_;
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          auVar231._16_4_ = (uint)bVar7 * auVar176._16_4_ | !bVar7 * auVar205._16_4_;
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          auVar231._20_4_ = (uint)bVar7 * auVar176._20_4_ | !bVar7 * auVar205._20_4_;
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          auVar231._24_4_ = (uint)bVar7 * auVar176._24_4_ | !bVar7 * auVar205._24_4_;
          bVar7 = SUB81(uVar147 >> 7,0);
          auVar231._28_4_ = (uint)bVar7 * auVar176._28_4_ | !bVar7 * auVar205._28_4_;
          auVar176 = vfmsub213ps_avx512vl(auVar183,auVar187,auVar231);
          fVar355 = auVar176._0_4_;
          fVar311 = auVar176._4_4_;
          fVar319 = auVar176._8_4_;
          fVar324 = auVar176._12_4_;
          fVar343 = auVar176._16_4_;
          fVar241 = auVar176._20_4_;
          fVar246 = auVar176._24_4_;
          auVar350._0_4_ =
               fVar355 * fVar355 + fVar353 * fVar353 + fVar344 * fVar344 + fVar351 * fVar351;
          auVar350._4_4_ =
               fVar311 * fVar311 + fVar328 * fVar328 + fVar358 * fVar358 + fVar359 * fVar359;
          auVar350._8_4_ =
               fVar319 * fVar319 + fVar318 * fVar318 + fVar316 * fVar316 + fVar317 * fVar317;
          auVar350._12_4_ =
               fVar324 * fVar324 + fVar323 * fVar323 + fVar321 * fVar321 + fVar322 * fVar322;
          auVar350._16_4_ = fVar343 * fVar343 + fVar327 * fVar327 + fVar326 * fVar326 + 0.0;
          auVar350._20_4_ = fVar241 * fVar241 + fVar240 * fVar240 + fVar239 * fVar239 + 0.0;
          auVar350._24_4_ = fVar246 * fVar246 + fVar245 * fVar245 + fVar244 * fVar244 + 0.0;
          auVar350._28_4_ = fStack_124 + 1.4013e-45 + 2.8026e-45 + 4.2039e-45;
          auVar176 = vrsqrt14ps_avx512vl(auVar350);
          fVar357 = auVar176._0_4_;
          fVar312 = auVar176._4_4_;
          fVar320 = auVar176._8_4_;
          fVar325 = auVar176._12_4_;
          fVar236 = auVar176._16_4_;
          fVar238 = auVar176._20_4_;
          fVar243 = auVar176._24_4_;
          auVar114._4_4_ = auVar350._4_4_ * -0.5 * fVar312 * fVar312 * fVar312;
          auVar114._0_4_ = auVar350._0_4_ * -0.5 * fVar357 * fVar357 * fVar357;
          auVar114._8_4_ = auVar350._8_4_ * -0.5 * fVar320 * fVar320 * fVar320;
          auVar114._12_4_ = auVar350._12_4_ * -0.5 * fVar325 * fVar325 * fVar325;
          auVar114._16_4_ = auVar350._16_4_ * -0.5 * fVar236 * fVar236 * fVar236;
          auVar114._20_4_ = auVar350._20_4_ * -0.5 * fVar238 * fVar238 * fVar238;
          auVar114._24_4_ = auVar350._24_4_ * -0.5 * fVar243 * fVar243 * fVar243;
          auVar114._28_4_ = auVar350._28_4_;
          auVar370._8_4_ = 0x3fc00000;
          auVar370._0_8_ = 0x3fc000003fc00000;
          auVar370._12_4_ = 0x3fc00000;
          auVar370._16_4_ = 0x3fc00000;
          auVar370._20_4_ = 0x3fc00000;
          auVar370._24_4_ = 0x3fc00000;
          auVar370._28_4_ = 0x3fc00000;
          auVar153 = vfmadd231ps_fma(auVar114,auVar370,auVar176);
          fVar248 = auVar153._0_4_;
          fVar352 = auVar153._4_4_;
          fVar354 = auVar153._8_4_;
          fVar356 = auVar153._12_4_;
          auVar178 = vxorps_avx512vl(auVar227,auVar303);
          bVar7 = (bool)((byte)uVar16 & 1);
          auVar232._0_4_ = (uint)bVar7 * auVar178._0_4_ | !bVar7 * auVar227._0_4_;
          bVar7 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar232._4_4_ = (uint)bVar7 * auVar178._4_4_ | !bVar7 * auVar227._4_4_;
          bVar7 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar232._8_4_ = (uint)bVar7 * auVar178._8_4_ | !bVar7 * auVar227._8_4_;
          bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar232._12_4_ = (uint)bVar7 * auVar178._12_4_ | !bVar7 * auVar227._12_4_;
          bVar7 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar232._16_4_ = (uint)bVar7 * auVar178._16_4_ | !bVar7 * auVar227._16_4_;
          bVar7 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar232._20_4_ = (uint)bVar7 * auVar178._20_4_ | !bVar7 * auVar227._20_4_;
          bVar7 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar232._24_4_ = (uint)bVar7 * auVar178._24_4_ | !bVar7 * auVar227._24_4_;
          bVar7 = SUB81(uVar16 >> 7,0);
          auVar232._28_4_ = (uint)bVar7 * auVar178._28_4_ | !bVar7 * auVar227._28_4_;
          bVar7 = (bool)((byte)uVar15 & 1);
          fVar357 = (float)(bVar7 * uVar152 | (uint)!bVar7 * (uVar152 ^ 0x80000000));
          bVar7 = (bool)((byte)(uVar15 >> 1) & 1);
          fVar312 = (float)(bVar7 * uVar233 | (uint)!bVar7 * (uVar233 ^ 0x80000000));
          bVar7 = (bool)((byte)(uVar15 >> 2) & 1);
          fVar320 = (float)(bVar7 * uVar148 | (uint)!bVar7 * (uVar148 ^ 0x80000000));
          bVar7 = (bool)((byte)(uVar15 >> 3) & 1);
          fVar325 = (float)(bVar7 * uVar234 | (uint)!bVar7 * (uVar234 ^ 0x80000000));
          bVar7 = (bool)((byte)(uVar15 >> 4) & 1);
          fVar236 = (float)(bVar7 * uVar235 | (uint)!bVar7 * (uVar235 ^ 0x80000000));
          bVar7 = (bool)((byte)(uVar15 >> 5) & 1);
          fVar238 = (float)(bVar7 * uVar237 | (uint)!bVar7 * (uVar237 ^ 0x80000000));
          bVar7 = (bool)((byte)(uVar15 >> 6) & 1);
          fVar243 = (float)(bVar7 * uVar242 | (uint)!bVar7 * (uVar242 ^ 0x80000000));
          bVar7 = SUB81(uVar15 >> 7,0);
          auVar115._4_4_ = fVar312 * fVar352 * fVar358;
          auVar115._0_4_ = fVar357 * fVar248 * fVar344;
          auVar115._8_4_ = fVar320 * fVar354 * fVar316;
          auVar115._12_4_ = fVar325 * fVar356 * fVar321;
          auVar115._16_4_ = fVar236 * fVar326 * 0.0;
          auVar115._20_4_ = fVar238 * fVar239 * 0.0;
          auVar115._24_4_ = fVar243 * fVar244 * 0.0;
          auVar115._28_4_ = 0x80000000;
          auVar116._4_4_ = fVar359 * fVar352 * fVar312;
          auVar116._0_4_ = fVar351 * fVar248 * fVar357;
          auVar116._8_4_ = fVar317 * fVar354 * fVar320;
          auVar116._12_4_ = fVar322 * fVar356 * fVar325;
          auVar116._16_4_ = fVar236 * 0.0;
          auVar116._20_4_ = fVar238 * 0.0;
          auVar116._24_4_ = fVar243 * 0.0;
          auVar116._28_4_ = auVar159._28_4_;
          auVar117._4_4_ = fVar328 * fVar352 * fVar312;
          auVar117._0_4_ = fVar353 * fVar248 * fVar357;
          auVar117._8_4_ = fVar318 * fVar354 * fVar320;
          auVar117._12_4_ = fVar323 * fVar356 * fVar325;
          auVar117._16_4_ = fVar327 * 0.0 * fVar236;
          auVar117._20_4_ = fVar240 * 0.0 * fVar238;
          auVar117._24_4_ = fVar245 * 0.0 * fVar243;
          auVar117._28_4_ = uVar247;
          auVar118._4_4_ = fVar311 * fVar352 * fVar312;
          auVar118._0_4_ = fVar355 * fVar248 * fVar357;
          auVar118._8_4_ = fVar319 * fVar354 * fVar320;
          auVar118._12_4_ = fVar324 * fVar356 * fVar325;
          auVar118._16_4_ = fVar343 * 0.0 * fVar236;
          auVar118._20_4_ = fVar241 * 0.0 * fVar238;
          auVar118._24_4_ = fVar246 * 0.0 * fVar243;
          auVar118._28_4_ = 0;
          auVar159 = vfmadd231ps_avx512vl(auVar115,auVar232,auVar185);
          auVar178 = vfmadd231ps_avx512vl(auVar116,auVar232,auVar160);
          auVar181 = vfmadd231ps_avx512vl(auVar117,auVar232,auVar182);
          auVar184 = vfmadd231ps_avx512vl(auVar118,auVar183,auVar232);
          auVar190 = vsubps_avx512vl(auVar228,auVar185);
          auVar185 = vfmadd213ps_avx512vl(auVar190,auVar177,auVar185);
          auVar190 = vsubps_avx512vl(auVar229,auVar160);
          auVar160 = vfmadd213ps_avx512vl(auVar190,auVar177,auVar160);
          auVar190 = vsubps_avx512vl(auVar230,auVar182);
          auVar182 = vfmadd213ps_avx512vl(auVar190,auVar177,auVar182);
          auVar190 = vsubps_avx512vl(auVar231,auVar183);
          auVar183 = vfmadd213ps_avx512vl(auVar190,auVar177,auVar183);
          fVar328 = auVar176._28_4_;
          auVar365._0_4_ =
               auVar183._0_4_ * auVar183._0_4_ +
               auVar182._0_4_ * auVar182._0_4_ +
               auVar185._0_4_ * auVar185._0_4_ + auVar160._0_4_ * auVar160._0_4_;
          auVar365._4_4_ =
               auVar183._4_4_ * auVar183._4_4_ +
               auVar182._4_4_ * auVar182._4_4_ +
               auVar185._4_4_ * auVar185._4_4_ + auVar160._4_4_ * auVar160._4_4_;
          auVar365._8_4_ =
               auVar183._8_4_ * auVar183._8_4_ +
               auVar182._8_4_ * auVar182._8_4_ +
               auVar185._8_4_ * auVar185._8_4_ + auVar160._8_4_ * auVar160._8_4_;
          auVar365._12_4_ =
               auVar183._12_4_ * auVar183._12_4_ +
               auVar182._12_4_ * auVar182._12_4_ +
               auVar185._12_4_ * auVar185._12_4_ + auVar160._12_4_ * auVar160._12_4_;
          auVar365._16_4_ =
               auVar183._16_4_ * auVar183._16_4_ +
               auVar182._16_4_ * auVar182._16_4_ +
               auVar185._16_4_ * auVar185._16_4_ + auVar160._16_4_ * auVar160._16_4_;
          auVar365._20_4_ =
               auVar183._20_4_ * auVar183._20_4_ +
               auVar182._20_4_ * auVar182._20_4_ +
               auVar185._20_4_ * auVar185._20_4_ + auVar160._20_4_ * auVar160._20_4_;
          auVar365._24_4_ =
               auVar183._24_4_ * auVar183._24_4_ +
               auVar182._24_4_ * auVar182._24_4_ +
               auVar185._24_4_ * auVar185._24_4_ + auVar160._24_4_ * auVar160._24_4_;
          auVar365._28_4_ =
               fVar328 + fVar328 + (float)(bVar7 * uVar247 | (uint)!bVar7 * (uVar247 ^ 0x80000000))
                                   + fVar328;
          auVar190 = vrsqrt14ps_avx512vl(auVar365);
          fVar344 = auVar190._0_4_;
          fVar351 = auVar190._4_4_;
          fVar353 = auVar190._8_4_;
          fVar355 = auVar190._12_4_;
          fVar357 = auVar190._16_4_;
          fVar358 = auVar190._20_4_;
          fVar359 = auVar190._24_4_;
          auVar119._4_4_ = auVar365._4_4_ * -0.5 * fVar351 * fVar351 * fVar351;
          auVar119._0_4_ = auVar365._0_4_ * -0.5 * fVar344 * fVar344 * fVar344;
          auVar119._8_4_ = auVar365._8_4_ * -0.5 * fVar353 * fVar353 * fVar353;
          auVar119._12_4_ = auVar365._12_4_ * -0.5 * fVar355 * fVar355 * fVar355;
          auVar119._16_4_ = auVar365._16_4_ * -0.5 * fVar357 * fVar357 * fVar357;
          auVar119._20_4_ = auVar365._20_4_ * -0.5 * fVar358 * fVar358 * fVar358;
          auVar119._24_4_ = auVar365._24_4_ * -0.5 * fVar359 * fVar359 * fVar359;
          auVar119._28_4_ = 0xbf000000;
          auVar153 = vfmadd231ps_fma(auVar119,auVar190,auVar370);
          auVar55._8_4_ = 0x3f7fdf3b;
          auVar55._0_8_ = 0x3f7fdf3b3f7fdf3b;
          auVar55._12_4_ = 0x3f7fdf3b;
          auVar55._16_4_ = 0x3f7fdf3b;
          auVar55._20_4_ = 0x3f7fdf3b;
          auVar55._24_4_ = 0x3f7fdf3b;
          auVar55._28_4_ = 0x3f7fdf3b;
          uVar147 = vcmpps_avx512vl(auVar187,auVar55,6);
          auVar187 = vmulps_avx512vl(auVar185,ZEXT1632(auVar153));
          bVar145 = (byte)uVar147;
          fVar355 = (float)((uint)(bVar145 & 1) * auVar187._0_4_ |
                           (uint)!(bool)(bVar145 & 1) * auVar159._0_4_);
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          fVar311 = (float)((uint)bVar7 * auVar187._4_4_ | (uint)!bVar7 * auVar159._4_4_);
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          fVar318 = (float)((uint)bVar7 * auVar187._8_4_ | (uint)!bVar7 * auVar159._8_4_);
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          fVar322 = (float)((uint)bVar7 * auVar187._12_4_ | (uint)!bVar7 * auVar159._12_4_);
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          fVar326 = (float)((uint)bVar7 * auVar187._16_4_ | (uint)!bVar7 * auVar159._16_4_);
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          fVar239 = (float)((uint)bVar7 * auVar187._20_4_ | (uint)!bVar7 * auVar159._20_4_);
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          fVar244 = (float)((uint)bVar7 * auVar187._24_4_ | (uint)!bVar7 * auVar159._24_4_);
          bVar7 = SUB81(uVar147 >> 7,0);
          fVar248 = (float)((uint)bVar7 * auVar187._28_4_ | (uint)!bVar7 * auVar159._28_4_);
          auVar159 = vmulps_avx512vl(auVar160,ZEXT1632(auVar153));
          fVar357 = (float)((uint)(bVar145 & 1) * auVar159._0_4_ |
                           (uint)!(bool)(bVar145 & 1) * auVar178._0_4_);
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          fVar312 = (float)((uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * auVar178._4_4_);
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          fVar319 = (float)((uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * auVar178._8_4_);
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          fVar323 = (float)((uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * auVar178._12_4_);
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          fVar327 = (float)((uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * auVar178._16_4_);
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          fVar240 = (float)((uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * auVar178._20_4_);
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          fVar245 = (float)((uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * auVar178._24_4_);
          auVar159 = vmulps_avx512vl(auVar182,ZEXT1632(auVar153));
          fVar358 = (float)((uint)(bVar145 & 1) * auVar159._0_4_ |
                           (uint)!(bool)(bVar145 & 1) * auVar181._0_4_);
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          fVar316 = (float)((uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * auVar181._4_4_);
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          fVar320 = (float)((uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * auVar181._8_4_);
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          fVar324 = (float)((uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * auVar181._12_4_);
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          fVar343 = (float)((uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * auVar181._16_4_);
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          fVar241 = (float)((uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * auVar181._20_4_);
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          fVar246 = (float)((uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * auVar181._24_4_);
          auVar159 = vmulps_avx512vl(auVar183,ZEXT1632(auVar153));
          fVar359 = (float)((uint)(bVar145 & 1) * auVar159._0_4_ |
                           (uint)!(bool)(bVar145 & 1) * auVar184._0_4_);
          bVar7 = (bool)((byte)(uVar147 >> 1) & 1);
          fVar317 = (float)((uint)bVar7 * auVar159._4_4_ | (uint)!bVar7 * auVar184._4_4_);
          bVar7 = (bool)((byte)(uVar147 >> 2) & 1);
          fVar321 = (float)((uint)bVar7 * auVar159._8_4_ | (uint)!bVar7 * auVar184._8_4_);
          bVar7 = (bool)((byte)(uVar147 >> 3) & 1);
          fVar325 = (float)((uint)bVar7 * auVar159._12_4_ | (uint)!bVar7 * auVar184._12_4_);
          bVar7 = (bool)((byte)(uVar147 >> 4) & 1);
          fVar236 = (float)((uint)bVar7 * auVar159._16_4_ | (uint)!bVar7 * auVar184._16_4_);
          bVar7 = (bool)((byte)(uVar147 >> 5) & 1);
          fVar238 = (float)((uint)bVar7 * auVar159._20_4_ | (uint)!bVar7 * auVar184._20_4_);
          bVar7 = (bool)((byte)(uVar147 >> 6) & 1);
          fVar243 = (float)((uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * auVar184._24_4_);
          auVar159 = vsubps_avx(auVar287,auVar177);
          auVar187 = vmulps_avx512vl(auVar177,auVar186);
          auVar178 = vfmadd213ps_avx512vl(auVar179,auVar159,auVar187);
          auVar187 = vmulps_avx512vl(auVar177,auVar188);
          auVar179 = vfmadd213ps_avx512vl(auVar180,auVar159,auVar187);
          auVar187 = vmulps_avx512vl(auVar177,auVar189);
          auVar180 = vfmadd213ps_avx512vl(local_120,auVar159,auVar187);
          auVar187 = vmulps_avx512vl(auVar177,auVar201);
          auVar176 = vmulps_avx512vl(auVar177,auVar208);
          auVar160 = vmulps_avx512vl(auVar177,auVar209);
          auVar181 = vfmadd213ps_avx512vl(local_1c0,auVar159,auVar187);
          auVar184 = vfmadd213ps_avx512vl(local_220,auVar159,auVar176);
          auVar186 = vfmadd213ps_avx512vl(local_1a0,auVar159,auVar160);
          auVar120._4_4_ = fVar257 * fStack_dc;
          auVar120._0_4_ = fVar249 * local_e0;
          auVar120._8_4_ = fVar258 * fStack_d8;
          auVar120._12_4_ = fVar259 * fStack_d4;
          auVar120._16_4_ = fVar260 * fStack_d0;
          auVar120._20_4_ = fVar261 * fStack_cc;
          fVar344 = auVar187._28_4_;
          auVar120._24_4_ = fVar262 * fStack_c8;
          auVar120._28_4_ = fVar344;
          auVar121._4_4_ = fVar257 * fStack_bc;
          auVar121._0_4_ = fVar249 * local_c0;
          auVar121._8_4_ = fVar258 * fStack_b8;
          auVar121._12_4_ = fVar259 * fStack_b4;
          auVar121._16_4_ = fVar260 * fStack_b0;
          auVar121._20_4_ = fVar261 * fStack_ac;
          fVar351 = auVar176._28_4_;
          auVar121._24_4_ = fVar262 * fStack_a8;
          auVar121._28_4_ = fVar351;
          auVar122._4_4_ = fVar257 * fStack_9c;
          auVar122._0_4_ = fVar249 * local_a0;
          auVar122._8_4_ = fVar258 * fStack_98;
          auVar122._12_4_ = fVar259 * fStack_94;
          auVar122._16_4_ = fVar260 * fStack_90;
          auVar122._20_4_ = fVar261 * fStack_8c;
          fVar353 = auVar160._28_4_;
          auVar122._24_4_ = fVar262 * fStack_88;
          auVar122._28_4_ = fVar353;
          auVar160 = vfmadd213ps_avx512vl(local_260,auVar159,auVar120);
          auVar188 = vfmadd213ps_avx512vl(local_1e0,auVar159,auVar121);
          auVar189 = vfmadd213ps_avx512vl(local_180,auVar159,auVar122);
          auVar123._4_4_ = fVar257 * fStack_7c;
          auVar123._0_4_ = fVar249 * local_80;
          auVar123._8_4_ = fVar258 * fStack_78;
          auVar123._12_4_ = fVar259 * fStack_74;
          auVar123._16_4_ = fVar260 * fStack_70;
          auVar123._20_4_ = fVar261 * fStack_6c;
          auVar123._24_4_ = fVar262 * fStack_68;
          auVar123._28_4_ = fVar344;
          auVar124._4_4_ = fVar257 * fStack_5c;
          auVar124._0_4_ = fVar249 * local_60;
          auVar124._8_4_ = fVar258 * fStack_58;
          auVar124._12_4_ = fVar259 * fStack_54;
          auVar124._16_4_ = fVar260 * fStack_50;
          auVar124._20_4_ = fVar261 * fStack_4c;
          auVar124._24_4_ = fVar262 * fStack_48;
          auVar124._28_4_ = fVar351;
          auVar143._4_4_ = fVar257 * fStack_13c;
          auVar143._0_4_ = fVar249 * local_140;
          auVar143._8_4_ = fVar258 * fStack_138;
          auVar143._12_4_ = fVar259 * fStack_134;
          auVar143._16_4_ = fVar260 * fStack_130;
          auVar143._20_4_ = fVar261 * fStack_12c;
          auVar143._24_4_ = fVar262 * fStack_128;
          auVar143._28_4_ = auVar177._28_4_;
          auVar201 = vfmadd213ps_avx512vl(_local_240,auVar159,auVar123);
          auVar208 = vfmadd213ps_avx512vl(_local_200,auVar159,auVar124);
          auVar209 = vfmadd213ps_avx512vl(local_280,auVar159,auVar143);
          auVar125._4_4_ = fVar311 * fVar311;
          auVar125._0_4_ = fVar355 * fVar355;
          auVar125._8_4_ = fVar318 * fVar318;
          auVar125._12_4_ = fVar322 * fVar322;
          auVar125._16_4_ = fVar326 * fVar326;
          auVar125._20_4_ = fVar239 * fVar239;
          auVar125._24_4_ = fVar244 * fVar244;
          auVar125._28_4_ = fVar344;
          auVar126._4_4_ = fVar312 * fVar312;
          auVar126._0_4_ = fVar357 * fVar357;
          auVar126._8_4_ = fVar319 * fVar319;
          auVar126._12_4_ = fVar323 * fVar323;
          auVar126._16_4_ = fVar327 * fVar327;
          auVar126._20_4_ = fVar240 * fVar240;
          auVar126._24_4_ = fVar245 * fVar245;
          auVar126._28_4_ = fVar351;
          auVar255._0_4_ = fVar355 * fVar355 + fVar357 * fVar357;
          auVar255._4_4_ = fVar311 * fVar311 + fVar312 * fVar312;
          auVar255._8_4_ = fVar318 * fVar318 + fVar319 * fVar319;
          auVar255._12_4_ = fVar322 * fVar322 + fVar323 * fVar323;
          auVar255._16_4_ = fVar326 * fVar326 + fVar327 * fVar327;
          auVar255._20_4_ = fVar239 * fVar239 + fVar240 * fVar240;
          auVar255._24_4_ = fVar244 * fVar244 + fVar245 * fVar245;
          auVar255._28_4_ = fVar344 + fVar351;
          auVar127._4_4_ = fVar316 * fVar316;
          auVar127._0_4_ = fVar358 * fVar358;
          auVar127._8_4_ = fVar320 * fVar320;
          auVar127._12_4_ = fVar324 * fVar324;
          auVar127._16_4_ = fVar343 * fVar343;
          auVar127._20_4_ = fVar241 * fVar241;
          auVar127._24_4_ = fVar246 * fVar246;
          auVar127._28_4_ = auVar182._28_4_;
          auVar159 = vsubps_avx(auVar255,auVar127);
          auVar128._4_4_ = fVar317 * fVar317;
          auVar128._0_4_ = fVar359 * fVar359;
          auVar128._8_4_ = fVar321 * fVar321;
          auVar128._12_4_ = fVar325 * fVar325;
          auVar128._16_4_ = fVar236 * fVar236;
          auVar128._20_4_ = fVar238 * fVar238;
          auVar128._24_4_ = fVar243 * fVar243;
          auVar128._28_4_ = auVar183._28_4_;
          auVar159 = vsubps_avx(auVar159,auVar128);
          auVar129._4_4_ = fVar312 * fVar316;
          auVar129._0_4_ = fVar357 * fVar358;
          auVar129._8_4_ = fVar319 * fVar320;
          auVar129._12_4_ = fVar323 * fVar324;
          auVar129._16_4_ = fVar327 * fVar343;
          auVar129._20_4_ = fVar240 * fVar241;
          auVar129._24_4_ = fVar245 * fVar246;
          auVar129._28_4_ = fVar353;
          auVar130._4_4_ = fVar317 * fVar311;
          auVar130._0_4_ = fVar359 * fVar355;
          auVar130._8_4_ = fVar321 * fVar318;
          auVar130._12_4_ = fVar325 * fVar322;
          auVar130._16_4_ = fVar236 * fVar326;
          auVar130._20_4_ = fVar238 * fVar239;
          auVar130._24_4_ = fVar243 * fVar244;
          auVar130._28_4_ = auVar185._28_4_;
          fVar249 = fVar357 * fVar358 + fVar359 * fVar355;
          fVar257 = fVar312 * fVar316 + fVar317 * fVar311;
          fVar258 = fVar319 * fVar320 + fVar321 * fVar318;
          fVar259 = fVar323 * fVar324 + fVar325 * fVar322;
          fVar260 = fVar327 * fVar343 + fVar236 * fVar326;
          fVar261 = fVar240 * fVar241 + fVar238 * fVar239;
          fVar262 = fVar245 * fVar246 + fVar243 * fVar244;
          fVar353 = fVar353 + auVar185._28_4_;
          auVar256._0_4_ = fVar249 + fVar249;
          auVar256._4_4_ = fVar257 + fVar257;
          auVar256._8_4_ = fVar258 + fVar258;
          auVar256._12_4_ = fVar259 + fVar259;
          auVar256._16_4_ = fVar260 + fVar260;
          auVar256._20_4_ = fVar261 + fVar261;
          auVar256._24_4_ = fVar262 + fVar262;
          auVar256._28_4_ = fVar353 + fVar353;
          auVar131._4_4_ = fVar317 * fVar312;
          auVar131._0_4_ = fVar359 * fVar357;
          auVar131._8_4_ = fVar321 * fVar319;
          auVar131._12_4_ = fVar325 * fVar323;
          auVar131._16_4_ = fVar236 * fVar327;
          auVar131._20_4_ = fVar238 * fVar240;
          auVar131._24_4_ = fVar243 * fVar245;
          auVar131._28_4_ = auVar190._28_4_;
          auVar132._4_4_ = fVar311 * fVar316;
          auVar132._0_4_ = fVar355 * fVar358;
          auVar132._8_4_ = fVar318 * fVar320;
          auVar132._12_4_ = fVar322 * fVar324;
          auVar132._16_4_ = fVar326 * fVar343;
          auVar132._20_4_ = fVar239 * fVar241;
          auVar132._24_4_ = fVar244 * fVar246;
          auVar132._28_4_ = fVar328;
          auVar187 = vsubps_avx(auVar131,auVar132);
          auVar371._0_4_ = auVar187._0_4_ + auVar187._0_4_;
          auVar371._4_4_ = auVar187._4_4_ + auVar187._4_4_;
          auVar371._8_4_ = auVar187._8_4_ + auVar187._8_4_;
          auVar371._12_4_ = auVar187._12_4_ + auVar187._12_4_;
          auVar371._16_4_ = auVar187._16_4_ + auVar187._16_4_;
          auVar371._20_4_ = auVar187._20_4_ + auVar187._20_4_;
          auVar371._24_4_ = auVar187._24_4_ + auVar187._24_4_;
          auVar371._28_4_ = auVar187._28_4_ + auVar187._28_4_;
          auVar187 = vsubps_avx(auVar129,auVar130);
          auVar185 = vaddps_avx512vl(auVar187,auVar187);
          auVar187 = vsubps_avx(auVar125,auVar126);
          auVar295._0_4_ = fVar358 * fVar358 + auVar187._0_4_;
          auVar295._4_4_ = fVar316 * fVar316 + auVar187._4_4_;
          auVar295._8_4_ = fVar320 * fVar320 + auVar187._8_4_;
          auVar295._12_4_ = fVar324 * fVar324 + auVar187._12_4_;
          auVar295._16_4_ = fVar343 * fVar343 + auVar187._16_4_;
          auVar295._20_4_ = fVar241 * fVar241 + auVar187._20_4_;
          auVar295._24_4_ = fVar246 * fVar246 + auVar187._24_4_;
          auVar295._28_4_ = auVar182._28_4_ + auVar187._28_4_;
          auVar176 = vsubps_avx(auVar295,auVar128);
          auVar133._4_4_ = fVar317 * fVar316;
          auVar133._0_4_ = fVar359 * fVar358;
          auVar133._8_4_ = fVar321 * fVar320;
          auVar133._12_4_ = fVar325 * fVar324;
          auVar133._16_4_ = fVar236 * fVar343;
          auVar133._20_4_ = fVar238 * fVar241;
          auVar133._24_4_ = fVar243 * fVar246;
          auVar133._28_4_ = auVar295._28_4_;
          auVar134._4_4_ = fVar311 * fVar312;
          auVar134._0_4_ = fVar355 * fVar357;
          auVar134._8_4_ = fVar318 * fVar319;
          auVar134._12_4_ = fVar322 * fVar323;
          auVar134._16_4_ = fVar326 * fVar327;
          auVar134._20_4_ = fVar239 * fVar240;
          auVar134._24_4_ = fVar244 * fVar245;
          auVar134._28_4_ = fVar248;
          fVar249 = fVar359 * fVar358 + fVar355 * fVar357;
          fVar257 = fVar317 * fVar316 + fVar311 * fVar312;
          fVar258 = fVar321 * fVar320 + fVar318 * fVar319;
          fVar259 = fVar325 * fVar324 + fVar322 * fVar323;
          fVar260 = fVar236 * fVar343 + fVar326 * fVar327;
          fVar261 = fVar238 * fVar241 + fVar239 * fVar240;
          fVar262 = fVar243 * fVar246 + fVar244 * fVar245;
          auVar310._0_4_ = fVar249 + fVar249;
          auVar310._4_4_ = fVar257 + fVar257;
          auVar310._8_4_ = fVar258 + fVar258;
          auVar310._12_4_ = fVar259 + fVar259;
          auVar310._16_4_ = fVar260 + fVar260;
          auVar310._20_4_ = fVar261 + fVar261;
          auVar310._24_4_ = fVar262 + fVar262;
          auVar310._28_4_ = auVar295._28_4_ + fVar248 + auVar295._28_4_ + fVar248;
          fVar249 = fVar359 * fVar357 + fVar355 * fVar358;
          fVar257 = fVar317 * fVar312 + fVar311 * fVar316;
          fVar258 = fVar321 * fVar319 + fVar318 * fVar320;
          fVar259 = fVar325 * fVar323 + fVar322 * fVar324;
          fVar260 = fVar236 * fVar327 + fVar326 * fVar343;
          fVar261 = fVar238 * fVar240 + fVar239 * fVar241;
          fVar262 = fVar243 * fVar245 + fVar244 * fVar246;
          fVar328 = auVar190._28_4_ + fVar328;
          auVar315._0_4_ = fVar249 + fVar249;
          auVar315._4_4_ = fVar257 + fVar257;
          auVar315._8_4_ = fVar258 + fVar258;
          auVar315._12_4_ = fVar259 + fVar259;
          auVar315._16_4_ = fVar260 + fVar260;
          auVar315._20_4_ = fVar261 + fVar261;
          auVar315._24_4_ = fVar262 + fVar262;
          auVar315._28_4_ = fVar328 + fVar328;
          auVar177 = vsubps_avx(auVar133,auVar134);
          auVar342._0_4_ = auVar177._0_4_ + auVar177._0_4_;
          auVar342._4_4_ = auVar177._4_4_ + auVar177._4_4_;
          auVar342._8_4_ = auVar177._8_4_ + auVar177._8_4_;
          auVar342._12_4_ = auVar177._12_4_ + auVar177._12_4_;
          auVar342._16_4_ = auVar177._16_4_ + auVar177._16_4_;
          auVar342._20_4_ = auVar177._20_4_ + auVar177._20_4_;
          auVar342._24_4_ = auVar177._24_4_ + auVar177._24_4_;
          fVar249 = auVar177._28_4_;
          auVar342._28_4_ = fVar249 + fVar249;
          auVar187 = vsubps_avx(auVar187,auVar127);
          auVar288._0_4_ = fVar359 * fVar359 + auVar187._0_4_;
          auVar288._4_4_ = fVar317 * fVar317 + auVar187._4_4_;
          auVar288._8_4_ = fVar321 * fVar321 + auVar187._8_4_;
          auVar288._12_4_ = fVar325 * fVar325 + auVar187._12_4_;
          auVar288._16_4_ = fVar236 * fVar236 + auVar187._16_4_;
          auVar288._20_4_ = fVar238 * fVar238 + auVar187._20_4_;
          auVar288._24_4_ = fVar243 * fVar243 + auVar187._24_4_;
          auVar288._28_4_ = auVar183._28_4_ + auVar187._28_4_;
          auVar187 = ZEXT832(0) << 0x20;
          auVar135._4_4_ = auVar371._4_4_ * 0.0;
          auVar135._0_4_ = auVar371._0_4_ * 0.0;
          auVar135._8_4_ = auVar371._8_4_ * 0.0;
          auVar135._12_4_ = auVar371._12_4_ * 0.0;
          auVar135._16_4_ = auVar371._16_4_ * 0.0;
          auVar135._20_4_ = auVar371._20_4_ * 0.0;
          auVar135._24_4_ = auVar371._24_4_ * 0.0;
          auVar135._28_4_ = fVar249;
          auVar153 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar256,auVar135);
          auVar296._0_4_ = auVar256._0_4_ + auVar371._0_4_ * 0.0;
          auVar296._4_4_ = auVar256._4_4_ + auVar371._4_4_ * 0.0;
          auVar296._8_4_ = auVar256._8_4_ + auVar371._8_4_ * 0.0;
          auVar296._12_4_ = auVar256._12_4_ + auVar371._12_4_ * 0.0;
          auVar296._16_4_ = auVar256._16_4_ + auVar371._16_4_ * 0.0;
          auVar296._20_4_ = auVar256._20_4_ + auVar371._20_4_ * 0.0;
          auVar296._24_4_ = auVar256._24_4_ + auVar371._24_4_ * 0.0;
          auVar296._28_4_ = auVar256._28_4_ + fVar249;
          auVar158 = vfmadd213ps_fma(auVar256,auVar187,auVar371);
          auVar155 = vfmadd231ps_fma(auVar296,auVar159,auVar187);
          auVar156 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar187,auVar159);
          auVar190 = ZEXT832(0) << 0x20;
          auVar136._4_4_ = auVar310._4_4_ * 0.0;
          auVar136._0_4_ = auVar310._0_4_ * 0.0;
          auVar136._8_4_ = auVar310._8_4_ * 0.0;
          auVar136._12_4_ = auVar310._12_4_ * 0.0;
          auVar136._16_4_ = auVar310._16_4_ * 0.0;
          auVar136._20_4_ = auVar310._20_4_ * 0.0;
          auVar136._24_4_ = auVar310._24_4_ * 0.0;
          auVar136._28_4_ = fVar248;
          auVar158 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar176,auVar136);
          auVar366._0_4_ = auVar176._0_4_ + auVar310._0_4_ * 0.0;
          auVar366._4_4_ = auVar176._4_4_ + auVar310._4_4_ * 0.0;
          auVar366._8_4_ = auVar176._8_4_ + auVar310._8_4_ * 0.0;
          auVar366._12_4_ = auVar176._12_4_ + auVar310._12_4_ * 0.0;
          auVar366._16_4_ = auVar176._16_4_ + auVar310._16_4_ * 0.0;
          auVar366._20_4_ = auVar176._20_4_ + auVar310._20_4_ * 0.0;
          auVar366._24_4_ = auVar176._24_4_ + auVar310._24_4_ * 0.0;
          auVar366._28_4_ = auVar176._28_4_ + fVar248;
          auVar154 = vfmadd213ps_fma(auVar176,auVar190,auVar310);
          auVar187 = vaddps_avx512vl(auVar185,ZEXT1632(auVar158));
          auVar176 = vfmadd231ps_avx512vl(auVar366,auVar185,auVar190);
          auVar177 = vfmadd231ps_avx512vl(ZEXT1632(auVar154),auVar190,auVar185);
          auVar137._4_4_ = auVar288._4_4_ * 0.0;
          auVar137._0_4_ = auVar288._0_4_ * 0.0;
          auVar137._8_4_ = auVar288._8_4_ * 0.0;
          auVar137._12_4_ = auVar288._12_4_ * 0.0;
          auVar137._16_4_ = auVar288._16_4_ * 0.0;
          auVar137._20_4_ = auVar288._20_4_ * 0.0;
          auVar137._24_4_ = auVar288._24_4_ * 0.0;
          auVar137._28_4_ = fVar248;
          auVar158 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar342,auVar137);
          auVar182 = vaddps_avx512vl(auVar342,auVar137);
          auVar154 = vfmadd213ps_fma(auVar342,auVar190,auVar288);
          auVar183 = vaddps_avx512vl(auVar315,ZEXT1632(auVar158));
          auVar182 = vfmadd231ps_avx512vl(auVar182,auVar315,auVar190);
          auVar157 = vfmadd231ps_fma(ZEXT1632(auVar154),auVar190,auVar315);
          auVar205 = ZEXT832(0) << 0x20;
          auVar179 = vaddps_avx512vl(auVar179,auVar205);
          auVar180 = vaddps_avx512vl(auVar180,auVar205);
          auVar185 = vaddps_avx512vl(auVar186,auVar205);
          auVar186 = vmulps_avx512vl(auVar183,auVar205);
          auVar190 = vmulps_avx512vl(auVar182,auVar205);
          auVar204 = vmulps_avx512vl(ZEXT1632(auVar157),auVar205);
          auVar158 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar187,auVar186);
          auVar154 = vfmadd213ps_fma(ZEXT832(0) << 0x20,auVar176,auVar190);
          auVar205 = vfmadd213ps_avx512vl(auVar205,auVar177,auVar204);
          auVar186 = vfmadd231ps_avx512vl(auVar186,auVar184,auVar187);
          auVar190 = vfmadd231ps_avx512vl(auVar190,auVar184,auVar176);
          auVar184 = vfmadd213ps_avx512vl(auVar184,auVar177,auVar204);
          auVar204 = vmulps_avx512vl(auVar189,auVar183);
          auVar206 = vmulps_avx512vl(auVar189,auVar182);
          auVar189 = vmulps_avx512vl(auVar189,ZEXT1632(auVar157));
          auVar204 = vfmadd231ps_avx512vl(auVar204,auVar188,auVar187);
          auVar206 = vfmadd231ps_avx512vl(auVar206,auVar188,auVar176);
          auVar188 = vfmadd231ps_avx512vl(auVar189,auVar177,auVar188);
          auVar183 = vmulps_avx512vl(auVar209,auVar183);
          auVar182 = vmulps_avx512vl(auVar209,auVar182);
          auVar189 = vmulps_avx512vl(auVar209,ZEXT1632(auVar157));
          auVar187 = vfmadd231ps_avx512vl(auVar183,auVar208,auVar187);
          auVar176 = vfmadd231ps_avx512vl(auVar182,auVar208,auVar176);
          auVar177 = vfmadd231ps_avx512vl(auVar189,auVar208,auVar177);
          auVar281._0_4_ = auVar153._0_4_ + auVar159._0_4_;
          auVar281._4_4_ = auVar153._4_4_ + auVar159._4_4_;
          auVar281._8_4_ = auVar153._8_4_ + auVar159._8_4_;
          auVar281._12_4_ = auVar153._12_4_ + auVar159._12_4_;
          auVar281._16_4_ = auVar159._16_4_ + 0.0;
          auVar281._20_4_ = auVar159._20_4_ + 0.0;
          auVar281._24_4_ = auVar159._24_4_ + 0.0;
          auVar281._28_4_ = auVar159._28_4_ + 0.0;
          auVar159 = vfmadd231ps_avx512vl(ZEXT1632(auVar158),auVar178,auVar281);
          auVar182 = vfmadd231ps_avx512vl(ZEXT1632(auVar154),auVar178,ZEXT1632(auVar155));
          auVar178 = vfmadd231ps_avx512vl(auVar205,ZEXT1632(auVar156),auVar178);
          auVar183 = vfmadd231ps_avx512vl(auVar186,auVar181,auVar281);
          auVar186 = vfmadd231ps_avx512vl(auVar190,auVar181,ZEXT1632(auVar155));
          auVar184 = vfmadd231ps_avx512vl(auVar184,ZEXT1632(auVar156),auVar181);
          auVar189 = vfmadd231ps_avx512vl(auVar204,auVar160,auVar281);
          auVar190 = vfmadd231ps_avx512vl(auVar206,auVar160,ZEXT1632(auVar155));
          auVar160 = vfmadd231ps_avx512vl(auVar188,ZEXT1632(auVar156),auVar160);
          auVar187 = vfmadd231ps_avx512vl(auVar187,auVar201,auVar281);
          auVar181 = vaddps_avx512vl(auVar179,auVar187);
          auVar187 = vfmadd231ps_avx512vl(auVar176,auVar201,ZEXT1632(auVar155));
          auVar188 = vaddps_avx512vl(auVar180,auVar187);
          auVar187 = vfmadd231ps_avx512vl(auVar177,auVar201,ZEXT1632(auVar156));
          fVar249 = auVar185._0_4_ + auVar187._0_4_;
          fVar257 = auVar185._4_4_ + auVar187._4_4_;
          fVar258 = auVar185._8_4_ + auVar187._8_4_;
          fVar259 = auVar185._12_4_ + auVar187._12_4_;
          fVar260 = auVar185._16_4_ + auVar187._16_4_;
          fVar261 = auVar185._20_4_ + auVar187._20_4_;
          fVar262 = auVar185._24_4_ + auVar187._24_4_;
          auVar187 = vmulps_avx512vl(auVar190,auVar184);
          auVar187 = vfmsub231ps_avx512vl(auVar187,auVar186,auVar160);
          auVar176 = vmulps_avx512vl(auVar160,auVar183);
          auVar177 = vfmsub231ps_avx512vl(auVar176,auVar184,auVar189);
          auVar176 = vmulps_avx512vl(auVar189,auVar186);
          auVar185 = vfmsub231ps_avx512vl(auVar176,auVar183,auVar190);
          auVar176 = vmulps_avx512vl(auVar178,auVar189);
          auVar201 = vfmsub231ps_avx512vl(auVar176,auVar159,auVar160);
          auVar176 = vmulps_avx512vl(auVar182,auVar160);
          auVar176 = vfmsub231ps_avx512vl(auVar176,auVar190,auVar178);
          auVar179 = vmulps_avx512vl(auVar159,auVar190);
          auVar189 = vfmsub231ps_avx512vl(auVar179,auVar182,auVar189);
          auVar138._4_4_ = auVar186._4_4_ * auVar178._4_4_;
          auVar138._0_4_ = auVar186._0_4_ * auVar178._0_4_;
          auVar138._8_4_ = auVar186._8_4_ * auVar178._8_4_;
          auVar138._12_4_ = auVar186._12_4_ * auVar178._12_4_;
          auVar138._16_4_ = auVar186._16_4_ * auVar178._16_4_;
          auVar138._20_4_ = auVar186._20_4_ * auVar178._20_4_;
          auVar138._24_4_ = auVar186._24_4_ * auVar178._24_4_;
          auVar138._28_4_ = auVar180._28_4_;
          auVar190 = vfmsub231ps_avx512vl(auVar138,auVar182,auVar184);
          auVar179 = vmulps_avx512vl(auVar184,auVar159);
          auVar153 = vfmsub231ps_fma(auVar179,auVar178,auVar183);
          auVar179 = vmulps_avx512vl(auVar183,auVar182);
          auVar183 = vfmsub231ps_avx512vl(auVar179,auVar159,auVar186);
          auVar178 = vmulps_avx512vl(auVar178,auVar185);
          auVar178 = vfmadd231ps_avx512vl(auVar178,auVar177,auVar182);
          auVar182 = vfmadd231ps_avx512vl(auVar178,auVar187,auVar159);
          auVar159 = vdivps_avx512vl(auVar187,auVar182);
          auVar187 = vdivps_avx512vl(auVar176,auVar182);
          auVar176 = vdivps_avx512vl(auVar190,auVar182);
          auVar177 = vdivps_avx512vl(auVar177,auVar182);
          auVar178 = vdivps_avx512vl(auVar201,auVar182);
          auVar179 = vdivps_avx512vl(ZEXT1632(auVar153),auVar182);
          auVar180 = vdivps_avx512vl(auVar185,auVar182);
          auVar160 = vdivps_avx512vl(auVar189,auVar182);
          auVar182 = vdivps_avx512vl(auVar183,auVar182);
          auVar139._4_4_ = fVar257 * auVar180._4_4_;
          auVar139._0_4_ = fVar249 * auVar180._0_4_;
          auVar139._8_4_ = fVar258 * auVar180._8_4_;
          auVar139._12_4_ = fVar259 * auVar180._12_4_;
          auVar139._16_4_ = fVar260 * auVar180._16_4_;
          auVar139._20_4_ = fVar261 * auVar180._20_4_;
          auVar139._24_4_ = fVar262 * auVar180._24_4_;
          auVar139._28_4_ = auVar201._28_4_;
          auVar140._4_4_ = fVar257 * auVar160._4_4_;
          auVar140._0_4_ = fVar249 * auVar160._0_4_;
          auVar140._8_4_ = fVar258 * auVar160._8_4_;
          auVar140._12_4_ = fVar259 * auVar160._12_4_;
          auVar140._16_4_ = fVar260 * auVar160._16_4_;
          auVar140._20_4_ = fVar261 * auVar160._20_4_;
          auVar140._24_4_ = fVar262 * auVar160._24_4_;
          auVar140._28_4_ = auVar189._28_4_;
          auVar141._4_4_ = fVar257 * auVar182._4_4_;
          auVar141._0_4_ = fVar249 * auVar182._0_4_;
          auVar141._8_4_ = fVar258 * auVar182._8_4_;
          auVar141._12_4_ = fVar259 * auVar182._12_4_;
          auVar141._16_4_ = fVar260 * auVar182._16_4_;
          auVar141._20_4_ = fVar261 * auVar182._20_4_;
          auVar141._24_4_ = fVar262 * auVar182._24_4_;
          auVar141._28_4_ = auVar190._28_4_;
          auVar153 = vfmadd231ps_fma(auVar139,auVar188,auVar177);
          auVar154 = vfmadd231ps_fma(auVar140,auVar188,auVar178);
          auVar158 = vfmadd231ps_fma(auVar141,auVar179,auVar188);
        }
        auVar155 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar181,auVar159);
        auVar154 = vfmadd231ps_fma(ZEXT1632(auVar154),auVar181,auVar187);
        auVar153 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar176,auVar181);
      }
      else {
        BVar2 = pGVar4->time_range;
        auVar250._8_8_ = 0;
        auVar250._0_4_ = BVar2.lower;
        auVar250._4_4_ = BVar2.upper;
        fVar249 = BVar2.lower;
        auVar272._4_4_ = fVar249;
        auVar272._0_4_ = fVar249;
        auVar272._8_4_ = fVar249;
        auVar272._12_4_ = fVar249;
        auVar272._16_4_ = fVar249;
        auVar272._20_4_ = fVar249;
        auVar272._24_4_ = fVar249;
        auVar272._28_4_ = fVar249;
        fVar249 = pGVar4->fnumTimeSegments;
        auVar159 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar272);
        auVar153 = vmovshdup_avx(auVar250);
        auVar289 = ZEXT1664(auVar153);
        auVar180 = ZEXT1632(auVar153);
        auVar153 = vsubps_avx(auVar153,auVar250);
        auVar251._0_4_ = auVar153._0_4_;
        auVar251._4_4_ = auVar251._0_4_;
        auVar251._8_4_ = auVar251._0_4_;
        auVar251._12_4_ = auVar251._0_4_;
        auVar251._16_4_ = auVar251._0_4_;
        auVar251._20_4_ = auVar251._0_4_;
        auVar251._24_4_ = auVar251._0_4_;
        auVar251._28_4_ = auVar251._0_4_;
        auVar159 = vdivps_avx(auVar159,auVar251);
        auVar56._4_4_ = fVar249 * auVar159._4_4_;
        auVar56._0_4_ = fVar249 * auVar159._0_4_;
        auVar56._8_4_ = fVar249 * auVar159._8_4_;
        auVar56._12_4_ = fVar249 * auVar159._12_4_;
        auVar56._16_4_ = fVar249 * auVar159._16_4_;
        auVar56._20_4_ = fVar249 * auVar159._20_4_;
        auVar56._24_4_ = fVar249 * auVar159._24_4_;
        auVar56._28_4_ = auVar159._28_4_;
        auVar159 = vroundps_avx(auVar56,1);
        fVar249 = fVar249 + -1.0;
        auVar277._4_4_ = fVar249;
        auVar277._0_4_ = fVar249;
        auVar277._8_4_ = fVar249;
        auVar277._12_4_ = fVar249;
        auVar277._16_4_ = fVar249;
        auVar277._20_4_ = fVar249;
        auVar277._24_4_ = fVar249;
        auVar277._28_4_ = fVar249;
        auVar159 = vminps_avx(auVar159,auVar277);
        auVar144 = ZEXT412(0);
        auVar282 = ZEXT1264(auVar144) << 0x20;
        auVar179 = ZEXT1232(auVar144) << 0x20;
        auVar159 = vmaxps_avx(auVar159,ZEXT1232(auVar144) << 0x20);
        auVar187 = vsubps_avx(auVar56,auVar159);
        auVar159 = vcvtps2dq_avx512vl(auVar159);
        local_100 = vmovdqa64_avx512vl(auVar159);
        uVar152 = 0;
        for (uVar233 = (uint)bVar145; (uVar233 & 1) == 0; uVar233 = uVar233 >> 1 | 0x80000000) {
          uVar152 = uVar152 + 1;
        }
        auVar160 = vpbroadcastd_avx512vl();
        uVar17 = vpcmpeqd_avx512vl(auVar159,auVar160);
        if ((byte)(~bVar145 | (byte)uVar17) == 0xff) {
          plVar1 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments +
                           (long)*(int *)(local_100 + (ulong)uVar152 * 4) * 0x38);
          iVar3 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 +
                          (long)*(int *)(local_100 + (ulong)uVar152 * 4) * 0x38);
          if (iVar3 == 0x9134) {
            lVar6 = *plVar1;
            lVar149 = plVar1[2] * uVar147;
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x10 + lVar149)),0x1c);
            auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar149)),0x28);
            auVar160 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x14 + lVar149)),0x1c);
            auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),0x28);
            auVar179 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),0x1c);
            auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar149)),0x28);
            auVar180 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x1c + lVar149)),0x1c);
            auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar149)),0x28);
            auVar176 = ZEXT1632(auVar153);
          }
          else if (iVar3 == 0x9234) {
            lVar6 = *plVar1;
            lVar149 = plVar1[2] * uVar147;
            auVar283._8_8_ = 0;
            auVar283._0_8_ = *(ulong *)(lVar6 + 4 + lVar149);
            auVar297._8_8_ = 0;
            auVar297._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
            auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar149)),_DAT_01fefe80,auVar283
                                         );
            auVar160 = ZEXT1632(auVar153);
            auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),_DAT_01fefe80,
                                          auVar297);
            auVar179 = ZEXT1632(auVar153);
            auVar298._8_8_ = 0;
            auVar298._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
            auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),_DAT_01fefe80,
                                          auVar298);
            auVar180 = ZEXT1632(auVar153);
            auVar299._8_8_ = 0;
            auVar299._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar149);
            auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),_DAT_01fefe80,
                                          auVar299);
            auVar176 = ZEXT1632(auVar153);
          }
          else if (iVar3 == 0xb001) {
            lVar6 = *plVar1;
            lVar149 = plVar1[2] * uVar147;
            auVar264._8_8_ = 0;
            auVar264._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
            auVar153 = vinsertps_avx(auVar264,ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),0x20);
            auVar265._8_8_ = 0;
            auVar265._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar149);
            auVar154 = vpermt2ps_avx512vl(auVar265,_DAT_01fefe90,ZEXT416(*(uint *)(lVar6 + lVar149))
                                         );
            auVar304._8_8_ = 0;
            auVar304._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
            fVar249 = *(float *)(lVar6 + 0x24 + lVar149);
            fVar257 = *(float *)(lVar6 + 0x28 + lVar149);
            fVar258 = *(float *)(lVar6 + 0x2c + lVar149);
            auVar155 = vpermt2ps_avx512vl(auVar304,_DAT_01fefe90,
                                          ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)));
            fVar259 = *(float *)(lVar6 + 0x30 + lVar149);
            auVar158 = vfmadd231ss_fma(ZEXT416((uint)(fVar257 * fVar257)),ZEXT416((uint)fVar249),
                                       ZEXT416((uint)fVar249));
            auVar158 = vfmadd231ss_fma(auVar158,ZEXT416((uint)fVar258),ZEXT416((uint)fVar258));
            auVar158 = vfmadd231ss_fma(auVar158,ZEXT416((uint)fVar259),ZEXT416((uint)fVar259));
            auVar156 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar158._0_4_));
            fVar260 = auVar156._0_4_;
            fVar260 = fVar260 * 1.5 + fVar260 * fVar260 * fVar260 * auVar158._0_4_ * -0.5;
            auVar158 = vinsertps_avx(auVar155,ZEXT416((uint)(fVar249 * fVar260)),0x30);
            auVar176 = ZEXT1632(auVar158);
            auVar158 = vinsertps_avx(auVar154,ZEXT416((uint)(fVar257 * fVar260)),0x30);
            auVar160 = ZEXT1632(auVar158);
            auVar153 = vinsertps_avx(auVar153,ZEXT416((uint)(fVar259 * fVar260)),0x30);
            auVar180 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),0x10);
            auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar149)),0x20);
            auVar153 = vinsertps_avx(auVar153,ZEXT416((uint)(fVar258 * fVar260)),0x30);
            auVar179 = ZEXT1632(auVar153);
          }
          else if (iVar3 == 0x9244) {
            lVar6 = *plVar1;
            lVar149 = plVar1[2] * uVar147;
            auVar160 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + lVar149));
            auVar179 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar149));
            auVar180 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar149));
            auVar176 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar149));
          }
          auVar367._8_4_ = 1;
          auVar367._0_8_ = 0x100000001;
          auVar367._12_4_ = 1;
          auVar367._16_4_ = 1;
          auVar367._20_4_ = 1;
          auVar367._24_4_ = 1;
          auVar367._28_4_ = 1;
          auVar159 = vbroadcastss_avx512vl(ZEXT416(2));
          iVar3 = (int)plVar1[0xb];
          if (iVar3 == 0x9134) {
            lVar6 = plVar1[7];
            lVar149 = uVar147 * plVar1[9];
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x10 + lVar149)),0x1c);
            auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar149)),0x28);
            auVar177 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x14 + lVar149)),0x1c);
            auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),0x28);
            auVar178 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),0x1c);
            auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar149)),0x28);
            auVar183 = ZEXT1632(auVar153);
            auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                     ZEXT416(*(uint *)(lVar6 + 0x1c + lVar149)),0x1c);
            auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar149)),0x28);
            auVar181 = ZEXT1632(auVar153);
          }
          else {
            auVar162._16_16_ = auVar159._16_16_;
            if (iVar3 == 0x9234) {
              lVar6 = plVar1[7];
              lVar149 = uVar147 * plVar1[9];
              auVar290._8_8_ = 0;
              auVar290._0_8_ = *(ulong *)(lVar6 + 4 + lVar149);
              auVar305._8_8_ = 0;
              auVar305._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar149)),_DAT_01fefe80,
                                            auVar290);
              auVar177 = ZEXT1632(auVar153);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),_DAT_01fefe80,
                                            auVar305);
              auVar178 = ZEXT1632(auVar153);
              auVar291._8_8_ = 0;
              auVar291._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),_DAT_01fefe80
                                            ,auVar291);
              auVar183 = ZEXT1632(auVar153);
              auVar292._8_8_ = 0;
              auVar292._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar149);
              auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),_DAT_01fefe80
                                            ,auVar292);
              auVar181 = ZEXT1632(auVar153);
            }
            else if (iVar3 == 0xb001) {
              lVar6 = plVar1[7];
              lVar149 = uVar147 * plVar1[9];
              auVar293._8_8_ = 0;
              auVar293._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
              auVar153 = vinsertps_avx(auVar293,ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),0x20);
              auVar300._8_8_ = 0;
              auVar300._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar149);
              auVar154 = vpermt2ps_avx512vl(auVar300,_DAT_01fefe90,
                                            ZEXT416(*(uint *)(lVar6 + lVar149)));
              auVar331._8_8_ = 0;
              auVar331._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
              fVar249 = *(float *)(lVar6 + 0x24 + lVar149);
              fVar257 = *(float *)(lVar6 + 0x28 + lVar149);
              fVar258 = *(float *)(lVar6 + 0x2c + lVar149);
              auVar155 = vpermt2ps_avx512vl(auVar331,_DAT_01fefe90,
                                            ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)));
              fVar259 = *(float *)(lVar6 + 0x30 + lVar149);
              auVar158 = vfmadd231ss_fma(ZEXT416((uint)(fVar257 * fVar257)),ZEXT416((uint)fVar249),
                                         ZEXT416((uint)fVar249));
              auVar158 = vfmadd231ss_fma(auVar158,ZEXT416((uint)fVar258),ZEXT416((uint)fVar258));
              auVar158 = vfmadd231ss_fma(auVar158,ZEXT416((uint)fVar259),ZEXT416((uint)fVar259));
              auVar162._0_16_ = ZEXT816(0) << 0x40;
              auVar161._4_28_ = auVar162._4_28_;
              auVar161._0_4_ = auVar158._0_4_;
              auVar156 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar161._0_16_);
              auVar157 = vmulss_avx512f(auVar156,ZEXT416(0x3fc00000));
              fVar260 = auVar156._0_4_;
              auVar158 = vaddss_avx512f(auVar157,ZEXT416((uint)(fVar260 * fVar260 *
                                                               fVar260 * auVar158._0_4_ * -0.5)));
              fVar260 = auVar158._0_4_;
              auVar158 = vinsertps_avx512f(auVar155,ZEXT416((uint)(fVar249 * fVar260)),0x30);
              auVar181 = ZEXT1632(auVar158);
              auVar158 = vinsertps_avx(auVar154,ZEXT416((uint)(fVar257 * fVar260)),0x30);
              auVar177 = ZEXT1632(auVar158);
              auVar153 = vinsertps_avx512f(auVar153,ZEXT416((uint)(fVar259 * fVar260)),0x30);
              auVar183 = ZEXT1632(auVar153);
              auVar153 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                       ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),0x10);
              auVar153 = vinsertps_avx(auVar153,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar149)),0x20);
              auVar153 = vinsertps_avx512f(auVar153,ZEXT416((uint)(fVar258 * fVar260)),0x30);
              auVar178 = ZEXT1632(auVar153);
            }
            else if (iVar3 == 0x9244) {
              lVar6 = plVar1[7];
              lVar149 = uVar147 * plVar1[9];
              auVar177 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + lVar149));
              auVar178 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar149));
              auVar183 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar149));
              auVar181 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar149));
            }
          }
          uVar263 = auVar160._0_4_;
          auVar195._4_4_ = uVar263;
          auVar195._0_4_ = uVar263;
          auVar195._8_4_ = uVar263;
          auVar195._12_4_ = uVar263;
          auVar195._16_4_ = uVar263;
          auVar195._20_4_ = uVar263;
          auVar195._24_4_ = uVar263;
          auVar195._28_4_ = uVar263;
          auVar196 = vpermps_avx2(auVar367,auVar160);
          auVar163 = vpermps_avx512vl(auVar159,auVar160);
          uVar263 = auVar179._0_4_;
          auVar197._4_4_ = uVar263;
          auVar197._0_4_ = uVar263;
          auVar197._8_4_ = uVar263;
          auVar197._12_4_ = uVar263;
          auVar197._16_4_ = uVar263;
          auVar197._20_4_ = uVar263;
          auVar197._24_4_ = uVar263;
          auVar197._28_4_ = uVar263;
          auVar198 = vpermps_avx2(auVar367,auVar179);
          auVar164 = vpermps_avx512vl(auVar159,auVar179);
          uVar263 = auVar180._0_4_;
          in_ZMM6 = ZEXT3264(CONCAT428(uVar263,CONCAT424(uVar263,CONCAT420(uVar263,CONCAT416(uVar263
                                                  ,CONCAT412(uVar263,CONCAT48(uVar263,CONCAT44(
                                                  uVar263,uVar263))))))));
          auVar199 = vpermps_avx2(auVar367,auVar180);
          auVar165 = vpermps_avx512vl(auVar159,auVar180);
          uVar263 = auVar176._0_4_;
          auVar289 = ZEXT3264(CONCAT428(uVar263,CONCAT424(uVar263,CONCAT420(uVar263,CONCAT416(
                                                  uVar263,CONCAT412(uVar263,CONCAT48(uVar263,
                                                  CONCAT44(uVar263,uVar263))))))));
          auVar200 = vpermps_avx2(auVar367,auVar176);
          auVar166 = vpermps_avx512vl(auVar159,auVar176);
          auVar167 = vbroadcastss_avx512vl(auVar177._0_16_);
          auVar168 = vpermps_avx512vl(auVar367,auVar177);
          auVar169 = vpermps_avx512vl(auVar159,auVar177);
          auVar170 = vbroadcastss_avx512vl(auVar178._0_16_);
          auVar171 = vpermps_avx512vl(auVar367,auVar178);
          auVar172 = vpermps_avx512vl(auVar159,auVar178);
          auVar173 = vbroadcastss_avx512vl(auVar183._0_16_);
          auVar174 = vpermps_avx512vl(auVar367,auVar183);
          auVar175 = vpermps_avx512vl(auVar159,auVar183);
          auVar176 = vbroadcastss_avx512vl(auVar181._0_16_);
          in_ZMM15 = ZEXT3264(auVar176);
          auVar176 = vpermps_avx512vl(auVar367,auVar181);
          in_ZMM14 = ZEXT3264(auVar176);
          auVar159 = vpermps_avx512vl(auVar159,auVar181);
          in_ZMM13 = ZEXT3264(auVar159);
        }
        else {
          auVar176 = vbroadcastss_avx512vl(ZEXT416(2));
          auVar387 = ZEXT3264(auVar176);
          uVar152 = uVar146;
          local_280 = auVar181;
          local_260 = auVar181;
          _local_240 = auVar181;
          local_220 = auVar181;
          _local_200 = auVar181;
          do {
            uVar233 = 0;
            for (uVar148 = uVar152 & 0xff; (uVar148 & 1) == 0; uVar148 = uVar148 >> 1 | 0x80000000)
            {
              uVar233 = uVar233 + 1;
            }
            plVar1 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments +
                             (long)*(int *)(local_100 + (ulong)uVar233 * 4) * 0x38);
            iVar3 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 +
                            (long)*(int *)(local_100 + (ulong)uVar233 * 4) * 0x38);
            if (iVar3 == 0x9134) {
              lVar6 = *plVar1;
              lVar149 = plVar1[2] * uVar147;
              auVar153 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + lVar149)),
                                           ZEXT416(*(uint *)(lVar6 + 0x10 + lVar149)),0x1c);
              auVar158 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar149)),0x28)
              ;
              auVar153 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),
                                           ZEXT416(*(uint *)(lVar6 + 0x14 + lVar149)),0x1c);
              auVar154 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),0x28)
              ;
              auVar153 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),
                                           ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),0x1c);
              auVar155 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar149)),0x28)
              ;
              auVar153 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                           ZEXT416(*(uint *)(lVar6 + 0x1c + lVar149)),0x1c);
              auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar149)),0x28)
              ;
LAB_008f24ec:
              local_220 = ZEXT1632(auVar158);
              _local_240 = ZEXT1632(auVar154);
              local_260 = ZEXT1632(auVar155);
              _local_200 = ZEXT1632(auVar153);
            }
            else {
              auVar192._16_16_ = in_ZMM30._16_16_;
              if (iVar3 == 0x9234) {
                lVar6 = *plVar1;
                lVar149 = plVar1[2] * uVar147;
                auVar384._8_8_ = 0;
                auVar384._0_8_ = *(ulong *)(lVar6 + 4 + lVar149);
                auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar149)),_DAT_01fefe80,
                                              auVar384);
                local_220 = ZEXT1632(auVar153);
                auVar377._8_8_ = 0;
                auVar377._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
                auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                              _DAT_01fefe80,auVar377);
                _local_240 = ZEXT1632(auVar153);
                auVar374._8_8_ = 0;
                auVar374._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
                auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),
                                              _DAT_01fefe80,auVar374);
                local_260 = ZEXT1632(auVar153);
                auVar375._8_8_ = 0;
                auVar375._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar149);
                auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),
                                              _DAT_01fefe80,auVar375);
                _local_200 = ZEXT1632(auVar153);
              }
              else if (iVar3 == 0xb001) {
                lVar6 = *plVar1;
                lVar149 = plVar1[2] * uVar147;
                auVar378._8_8_ = 0;
                auVar378._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
                auVar153 = vinsertps_avx512f(auVar378,ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),0x20);
                auVar381._8_8_ = 0;
                auVar381._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar149);
                auVar154 = vpermt2ps_avx512vl(auVar381,_DAT_01fefe90,
                                              ZEXT416(*(uint *)(lVar6 + lVar149)));
                auVar385._8_8_ = 0;
                auVar385._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
                auVar158 = vpermt2ps_avx512vl(auVar385,_DAT_01fefe90,
                                              ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)));
                uVar233 = *(uint *)(lVar6 + 0x24 + lVar149);
                uVar148 = *(uint *)(lVar6 + 0x28 + lVar149);
                uVar234 = *(uint *)(lVar6 + 0x2c + lVar149);
                uVar235 = *(uint *)(lVar6 + 0x30 + lVar149);
                auVar155 = vmulss_avx512f(ZEXT416(uVar148),ZEXT416(uVar148));
                auVar155 = vfmadd231ss_avx512f(auVar155,ZEXT416(uVar233),ZEXT416(uVar233));
                auVar155 = vfmadd231ss_avx512f(auVar155,ZEXT416(uVar234),ZEXT416(uVar234));
                auVar156 = ZEXT416(uVar235);
                auVar155 = vfmadd231ss_avx512f(auVar155,auVar156,auVar156);
                auVar192._0_16_ = vxorps_avx512vl(auVar156,auVar156);
                auVar191._4_28_ = auVar192._4_28_;
                auVar191._0_4_ = auVar155._0_4_;
                auVar156 = vrsqrt14ss_avx512f(auVar192._0_16_,auVar191._0_16_);
                auVar157 = vmulss_avx512f(auVar156,ZEXT416(0x3fc00000));
                auVar155 = vmulss_avx512f(auVar155,ZEXT416(0xbf000000));
                auVar155 = vmulss_avx512f(auVar156,auVar155);
                auVar156 = vmulss_avx512f(auVar156,auVar156);
                auVar155 = vmulss_avx512f(auVar156,auVar155);
                auVar176 = vbroadcastss_avx512vl(ZEXT416(2));
                auVar387 = ZEXT3264(auVar176);
                auVar155 = vaddss_avx512f(auVar157,auVar155);
                auVar156 = vmulss_avx512f(ZEXT416(uVar233),auVar155);
                auVar158 = vinsertps_avx512f(auVar158,auVar156,0x30);
                _local_200 = ZEXT1632(auVar158);
                auVar158 = vmulss_avx512f(auVar155,ZEXT416(uVar148));
                auVar158 = vinsertps_avx512f(auVar154,auVar158,0x30);
                local_220 = ZEXT1632(auVar158);
                auVar158 = vmulss_avx512f(auVar155,ZEXT416(uVar234));
                auVar154 = vmulss_avx512f(auVar155,ZEXT416(uVar235));
                auVar153 = vinsertps_avx512f(auVar153,auVar154,0x30);
                local_260 = ZEXT1632(auVar153);
                auVar153 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                             ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),0x10);
                auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar149)),
                                             0x20);
                auVar153 = vinsertps_avx512f(auVar153,auVar158,0x30);
                _local_240 = ZEXT1632(auVar153);
              }
              else if (iVar3 == 0x9244) {
                lVar6 = *plVar1;
                lVar149 = plVar1[2] * uVar147;
                auVar158 = *(undefined1 (*) [16])(lVar6 + lVar149);
                auVar154 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar149);
                auVar155 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar149);
                auVar153 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar149);
                goto LAB_008f24ec;
              }
            }
            auVar176 = vpbroadcastd_avx512vl();
            uVar17 = vpcmpeqd_avx512vl(auVar176,auVar159);
            iVar3 = (int)plVar1[0xb];
            if (iVar3 == 0x9134) {
              lVar6 = plVar1[7];
              lVar149 = plVar1[9] * uVar147;
              auVar153 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + lVar149)),
                                           ZEXT416(*(uint *)(lVar6 + 0x10 + lVar149)),0x1c);
              auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar149)),0x28)
              ;
              in_ZMM28 = ZEXT1664(auVar153);
              auVar153 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),
                                           ZEXT416(*(uint *)(lVar6 + 0x14 + lVar149)),0x1c);
              auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),0x28)
              ;
              in_ZMM27 = ZEXT1664(auVar153);
              auVar153 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),
                                           ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),0x1c);
              auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar149)),0x28)
              ;
              local_280 = ZEXT1632(auVar153);
              auVar153 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                           ZEXT416(*(uint *)(lVar6 + 0x1c + lVar149)),0x1c);
              auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar149)),0x28)
              ;
              in_ZMM30 = ZEXT1664(auVar153);
            }
            else {
              auVar194._16_16_ = auVar176._16_16_;
              if (iVar3 == 0x9234) {
                lVar6 = plVar1[7];
                lVar149 = plVar1[9] * uVar147;
                local_280._8_8_ = 0;
                local_280._0_8_ = *(ulong *)(lVar6 + 4 + lVar149);
                auVar153 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar149)),_DAT_01fefe80,
                                              local_280._0_16_);
                auVar382._8_8_ = 0;
                auVar382._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
                auVar158 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                              _DAT_01fefe80,auVar382);
                in_ZMM27 = ZEXT1664(auVar158);
                auVar379._8_8_ = 0;
                auVar379._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
                auVar158 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)),
                                              _DAT_01fefe80,auVar379);
                local_280 = ZEXT1632(auVar158);
                auVar380._8_8_ = 0;
                auVar380._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar149);
                auVar158 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar149)),
                                              _DAT_01fefe80,auVar380);
                in_ZMM30 = ZEXT1664(auVar158);
                in_ZMM28 = ZEXT1664(auVar153);
              }
              else if (iVar3 == 0xb001) {
                lVar6 = plVar1[7];
                lVar149 = plVar1[9] * uVar147;
                auVar376._8_8_ = 0;
                auVar376._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar149);
                auVar153 = vinsertps_avx512f(auVar376,ZEXT416(*(uint *)(lVar6 + 8 + lVar149)),0x20);
                auVar383._8_8_ = 0;
                auVar383._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar149);
                auVar154 = vpermt2ps_avx512vl(auVar383,_DAT_01fefe90,
                                              ZEXT416(*(uint *)(lVar6 + lVar149)));
                auVar386._8_8_ = 0;
                auVar386._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar149);
                auVar158 = vpermt2ps_avx512vl(auVar386,_DAT_01fefe90,
                                              ZEXT416(*(uint *)(lVar6 + 0x18 + lVar149)));
                uVar233 = *(uint *)(lVar6 + 0x24 + lVar149);
                uVar148 = *(uint *)(lVar6 + 0x28 + lVar149);
                uVar234 = *(uint *)(lVar6 + 0x2c + lVar149);
                uVar235 = *(uint *)(lVar6 + 0x30 + lVar149);
                auVar155 = vmulss_avx512f(ZEXT416(uVar148),ZEXT416(uVar148));
                auVar155 = vfmadd231ss_avx512f(auVar155,ZEXT416(uVar233),ZEXT416(uVar233));
                auVar155 = vfmadd231ss_avx512f(auVar155,ZEXT416(uVar234),ZEXT416(uVar234));
                auVar156 = ZEXT416(uVar235);
                auVar155 = vfmadd231ss_avx512f(auVar155,auVar156,auVar156);
                auVar194._0_16_ = vxorps_avx512vl(auVar156,auVar156);
                auVar193._4_28_ = auVar194._4_28_;
                auVar193._0_4_ = auVar155._0_4_;
                auVar156 = vrsqrt14ss_avx512f(auVar194._0_16_,auVar193._0_16_);
                auVar157 = vmulss_avx512f(auVar156,ZEXT416(0x3fc00000));
                auVar155 = vmulss_avx512f(auVar155,ZEXT416(0xbf000000));
                auVar155 = vmulss_avx512f(auVar156,auVar155);
                auVar156 = vmulss_avx512f(auVar156,auVar156);
                auVar155 = vmulss_avx512f(auVar156,auVar155);
                auVar155 = vaddss_avx512f(auVar157,auVar155);
                auVar156 = vmulss_avx512f(ZEXT416(uVar233),auVar155);
                auVar158 = vinsertps_avx512f(auVar158,auVar156,0x30);
                in_ZMM30 = ZEXT1664(auVar158);
                auVar176 = vbroadcastss_avx512vl(ZEXT416(2));
                auVar387 = ZEXT3264(auVar176);
                auVar158 = vmulss_avx512f(auVar155,ZEXT416(uVar148));
                auVar158 = vinsertps_avx512f(auVar154,auVar158,0x30);
                in_ZMM28 = ZEXT1664(auVar158);
                auVar158 = vmulss_avx512f(auVar155,ZEXT416(uVar234));
                auVar154 = vmulss_avx512f(auVar155,ZEXT416(uVar235));
                auVar153 = vinsertps_avx512f(auVar153,auVar154,0x30);
                local_280 = ZEXT1632(auVar153);
                auVar153 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar149)),
                                             ZEXT416(*(uint *)(lVar6 + 4 + lVar149)),0x10);
                auVar153 = vinsertps_avx512f(auVar153,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar149)),
                                             0x20);
                auVar153 = vinsertps_avx512f(auVar153,auVar158,0x30);
                in_ZMM27 = ZEXT1664(auVar153);
              }
              else {
                in_ZMM28 = ZEXT3264(in_ZMM28._0_32_);
                in_ZMM27 = ZEXT3264(in_ZMM27._0_32_);
                in_ZMM30 = ZEXT3264(in_ZMM30._0_32_);
                if (iVar3 == 0x9244) {
                  lVar6 = plVar1[7];
                  lVar149 = plVar1[9] * uVar147;
                  in_ZMM28 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + lVar149));
                  in_ZMM27 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar149));
                  auVar153 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar149));
                  local_280 = vmovdqa64_avx512vl(ZEXT1632(auVar153));
                  in_ZMM30 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar149));
                }
              }
            }
            bVar150 = (byte)uVar152 & (byte)uVar17;
            bVar145 = ~bVar150 & (byte)uVar152;
            uVar152 = (uint)bVar145;
            auVar176 = vbroadcastss_avx512vl(local_220._0_16_);
            auVar195._0_4_ =
                 (uint)(bVar150 & 1) * auVar176._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM12._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar195._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM12._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar195._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM12._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar195._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM12._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar195._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM12._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar195._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM12._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar195._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM12._24_4_;
            auVar195._28_4_ =
                 (uint)(bVar150 >> 7) * auVar176._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM12._28_4_;
            in_ZMM12 = ZEXT3264(auVar195);
            auVar176 = vbroadcastss_avx512vl(ZEXT416(1));
            auVar177 = vpermps_avx512vl(auVar176,local_220);
            auVar196._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM11._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar196._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM11._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar196._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM11._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar196._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM11._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar196._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM11._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar196._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM11._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar196._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM11._24_4_;
            auVar196._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM11._28_4_;
            in_ZMM11 = ZEXT3264(auVar196);
            auVar178 = auVar387._0_32_;
            auVar177 = vpermps_avx512vl(auVar178,local_220);
            auVar163._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM10._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar163._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM10._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar163._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM10._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar163._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM10._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar163._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM10._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar163._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM10._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar163._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM10._24_4_;
            auVar163._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM10._28_4_;
            in_ZMM10 = ZEXT3264(auVar163);
            auVar177 = vbroadcastss_avx512vl(local_240._0_16_);
            auVar197._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM9._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar197._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM9._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar197._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM9._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar197._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM9._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar197._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM9._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar197._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM9._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar197._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM9._24_4_;
            auVar197._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM9._28_4_;
            in_ZMM9 = ZEXT3264(auVar197);
            auVar177 = vpermps_avx512vl(auVar176,_local_240);
            auVar198._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM8._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar198._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM8._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar198._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM8._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar198._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM8._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar198._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM8._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar198._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM8._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar198._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM8._24_4_;
            auVar198._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM8._28_4_;
            in_ZMM8 = ZEXT3264(auVar198);
            auVar177 = vpermps_avx512vl(auVar178,_local_240);
            auVar164._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM7._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar164._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM7._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar164._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM7._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar164._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM7._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar164._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM7._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar164._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM7._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar164._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM7._24_4_;
            auVar164._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM7._28_4_;
            in_ZMM7 = ZEXT3264(auVar164);
            auVar177 = vbroadcastss_avx512vl(local_260._0_16_);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            in_ZMM6 = ZEXT3264(CONCAT428((uint)(bVar150 >> 7) * auVar177._28_4_ |
                                         (uint)!(bool)(bVar150 >> 7) * in_ZMM6._28_4_,
                                         CONCAT424((uint)bVar12 * auVar177._24_4_ |
                                                   (uint)!bVar12 * in_ZMM6._24_4_,
                                                   CONCAT420((uint)bVar11 * auVar177._20_4_ |
                                                             (uint)!bVar11 * in_ZMM6._20_4_,
                                                             CONCAT416((uint)bVar10 *
                                                                       auVar177._16_4_ |
                                                                       (uint)!bVar10 *
                                                                       in_ZMM6._16_4_,
                                                                       CONCAT412((uint)bVar9 *
                                                                                 auVar177._12_4_ |
                                                                                 (uint)!bVar9 *
                                                                                 in_ZMM6._12_4_,
                                                                                 CONCAT48((uint)
                                                  bVar8 * auVar177._8_4_ |
                                                  (uint)!bVar8 * in_ZMM6._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar177._4_4_ |
                                                           (uint)!bVar7 * in_ZMM6._4_4_,
                                                           (uint)(bVar150 & 1) * auVar177._0_4_ |
                                                           (uint)!(bool)(bVar150 & 1) *
                                                           in_ZMM6._0_4_))))))));
            auVar177 = vpermps_avx512vl(auVar176,local_260);
            auVar199._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM5._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar199._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM5._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar199._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM5._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar199._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM5._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar199._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM5._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar199._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM5._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar199._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM5._24_4_;
            auVar199._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM5._28_4_;
            in_ZMM5 = ZEXT3264(auVar199);
            auVar177 = vpermps_avx512vl(auVar178,local_260);
            auVar165._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM4._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar165._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM4._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar165._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM4._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar165._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM4._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar165._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM4._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar165._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM4._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar165._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM4._24_4_;
            auVar165._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM4._28_4_;
            in_ZMM4 = ZEXT3264(auVar165);
            auVar177 = vbroadcastss_avx512vl(local_200._0_16_);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            auVar289 = ZEXT3264(CONCAT428((uint)(bVar150 >> 7) * auVar177._28_4_ |
                                          (uint)!(bool)(bVar150 >> 7) * auVar289._28_4_,
                                          CONCAT424((uint)bVar12 * auVar177._24_4_ |
                                                    (uint)!bVar12 * auVar289._24_4_,
                                                    CONCAT420((uint)bVar11 * auVar177._20_4_ |
                                                              (uint)!bVar11 * auVar289._20_4_,
                                                              CONCAT416((uint)bVar10 *
                                                                        auVar177._16_4_ |
                                                                        (uint)!bVar10 *
                                                                        auVar289._16_4_,
                                                                        CONCAT412((uint)bVar9 *
                                                                                  auVar177._12_4_ |
                                                                                  (uint)!bVar9 *
                                                                                  auVar289._12_4_,
                                                                                  CONCAT48((uint)
                                                  bVar8 * auVar177._8_4_ |
                                                  (uint)!bVar8 * auVar289._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar177._4_4_ |
                                                           (uint)!bVar7 * auVar289._4_4_,
                                                           (uint)(bVar150 & 1) * auVar177._0_4_ |
                                                           (uint)!(bool)(bVar150 & 1) *
                                                           auVar289._0_4_))))))));
            auVar177 = vpermps_avx512vl(auVar176,_local_200);
            auVar200._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * auVar282._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar200._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * auVar282._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar200._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * auVar282._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar200._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * auVar282._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar200._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * auVar282._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar200._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * auVar282._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar200._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * auVar282._24_4_;
            auVar200._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * auVar282._28_4_;
            auVar282 = ZEXT3264(auVar200);
            auVar177 = vpermps_avx512vl(auVar178,_local_200);
            auVar166._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * auVar160._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar166._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * auVar160._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar166._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * auVar160._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar166._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * auVar160._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar166._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * auVar160._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar166._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * auVar160._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar166._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * auVar160._24_4_;
            auVar166._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * auVar160._28_4_;
            auVar177 = vbroadcastss_avx512vl(in_ZMM28._0_16_);
            auVar167._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM24._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar167._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM24._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar167._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM24._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar167._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM24._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar167._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM24._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar167._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM24._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar167._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM24._24_4_;
            auVar167._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM24._28_4_;
            in_ZMM24 = ZEXT3264(auVar167);
            auVar177 = vpermps_avx512vl(auVar176,in_ZMM28._0_32_);
            auVar168._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM23._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar168._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM23._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar168._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM23._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar168._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM23._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar168._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM23._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar168._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM23._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar168._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM23._24_4_;
            auVar168._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM23._28_4_;
            in_ZMM23 = ZEXT3264(auVar168);
            auVar177 = vpermps_avx512vl(auVar178,in_ZMM28._0_32_);
            auVar169._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM22._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar169._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM22._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar169._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM22._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar169._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM22._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar169._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM22._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar169._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM22._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar169._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM22._24_4_;
            auVar169._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM22._28_4_;
            in_ZMM22 = ZEXT3264(auVar169);
            auVar177 = vbroadcastss_avx512vl(in_ZMM27._0_16_);
            auVar170._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM21._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar170._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM21._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar170._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM21._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar170._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM21._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar170._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM21._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar170._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM21._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar170._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM21._24_4_;
            auVar170._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM21._28_4_;
            in_ZMM21 = ZEXT3264(auVar170);
            auVar177 = vpermps_avx512vl(auVar176,in_ZMM27._0_32_);
            auVar171._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM20._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar171._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM20._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar171._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM20._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar171._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM20._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar171._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM20._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar171._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM20._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar171._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM20._24_4_;
            auVar171._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM20._28_4_;
            in_ZMM20 = ZEXT3264(auVar171);
            auVar177 = vpermps_avx512vl(auVar178,in_ZMM27._0_32_);
            auVar172._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM19._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar172._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM19._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar172._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM19._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar172._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM19._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar172._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM19._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar172._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM19._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar172._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM19._24_4_;
            auVar172._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM19._28_4_;
            in_ZMM19 = ZEXT3264(auVar172);
            auVar177 = vbroadcastss_avx512vl(local_280._0_16_);
            auVar173._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM18._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar173._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM18._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar173._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM18._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar173._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM18._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar173._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM18._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar173._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM18._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar173._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM18._24_4_;
            auVar173._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM18._28_4_;
            in_ZMM18 = ZEXT3264(auVar173);
            auVar177 = vpermps_avx512vl(auVar176,local_280);
            auVar174._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM17._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar174._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM17._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar174._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM17._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar174._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM17._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar174._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM17._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar174._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM17._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar174._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM17._24_4_;
            auVar174._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM17._28_4_;
            in_ZMM17 = ZEXT3264(auVar174);
            auVar177 = vpermps_avx512vl(auVar178,local_280);
            auVar175._0_4_ =
                 (uint)(bVar150 & 1) * auVar177._0_4_ | (uint)!(bool)(bVar150 & 1) * in_ZMM16._0_4_;
            bVar7 = (bool)(bVar150 >> 1 & 1);
            auVar175._4_4_ = (uint)bVar7 * auVar177._4_4_ | (uint)!bVar7 * in_ZMM16._4_4_;
            bVar7 = (bool)(bVar150 >> 2 & 1);
            auVar175._8_4_ = (uint)bVar7 * auVar177._8_4_ | (uint)!bVar7 * in_ZMM16._8_4_;
            bVar7 = (bool)(bVar150 >> 3 & 1);
            auVar175._12_4_ = (uint)bVar7 * auVar177._12_4_ | (uint)!bVar7 * in_ZMM16._12_4_;
            bVar7 = (bool)(bVar150 >> 4 & 1);
            auVar175._16_4_ = (uint)bVar7 * auVar177._16_4_ | (uint)!bVar7 * in_ZMM16._16_4_;
            bVar7 = (bool)(bVar150 >> 5 & 1);
            auVar175._20_4_ = (uint)bVar7 * auVar177._20_4_ | (uint)!bVar7 * in_ZMM16._20_4_;
            bVar7 = (bool)(bVar150 >> 6 & 1);
            auVar175._24_4_ = (uint)bVar7 * auVar177._24_4_ | (uint)!bVar7 * in_ZMM16._24_4_;
            auVar175._28_4_ =
                 (uint)(bVar150 >> 7) * auVar177._28_4_ |
                 (uint)!(bool)(bVar150 >> 7) * in_ZMM16._28_4_;
            in_ZMM16 = ZEXT3264(auVar175);
            auVar177 = vbroadcastss_avx512vl(in_ZMM30._0_16_);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            in_ZMM15 = ZEXT3264(CONCAT428((uint)(bVar150 >> 7) * auVar177._28_4_ |
                                          (uint)!(bool)(bVar150 >> 7) * in_ZMM15._28_4_,
                                          CONCAT424((uint)bVar12 * auVar177._24_4_ |
                                                    (uint)!bVar12 * in_ZMM15._24_4_,
                                                    CONCAT420((uint)bVar11 * auVar177._20_4_ |
                                                              (uint)!bVar11 * in_ZMM15._20_4_,
                                                              CONCAT416((uint)bVar10 *
                                                                        auVar177._16_4_ |
                                                                        (uint)!bVar10 *
                                                                        in_ZMM15._16_4_,
                                                                        CONCAT412((uint)bVar9 *
                                                                                  auVar177._12_4_ |
                                                                                  (uint)!bVar9 *
                                                                                  in_ZMM15._12_4_,
                                                                                  CONCAT48((uint)
                                                  bVar8 * auVar177._8_4_ |
                                                  (uint)!bVar8 * in_ZMM15._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar177._4_4_ |
                                                           (uint)!bVar7 * in_ZMM15._4_4_,
                                                           (uint)(bVar150 & 1) * auVar177._0_4_ |
                                                           (uint)!(bool)(bVar150 & 1) *
                                                           in_ZMM15._0_4_))))))));
            auVar176 = vpermps_avx512vl(auVar176,in_ZMM30._0_32_);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            in_ZMM14 = ZEXT3264(CONCAT428((uint)(bVar150 >> 7) * auVar176._28_4_ |
                                          (uint)!(bool)(bVar150 >> 7) * in_ZMM14._28_4_,
                                          CONCAT424((uint)bVar12 * auVar176._24_4_ |
                                                    (uint)!bVar12 * in_ZMM14._24_4_,
                                                    CONCAT420((uint)bVar11 * auVar176._20_4_ |
                                                              (uint)!bVar11 * in_ZMM14._20_4_,
                                                              CONCAT416((uint)bVar10 *
                                                                        auVar176._16_4_ |
                                                                        (uint)!bVar10 *
                                                                        in_ZMM14._16_4_,
                                                                        CONCAT412((uint)bVar9 *
                                                                                  auVar176._12_4_ |
                                                                                  (uint)!bVar9 *
                                                                                  in_ZMM14._12_4_,
                                                                                  CONCAT48((uint)
                                                  bVar8 * auVar176._8_4_ |
                                                  (uint)!bVar8 * in_ZMM14._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar176._4_4_ |
                                                           (uint)!bVar7 * in_ZMM14._4_4_,
                                                           (uint)(bVar150 & 1) * auVar176._0_4_ |
                                                           (uint)!(bool)(bVar150 & 1) *
                                                           in_ZMM14._0_4_))))))));
            auVar176 = vpermps_avx512vl(auVar178,in_ZMM30._0_32_);
            bVar7 = (bool)(bVar150 >> 1 & 1);
            bVar8 = (bool)(bVar150 >> 2 & 1);
            bVar9 = (bool)(bVar150 >> 3 & 1);
            bVar10 = (bool)(bVar150 >> 4 & 1);
            bVar11 = (bool)(bVar150 >> 5 & 1);
            bVar12 = (bool)(bVar150 >> 6 & 1);
            in_ZMM13 = ZEXT3264(CONCAT428((uint)(bVar150 >> 7) * auVar176._28_4_ |
                                          (uint)!(bool)(bVar150 >> 7) * in_ZMM13._28_4_,
                                          CONCAT424((uint)bVar12 * auVar176._24_4_ |
                                                    (uint)!bVar12 * in_ZMM13._24_4_,
                                                    CONCAT420((uint)bVar11 * auVar176._20_4_ |
                                                              (uint)!bVar11 * in_ZMM13._20_4_,
                                                              CONCAT416((uint)bVar10 *
                                                                        auVar176._16_4_ |
                                                                        (uint)!bVar10 *
                                                                        in_ZMM13._16_4_,
                                                                        CONCAT412((uint)bVar9 *
                                                                                  auVar176._12_4_ |
                                                                                  (uint)!bVar9 *
                                                                                  in_ZMM13._12_4_,
                                                                                  CONCAT48((uint)
                                                  bVar8 * auVar176._8_4_ |
                                                  (uint)!bVar8 * in_ZMM13._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar176._4_4_ |
                                                           (uint)!bVar7 * in_ZMM13._4_4_,
                                                           (uint)(bVar150 & 1) * auVar176._0_4_ |
                                                           (uint)!(bool)(bVar150 & 1) *
                                                           in_ZMM13._0_4_))))))));
            auVar160 = auVar166;
          } while (bVar145 != 0);
        }
        auVar159 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar159 = vsubps_avx512vl(auVar159,auVar187);
        auVar176 = vmulps_avx512vl(auVar187,auVar167);
        auVar177 = vmulps_avx512vl(auVar187,auVar168);
        auVar178 = vmulps_avx512vl(auVar187,auVar169);
        auVar176 = vfmadd231ps_avx512vl(auVar176,auVar159,auVar195);
        auVar177 = vfmadd231ps_avx512vl(auVar177,auVar159,auVar196);
        auVar178 = vfmadd231ps_avx512vl(auVar178,auVar159,auVar163);
        auVar179 = vmulps_avx512vl(auVar187,auVar170);
        auVar180 = vmulps_avx512vl(auVar187,auVar171);
        auVar160 = vmulps_avx512vl(auVar187,auVar172);
        auVar179 = vfmadd231ps_avx512vl(auVar179,auVar159,auVar197);
        auVar180 = vfmadd231ps_avx512vl(auVar180,auVar159,auVar198);
        auVar181 = vfmadd231ps_avx512vl(auVar160,auVar159,auVar164);
        auVar160 = vmulps_avx512vl(auVar187,auVar173);
        auVar182 = vmulps_avx512vl(auVar187,auVar174);
        auVar183 = vmulps_avx512vl(auVar187,auVar175);
        auVar160 = vfmadd231ps_avx512vl(auVar160,auVar159,in_ZMM6._0_32_);
        auVar182 = vfmadd231ps_avx512vl(auVar182,auVar159,auVar199);
        auVar183 = vfmadd231ps_avx512vl(auVar183,auVar159,auVar165);
        fVar249 = auVar187._0_4_;
        auVar372._0_4_ = in_ZMM15._0_4_ * fVar249;
        fVar257 = auVar187._4_4_;
        auVar372._4_4_ = in_ZMM15._4_4_ * fVar257;
        fVar258 = auVar187._8_4_;
        auVar372._8_4_ = in_ZMM15._8_4_ * fVar258;
        fVar259 = auVar187._12_4_;
        auVar372._12_4_ = in_ZMM15._12_4_ * fVar259;
        fVar260 = auVar187._16_4_;
        auVar372._16_4_ = in_ZMM15._16_4_ * fVar260;
        fVar261 = auVar187._20_4_;
        auVar372._20_4_ = in_ZMM15._20_4_ * fVar261;
        fVar262 = auVar187._24_4_;
        auVar372._28_36_ = in_ZMM15._28_36_;
        auVar372._24_4_ = in_ZMM15._24_4_ * fVar262;
        auVar369._0_4_ = in_ZMM14._0_4_ * fVar249;
        auVar369._4_4_ = in_ZMM14._4_4_ * fVar257;
        auVar369._8_4_ = in_ZMM14._8_4_ * fVar258;
        auVar369._12_4_ = in_ZMM14._12_4_ * fVar259;
        auVar369._16_4_ = in_ZMM14._16_4_ * fVar260;
        auVar369._20_4_ = in_ZMM14._20_4_ * fVar261;
        auVar369._28_36_ = in_ZMM14._28_36_;
        auVar369._24_4_ = in_ZMM14._24_4_ * fVar262;
        auVar387._0_4_ = in_ZMM13._0_4_ * fVar249;
        auVar387._4_4_ = in_ZMM13._4_4_ * fVar257;
        auVar387._8_4_ = in_ZMM13._8_4_ * fVar258;
        auVar387._12_4_ = in_ZMM13._12_4_ * fVar259;
        auVar387._16_4_ = in_ZMM13._16_4_ * fVar260;
        auVar387._20_4_ = in_ZMM13._20_4_ * fVar261;
        auVar387._28_36_ = in_ZMM13._28_36_;
        auVar387._24_4_ = in_ZMM13._24_4_ * fVar262;
        auVar184 = vfmadd231ps_avx512vl(auVar372._0_32_,auVar159,auVar289._0_32_);
        auVar185 = vfmadd231ps_avx512vl(auVar369._0_32_,auVar159,auVar200);
        auVar186 = vfmadd231ps_avx512vl(auVar387._0_32_,auVar159,auVar166);
        auVar57._4_4_ = auVar182._4_4_ * auVar181._4_4_;
        auVar57._0_4_ = auVar182._0_4_ * auVar181._0_4_;
        auVar57._8_4_ = auVar182._8_4_ * auVar181._8_4_;
        auVar57._12_4_ = auVar182._12_4_ * auVar181._12_4_;
        auVar57._16_4_ = auVar182._16_4_ * auVar181._16_4_;
        auVar57._20_4_ = auVar182._20_4_ * auVar181._20_4_;
        auVar57._24_4_ = auVar182._24_4_ * auVar181._24_4_;
        auVar57._28_4_ = auVar187._28_4_;
        auVar153 = vfmsub231ps_fma(auVar57,auVar180,auVar183);
        auVar282._0_4_ = auVar183._0_4_ * auVar179._0_4_;
        auVar282._4_4_ = auVar183._4_4_ * auVar179._4_4_;
        auVar282._8_4_ = auVar183._8_4_ * auVar179._8_4_;
        auVar282._12_4_ = auVar183._12_4_ * auVar179._12_4_;
        auVar282._16_4_ = auVar183._16_4_ * auVar179._16_4_;
        auVar282._20_4_ = auVar183._20_4_ * auVar179._20_4_;
        auVar282._28_36_ = auVar289._28_36_;
        auVar282._24_4_ = auVar183._24_4_ * auVar179._24_4_;
        auVar158 = vfmsub231ps_fma(auVar282._0_32_,auVar181,auVar160);
        auVar289._0_4_ = auVar180._0_4_ * auVar160._0_4_;
        auVar289._4_4_ = auVar180._4_4_ * auVar160._4_4_;
        auVar289._8_4_ = auVar180._8_4_ * auVar160._8_4_;
        auVar289._12_4_ = auVar180._12_4_ * auVar160._12_4_;
        auVar289._16_4_ = auVar180._16_4_ * auVar160._16_4_;
        auVar289._20_4_ = auVar180._20_4_ * auVar160._20_4_;
        auVar289._28_36_ = in_ZMM6._28_36_;
        auVar289._24_4_ = auVar180._24_4_ * auVar160._24_4_;
        auVar154 = vfmsub231ps_fma(auVar289._0_32_,auVar179,auVar182);
        auVar159 = vmulps_avx512vl(auVar177,auVar183);
        auVar187 = vfmsub231ps_avx512vl(auVar159,auVar182,auVar178);
        auVar159 = vmulps_avx512vl(auVar178,auVar160);
        auVar183 = vfmsub231ps_avx512vl(auVar159,auVar176,auVar183);
        auVar159 = vmulps_avx512vl(auVar176,auVar182);
        auVar160 = vfmsub231ps_avx512vl(auVar159,auVar177,auVar160);
        auVar159 = vmulps_avx512vl(auVar180,auVar178);
        auVar182 = vfmsub231ps_avx512vl(auVar159,auVar177,auVar181);
        auVar159 = vmulps_avx512vl(auVar181,auVar176);
        auVar188 = vfmsub231ps_avx512vl(auVar159,auVar178,auVar179);
        auVar159 = vmulps_avx512vl(auVar179,auVar177);
        auVar189 = vfmsub231ps_avx512vl(auVar159,auVar176,auVar180);
        auVar159 = vmulps_avx512vl(auVar178,ZEXT1632(auVar154));
        auVar159 = vfmadd231ps_avx512vl(auVar159,ZEXT1632(auVar158),auVar177);
        auVar190 = vfmadd231ps_avx512vl(auVar159,ZEXT1632(auVar153),auVar176);
        auVar159 = vdivps_avx(ZEXT1632(auVar153),auVar190);
        auVar187 = vdivps_avx(auVar187,auVar190);
        auVar176 = vdivps_avx(auVar182,auVar190);
        auVar177 = vdivps_avx(ZEXT1632(auVar158),auVar190);
        auVar178 = vdivps_avx(auVar183,auVar190);
        auVar179 = vdivps_avx(auVar188,auVar190);
        auVar180 = vdivps_avx(ZEXT1632(auVar154),auVar190);
        auVar160 = vdivps_avx(auVar160,auVar190);
        auVar182 = vdivps_avx(auVar189,auVar190);
        fVar249 = auVar186._0_4_;
        fVar257 = auVar186._4_4_;
        auVar58._4_4_ = fVar257 * auVar180._4_4_;
        auVar58._0_4_ = fVar249 * auVar180._0_4_;
        fVar258 = auVar186._8_4_;
        auVar58._8_4_ = fVar258 * auVar180._8_4_;
        fVar259 = auVar186._12_4_;
        auVar58._12_4_ = fVar259 * auVar180._12_4_;
        fVar260 = auVar186._16_4_;
        auVar58._16_4_ = fVar260 * auVar180._16_4_;
        fVar261 = auVar186._20_4_;
        auVar58._20_4_ = fVar261 * auVar180._20_4_;
        fVar262 = auVar186._24_4_;
        auVar58._24_4_ = fVar262 * auVar180._24_4_;
        auVar58._28_4_ = auVar189._28_4_;
        auVar59._4_4_ = fVar257 * auVar160._4_4_;
        auVar59._0_4_ = fVar249 * auVar160._0_4_;
        auVar59._8_4_ = fVar258 * auVar160._8_4_;
        auVar59._12_4_ = fVar259 * auVar160._12_4_;
        auVar59._16_4_ = fVar260 * auVar160._16_4_;
        auVar59._20_4_ = fVar261 * auVar160._20_4_;
        auVar59._24_4_ = fVar262 * auVar160._24_4_;
        auVar59._28_4_ = auVar190._28_4_;
        auVar60._4_4_ = fVar257 * auVar182._4_4_;
        auVar60._0_4_ = fVar249 * auVar182._0_4_;
        auVar60._8_4_ = fVar258 * auVar182._8_4_;
        auVar60._12_4_ = fVar259 * auVar182._12_4_;
        auVar60._16_4_ = fVar260 * auVar182._16_4_;
        auVar60._20_4_ = fVar261 * auVar182._20_4_;
        auVar60._24_4_ = fVar262 * auVar182._24_4_;
        auVar60._28_4_ = auVar181._28_4_;
        auVar153 = vfmadd231ps_fma(auVar58,auVar185,auVar177);
        auVar158 = vfmadd231ps_fma(auVar59,auVar185,auVar178);
        auVar156 = vfmadd231ps_fma(auVar60,auVar179,auVar185);
        auVar155 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar184,auVar159);
        auVar154 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar184,auVar187);
        auVar153 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar176,auVar184);
      }
      auVar347._0_8_ = auVar155._0_8_ ^ 0x8000000080000000;
      auVar347._8_4_ = auVar155._8_4_ ^ 0x80000000;
      auVar347._12_4_ = auVar155._12_4_ ^ 0x80000000;
      auVar347._16_4_ = 0x80000000;
      auVar347._20_4_ = 0x80000000;
      auVar347._24_4_ = 0x80000000;
      auVar347._28_4_ = 0x80000000;
      auVar333._0_8_ = auVar154._0_8_ ^ 0x8000000080000000;
      auVar333._8_4_ = auVar154._8_4_ ^ 0x80000000;
      auVar333._12_4_ = auVar154._12_4_ ^ 0x80000000;
      auVar333._16_4_ = 0x80000000;
      auVar333._20_4_ = 0x80000000;
      auVar333._24_4_ = 0x80000000;
      auVar333._28_4_ = 0x80000000;
      auVar339._0_8_ = auVar153._0_8_ ^ 0x8000000080000000;
      auVar339._8_4_ = auVar153._8_4_ ^ 0x80000000;
      auVar339._12_4_ = auVar153._12_4_ ^ 0x80000000;
      auVar339._16_4_ = 0x80000000;
      auVar339._20_4_ = 0x80000000;
      auVar339._24_4_ = 0x80000000;
      auVar339._28_4_ = 0x80000000;
      auVar181 = *(undefined1 (*) [32])ray;
      auVar183 = *(undefined1 (*) [32])(ray + 0x20);
      auVar184 = *(undefined1 (*) [32])(ray + 0x40);
      auVar185 = *(undefined1 (*) [32])(ray + 0x80);
      auVar186 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar188 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar153 = vfmadd231ps_fma(auVar347,auVar184,auVar180);
      auVar158 = vfmadd231ps_fma(auVar333,auVar184,auVar160);
      auVar154 = vfmadd231ps_fma(auVar339,auVar184,auVar182);
      auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar183,auVar177);
      auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar183,auVar178);
      auVar154 = vfmadd231ps_fma(ZEXT1632(auVar154),auVar183,auVar179);
      auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar181,auVar159);
      auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar181,auVar187);
      *(undefined1 (*) [32])ray = ZEXT1632(auVar153);
      auVar153 = vfmadd231ps_fma(ZEXT1632(auVar154),auVar181,auVar176);
      *(undefined1 (*) [32])(ray + 0x20) = ZEXT1632(auVar158);
      *(undefined1 (*) [32])(ray + 0x40) = ZEXT1632(auVar153);
      auVar180 = vmulps_avx512vl(auVar180,auVar188);
      auVar160 = vmulps_avx512vl(auVar160,auVar188);
      auVar182 = vmulps_avx512vl(auVar182,auVar188);
      auVar177 = vfmadd231ps_avx512vl(auVar180,auVar186,auVar177);
      auVar178 = vfmadd231ps_avx512vl(auVar160,auVar186,auVar178);
      auVar179 = vfmadd231ps_avx512vl(auVar182,auVar186,auVar179);
      auVar153 = vfmadd231ps_fma(auVar177,auVar185,auVar159);
      auVar158 = vfmadd231ps_fma(auVar178,auVar185,auVar187);
      auVar154 = vfmadd231ps_fma(auVar179,auVar185,auVar176);
      *(undefined1 (*) [32])(ray + 0x80) = ZEXT1632(auVar153);
      *(undefined1 (*) [32])(ray + 0xa0) = ZEXT1632(auVar158);
      *(undefined1 (*) [32])(ray + 0xc0) = ZEXT1632(auVar154);
      local_30 = context->args;
      local_100 = vpmovm2d_avx512vl((ulong)uVar146);
      local_38 = pRVar5;
      (**(code **)(local_40 + 0xe0))(local_100,local_40 + 0x58,ray);
      local_260._0_8_ = auVar181._0_8_;
      local_260._8_8_ = auVar181._8_8_;
      local_260._16_8_ = auVar181._16_8_;
      local_260._24_8_ = auVar181._24_8_;
      *(undefined8 *)ray = local_260._0_8_;
      *(undefined8 *)(ray + 8) = local_260._8_8_;
      *(undefined8 *)(ray + 0x10) = local_260._16_8_;
      *(undefined8 *)(ray + 0x18) = local_260._24_8_;
      local_240 = auVar183._0_8_;
      uStack_238 = auVar183._8_8_;
      uStack_230 = auVar183._16_8_;
      uStack_228 = auVar183._24_8_;
      *(undefined1 (*) [8])(ray + 0x20) = local_240;
      *(undefined8 *)(ray + 0x28) = uStack_238;
      *(undefined8 *)(ray + 0x30) = uStack_230;
      *(undefined8 *)(ray + 0x38) = uStack_228;
      local_220._0_8_ = auVar184._0_8_;
      local_220._8_8_ = auVar184._8_8_;
      local_220._16_8_ = auVar184._16_8_;
      local_220._24_8_ = auVar184._24_8_;
      *(undefined8 *)(ray + 0x40) = local_220._0_8_;
      *(undefined8 *)(ray + 0x48) = local_220._8_8_;
      *(undefined8 *)(ray + 0x50) = local_220._16_8_;
      *(undefined8 *)(ray + 0x58) = local_220._24_8_;
      local_1e0._0_8_ = auVar185._0_8_;
      local_1e0._8_8_ = auVar185._8_8_;
      local_1e0._16_8_ = auVar185._16_8_;
      local_1e0._24_8_ = auVar185._24_8_;
      *(undefined8 *)(ray + 0x80) = local_1e0._0_8_;
      *(undefined8 *)(ray + 0x88) = local_1e0._8_8_;
      *(undefined8 *)(ray + 0x90) = local_1e0._16_8_;
      *(undefined8 *)(ray + 0x98) = local_1e0._24_8_;
      local_280._0_8_ = auVar186._0_8_;
      local_280._8_8_ = auVar186._8_8_;
      local_280._16_8_ = auVar186._16_8_;
      local_280._24_8_ = auVar186._24_8_;
      *(undefined8 *)(ray + 0xa0) = local_280._0_8_;
      *(undefined8 *)(ray + 0xa8) = local_280._8_8_;
      *(undefined8 *)(ray + 0xb0) = local_280._16_8_;
      *(undefined8 *)(ray + 0xb8) = local_280._24_8_;
      local_200 = auVar188._0_8_;
      uStack_1f8 = auVar188._8_8_;
      uStack_1f0 = auVar188._16_8_;
      uStack_1e8 = auVar188._24_8_;
      *(undefined1 (*) [8])(ray + 0xc0) = local_200;
      *(undefined8 *)(ray + 200) = uStack_1f8;
      *(undefined8 *)(ray + 0xd0) = uStack_1f0;
      *(undefined8 *)(ray + 0xd8) = uStack_1e8;
      pRVar5->instID[0] = 0xffffffff;
      pRVar5->instPrimID[0] = 0xffffffff;
    }
  }
  return;
}

Assistant:

void InstanceArrayIntersectorKMB<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }